

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  RTCRayQueryContext *pRVar14;
  RTCFilterFunctionN p_Var15;
  long lVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  ulong uVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  byte bVar90;
  uint uVar91;
  uint uVar92;
  undefined1 (*pauVar93) [32];
  ulong uVar94;
  uint uVar95;
  int iVar96;
  ulong uVar97;
  long lVar98;
  bool bVar99;
  bool bVar100;
  float fVar101;
  float fVar125;
  float fVar126;
  vint4 bi_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar127;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar105 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar128;
  float fVar159;
  float fVar162;
  vint4 bi;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar129;
  float fVar130;
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar170;
  float fVar195;
  float fVar196;
  vint4 bi_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar184 [32];
  float fVar197;
  float fVar201;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar202;
  float fVar222;
  float fVar223;
  vint4 ai_1;
  undefined1 auVar203 [16];
  float fVar224;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [28];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar225;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar226;
  float fVar240;
  float fVar241;
  vint4 ai_2;
  undefined1 auVar227 [16];
  float fVar242;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar245;
  undefined1 auVar234 [28];
  float fVar243;
  float fVar244;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar233 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar246;
  float fVar247;
  float fVar256;
  float fVar258;
  undefined1 auVar248 [16];
  float fVar260;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar257;
  float fVar259;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar265;
  float fVar278;
  float fVar279;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar281;
  float fVar283;
  float fVar285;
  undefined1 auVar271 [32];
  float fVar280;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar287;
  float fVar299;
  float fVar300;
  vint4 ai;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar302;
  float fVar304;
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar293 [32];
  float fVar301;
  float fVar303;
  float fVar305;
  float fVar307;
  float fVar309;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar311;
  float fVar320;
  float fVar321;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar322;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  float s;
  float fVar333;
  float fVar336;
  undefined1 auVar329 [16];
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar330 [28];
  float fVar334;
  float fVar335;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar359;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [64];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar366;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [64];
  float fVar367;
  float fVar373;
  float fVar375;
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  float fVar368;
  float fVar374;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar399;
  float fVar403;
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar419;
  float fVar426;
  undefined1 auVar420 [16];
  undefined1 auVar421 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [64];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_cc4;
  undefined1 local_c60 [32];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 auStack_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined1 (*local_a10) [16];
  undefined1 (*local_a08) [16];
  uint *local_a00;
  ulong local_9f8;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  uint local_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  uint uStack_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint local_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar422 [32];
  
  PVar9 = prim[1];
  uVar97 = (ulong)(byte)PVar9;
  lVar16 = uVar97 * 0x25;
  fVar128 = *(float *)(prim + lVar16 + 0x12);
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar135 = vsubps_avx(auVar135,*(undefined1 (*) [16])(prim + lVar16 + 6));
  auVar131._0_4_ = fVar128 * auVar135._0_4_;
  auVar131._4_4_ = fVar128 * auVar135._4_4_;
  auVar131._8_4_ = fVar128 * auVar135._8_4_;
  auVar131._12_4_ = fVar128 * auVar135._12_4_;
  auVar288._0_4_ = fVar128 * auVar17._0_4_;
  auVar288._4_4_ = fVar128 * auVar17._4_4_;
  auVar288._8_4_ = fVar128 * auVar17._8_4_;
  auVar288._12_4_ = fVar128 * auVar17._12_4_;
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xf + 6)));
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar97 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1a + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1b + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar355 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1c + 6)));
  auVar355 = vcvtdq2ps_avx(auVar355);
  auVar142 = vshufps_avx(auVar288,auVar288,0);
  auVar30 = vshufps_avx(auVar288,auVar288,0x55);
  auVar31 = vshufps_avx(auVar288,auVar288,0xaa);
  fVar128 = auVar31._0_4_;
  fVar130 = auVar31._4_4_;
  fVar160 = auVar31._8_4_;
  fVar163 = auVar31._12_4_;
  fVar226 = auVar30._0_4_;
  fVar240 = auVar30._4_4_;
  fVar241 = auVar30._8_4_;
  fVar242 = auVar30._12_4_;
  fVar202 = auVar142._0_4_;
  fVar222 = auVar142._4_4_;
  fVar223 = auVar142._8_4_;
  fVar224 = auVar142._12_4_;
  auVar369._0_4_ = fVar202 * auVar135._0_4_ + fVar226 * auVar17._0_4_ + fVar128 * auVar28._0_4_;
  auVar369._4_4_ = fVar222 * auVar135._4_4_ + fVar240 * auVar17._4_4_ + fVar130 * auVar28._4_4_;
  auVar369._8_4_ = fVar223 * auVar135._8_4_ + fVar241 * auVar17._8_4_ + fVar160 * auVar28._8_4_;
  auVar369._12_4_ = fVar224 * auVar135._12_4_ + fVar242 * auVar17._12_4_ + fVar163 * auVar28._12_4_;
  auVar391._0_4_ = fVar202 * auVar29._0_4_ + fVar226 * auVar136._0_4_ + auVar143._0_4_ * fVar128;
  auVar391._4_4_ = fVar222 * auVar29._4_4_ + fVar240 * auVar136._4_4_ + auVar143._4_4_ * fVar130;
  auVar391._8_4_ = fVar223 * auVar29._8_4_ + fVar241 * auVar136._8_4_ + auVar143._8_4_ * fVar160;
  auVar391._12_4_ = fVar224 * auVar29._12_4_ + fVar242 * auVar136._12_4_ + auVar143._12_4_ * fVar163
  ;
  auVar289._0_4_ = fVar202 * auVar109._0_4_ + fVar226 * auVar141._0_4_ + auVar355._0_4_ * fVar128;
  auVar289._4_4_ = fVar222 * auVar109._4_4_ + fVar240 * auVar141._4_4_ + auVar355._4_4_ * fVar130;
  auVar289._8_4_ = fVar223 * auVar109._8_4_ + fVar241 * auVar141._8_4_ + auVar355._8_4_ * fVar160;
  auVar289._12_4_ =
       fVar224 * auVar109._12_4_ + fVar242 * auVar141._12_4_ + auVar355._12_4_ * fVar163;
  auVar142 = vshufps_avx(auVar131,auVar131,0);
  auVar30 = vshufps_avx(auVar131,auVar131,0x55);
  auVar31 = vshufps_avx(auVar131,auVar131,0xaa);
  fVar128 = auVar31._0_4_;
  fVar130 = auVar31._4_4_;
  fVar160 = auVar31._8_4_;
  fVar163 = auVar31._12_4_;
  fVar226 = auVar30._0_4_;
  fVar240 = auVar30._4_4_;
  fVar241 = auVar30._8_4_;
  fVar242 = auVar30._12_4_;
  fVar202 = auVar142._0_4_;
  fVar222 = auVar142._4_4_;
  fVar223 = auVar142._8_4_;
  fVar224 = auVar142._12_4_;
  auVar132._0_4_ = fVar202 * auVar135._0_4_ + fVar226 * auVar17._0_4_ + fVar128 * auVar28._0_4_;
  auVar132._4_4_ = fVar222 * auVar135._4_4_ + fVar240 * auVar17._4_4_ + fVar130 * auVar28._4_4_;
  auVar132._8_4_ = fVar223 * auVar135._8_4_ + fVar241 * auVar17._8_4_ + fVar160 * auVar28._8_4_;
  auVar132._12_4_ = fVar224 * auVar135._12_4_ + fVar242 * auVar17._12_4_ + fVar163 * auVar28._12_4_;
  auVar102._0_4_ = fVar202 * auVar29._0_4_ + auVar143._0_4_ * fVar128 + fVar226 * auVar136._0_4_;
  auVar102._4_4_ = fVar222 * auVar29._4_4_ + auVar143._4_4_ * fVar130 + fVar240 * auVar136._4_4_;
  auVar102._8_4_ = fVar223 * auVar29._8_4_ + auVar143._8_4_ * fVar160 + fVar241 * auVar136._8_4_;
  auVar102._12_4_ = fVar224 * auVar29._12_4_ + auVar143._12_4_ * fVar163 + fVar242 * auVar136._12_4_
  ;
  auVar312._8_4_ = 0x7fffffff;
  auVar312._0_8_ = 0x7fffffff7fffffff;
  auVar312._12_4_ = 0x7fffffff;
  auVar135 = vandps_avx(auVar369,auVar312);
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  auVar135 = vcmpps_avx(auVar135,auVar227,1);
  auVar17 = vblendvps_avx(auVar369,auVar227,auVar135);
  auVar135 = vandps_avx(auVar391,auVar312);
  auVar135 = vcmpps_avx(auVar135,auVar227,1);
  auVar28 = vblendvps_avx(auVar391,auVar227,auVar135);
  auVar135 = vandps_avx(auVar312,auVar289);
  auVar135 = vcmpps_avx(auVar135,auVar227,1);
  auVar135 = vblendvps_avx(auVar289,auVar227,auVar135);
  auVar171._0_4_ = fVar202 * auVar109._0_4_ + fVar226 * auVar141._0_4_ + auVar355._0_4_ * fVar128;
  auVar171._4_4_ = fVar222 * auVar109._4_4_ + fVar240 * auVar141._4_4_ + auVar355._4_4_ * fVar130;
  auVar171._8_4_ = fVar223 * auVar109._8_4_ + fVar241 * auVar141._8_4_ + auVar355._8_4_ * fVar160;
  auVar171._12_4_ =
       fVar224 * auVar109._12_4_ + fVar242 * auVar141._12_4_ + auVar355._12_4_ * fVar163;
  auVar29 = vrcpps_avx(auVar17);
  fVar202 = auVar29._0_4_;
  auVar203._0_4_ = fVar202 * auVar17._0_4_;
  fVar222 = auVar29._4_4_;
  auVar203._4_4_ = fVar222 * auVar17._4_4_;
  fVar223 = auVar29._8_4_;
  auVar203._8_4_ = fVar223 * auVar17._8_4_;
  fVar224 = auVar29._12_4_;
  auVar203._12_4_ = fVar224 * auVar17._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = 0x3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar266,auVar203);
  fVar202 = fVar202 + fVar202 * auVar17._0_4_;
  fVar222 = fVar222 + fVar222 * auVar17._4_4_;
  fVar223 = fVar223 + fVar223 * auVar17._8_4_;
  fVar224 = fVar224 + fVar224 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar28);
  fVar226 = auVar17._0_4_;
  auVar248._0_4_ = fVar226 * auVar28._0_4_;
  fVar240 = auVar17._4_4_;
  auVar248._4_4_ = fVar240 * auVar28._4_4_;
  fVar241 = auVar17._8_4_;
  auVar248._8_4_ = fVar241 * auVar28._8_4_;
  fVar242 = auVar17._12_4_;
  auVar248._12_4_ = fVar242 * auVar28._12_4_;
  auVar17 = vsubps_avx(auVar266,auVar248);
  fVar226 = fVar226 + fVar226 * auVar17._0_4_;
  fVar240 = fVar240 + fVar240 * auVar17._4_4_;
  fVar241 = fVar241 + fVar241 * auVar17._8_4_;
  fVar242 = fVar242 + fVar242 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar135);
  fVar246 = auVar17._0_4_;
  auVar290._0_4_ = fVar246 * auVar135._0_4_;
  fVar256 = auVar17._4_4_;
  auVar290._4_4_ = fVar256 * auVar135._4_4_;
  fVar258 = auVar17._8_4_;
  auVar290._8_4_ = fVar258 * auVar135._8_4_;
  fVar260 = auVar17._12_4_;
  auVar290._12_4_ = fVar260 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar266,auVar290);
  fVar246 = fVar246 + fVar246 * auVar135._0_4_;
  fVar256 = fVar256 + fVar256 * auVar135._4_4_;
  fVar258 = fVar258 + fVar258 * auVar135._8_4_;
  fVar260 = fVar260 + fVar260 * auVar135._12_4_;
  auVar135 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar16 + 0x16)) *
                           *(float *)(prim + lVar16 + 0x1a)));
  auVar28 = vshufps_avx(auVar135,auVar135,0);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar135 = vpmovsxwd_avx(auVar135);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar29 = vsubps_avx(auVar17,auVar135);
  fVar128 = auVar28._0_4_;
  fVar130 = auVar28._4_4_;
  fVar160 = auVar28._8_4_;
  fVar163 = auVar28._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar28);
  auVar291._0_4_ = auVar29._0_4_ * fVar128 + auVar135._0_4_;
  auVar291._4_4_ = auVar29._4_4_ * fVar130 + auVar135._4_4_;
  auVar291._8_4_ = auVar29._8_4_ * fVar160 + auVar135._8_4_;
  auVar291._12_4_ = auVar29._12_4_ * fVar163 + auVar135._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar97 * 0xd + 6);
  auVar28 = vpmovsxwd_avx(auVar29);
  auVar135 = vcvtdq2ps_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar28);
  auVar17 = vsubps_avx(auVar17,auVar135);
  auVar313._0_4_ = auVar17._0_4_ * fVar128 + auVar135._0_4_;
  auVar313._4_4_ = auVar17._4_4_ * fVar130 + auVar135._4_4_;
  auVar313._8_4_ = auVar17._8_4_ * fVar160 + auVar135._8_4_;
  auVar313._12_4_ = auVar17._12_4_ * fVar163 + auVar135._12_4_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar97 * 0x12 + 6);
  auVar135 = vpmovsxwd_avx(auVar136);
  uVar94 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar97 * 2 + uVar94 + 6);
  auVar17 = vpmovsxwd_avx(auVar143);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar135);
  auVar329._0_4_ = auVar17._0_4_ * fVar128 + auVar135._0_4_;
  auVar329._4_4_ = auVar17._4_4_ * fVar130 + auVar135._4_4_;
  auVar329._8_4_ = auVar17._8_4_ * fVar160 + auVar135._8_4_;
  auVar329._12_4_ = auVar17._12_4_ * fVar163 + auVar135._12_4_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar94 + 6);
  auVar135 = vpmovsxwd_avx(auVar109);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar97 * 0x18 + 6);
  auVar17 = vpmovsxwd_avx(auVar141);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar28 = vsubps_avx(auVar17,auVar135);
  auVar355._8_8_ = 0;
  auVar355._0_8_ = *(ulong *)(prim + uVar97 * 0x1d + 6);
  auVar17 = vpmovsxwd_avx(auVar355);
  auVar354._0_4_ = auVar28._0_4_ * fVar128 + auVar135._0_4_;
  auVar354._4_4_ = auVar28._4_4_ * fVar130 + auVar135._4_4_;
  auVar354._8_4_ = auVar28._8_4_ * fVar160 + auVar135._8_4_;
  auVar354._12_4_ = auVar28._12_4_ * fVar163 + auVar135._12_4_;
  auVar135 = vcvtdq2ps_avx(auVar17);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar97 + (ulong)(byte)PVar9 * 0x20 + 6);
  auVar17 = vpmovsxwd_avx(auVar142);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar135);
  auVar360._0_4_ = auVar17._0_4_ * fVar128 + auVar135._0_4_;
  auVar360._4_4_ = auVar17._4_4_ * fVar130 + auVar135._4_4_;
  auVar360._8_4_ = auVar17._8_4_ * fVar160 + auVar135._8_4_;
  auVar360._12_4_ = auVar17._12_4_ * fVar163 + auVar135._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar9 * 0x20 - uVar97) + 6);
  auVar135 = vpmovsxwd_avx(auVar30);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar97 * 0x23 + 6);
  auVar17 = vpmovsxwd_avx(auVar31);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar135);
  auVar267._0_4_ = auVar135._0_4_ + auVar17._0_4_ * fVar128;
  auVar267._4_4_ = auVar135._4_4_ + auVar17._4_4_ * fVar130;
  auVar267._8_4_ = auVar135._8_4_ + auVar17._8_4_ * fVar160;
  auVar267._12_4_ = auVar135._12_4_ + auVar17._12_4_ * fVar163;
  auVar135 = vsubps_avx(auVar291,auVar132);
  auVar292._0_4_ = fVar202 * auVar135._0_4_;
  auVar292._4_4_ = fVar222 * auVar135._4_4_;
  auVar292._8_4_ = fVar223 * auVar135._8_4_;
  auVar292._12_4_ = fVar224 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar313,auVar132);
  auVar133._0_4_ = fVar202 * auVar135._0_4_;
  auVar133._4_4_ = fVar222 * auVar135._4_4_;
  auVar133._8_4_ = fVar223 * auVar135._8_4_;
  auVar133._12_4_ = fVar224 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar329,auVar102);
  auVar204._0_4_ = fVar226 * auVar135._0_4_;
  auVar204._4_4_ = fVar240 * auVar135._4_4_;
  auVar204._8_4_ = fVar241 * auVar135._8_4_;
  auVar204._12_4_ = fVar242 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar354,auVar102);
  auVar111._0_4_ = fVar226 * auVar135._0_4_;
  auVar111._4_4_ = fVar240 * auVar135._4_4_;
  auVar111._8_4_ = fVar241 * auVar135._8_4_;
  auVar111._12_4_ = fVar242 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar360,auVar171);
  auVar228._0_4_ = fVar246 * auVar135._0_4_;
  auVar228._4_4_ = fVar256 * auVar135._4_4_;
  auVar228._8_4_ = fVar258 * auVar135._8_4_;
  auVar228._12_4_ = fVar260 * auVar135._12_4_;
  auVar135 = vsubps_avx(auVar267,auVar171);
  auVar172._0_4_ = fVar246 * auVar135._0_4_;
  auVar172._4_4_ = fVar256 * auVar135._4_4_;
  auVar172._8_4_ = fVar258 * auVar135._8_4_;
  auVar172._12_4_ = fVar260 * auVar135._12_4_;
  auVar135 = vpminsd_avx(auVar292,auVar133);
  auVar17 = vpminsd_avx(auVar204,auVar111);
  auVar135 = vmaxps_avx(auVar135,auVar17);
  auVar17 = vpminsd_avx(auVar228,auVar172);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar314._4_4_ = uVar7;
  auVar314._0_4_ = uVar7;
  auVar314._8_4_ = uVar7;
  auVar314._12_4_ = uVar7;
  auVar17 = vmaxps_avx(auVar17,auVar314);
  auVar135 = vmaxps_avx(auVar135,auVar17);
  local_680._0_4_ = auVar135._0_4_ * 0.99999964;
  local_680._4_4_ = auVar135._4_4_ * 0.99999964;
  local_680._8_4_ = auVar135._8_4_ * 0.99999964;
  local_680._12_4_ = auVar135._12_4_ * 0.99999964;
  auVar135 = vpmaxsd_avx(auVar292,auVar133);
  auVar17 = vpmaxsd_avx(auVar204,auVar111);
  auVar135 = vminps_avx(auVar135,auVar17);
  auVar17 = vpmaxsd_avx(auVar228,auVar172);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar173._4_4_ = uVar7;
  auVar173._0_4_ = uVar7;
  auVar173._8_4_ = uVar7;
  auVar173._12_4_ = uVar7;
  auVar17 = vminps_avx(auVar17,auVar173);
  auVar135 = vminps_avx(auVar135,auVar17);
  auVar103._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar135 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar17 = vpcmpgtd_avx(auVar135,_DAT_01f7fcf0);
  auVar135 = vcmpps_avx(local_680,auVar103,2);
  auVar135 = vandps_avx(auVar135,auVar17);
  uVar91 = vmovmskps_avx(auVar135);
  if (uVar91 == 0) {
    return false;
  }
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  uVar91 = uVar91 & 0xff;
  local_2a0 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  uVar92 = 1 << ((byte)k & 0x1f);
  local_a00 = &local_580;
  local_a08 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar92 & 0xf) << 4));
  local_a10 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar92 >> 4) * 0x10);
  local_8d0 = prim;
LAB_00f9f305:
  local_8c8 = (ulong)uVar91;
  lVar16 = 0;
  if (local_8c8 != 0) {
    for (; (uVar91 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
    }
  }
  local_9f8 = (ulong)*(uint *)(local_8d0 + 2);
  pGVar10 = (context->scene->geometries).items[local_9f8].ptr;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)*(uint *)(local_8d0 + lVar16 * 4 + 6) *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar128 = (pGVar10->time_range).lower;
  fVar128 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar128) / ((pGVar10->time_range).upper - fVar128));
  auVar135 = vroundss_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),9);
  auVar135 = vminss_avx(auVar135,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar135 = vmaxss_avx(ZEXT816(0) << 0x20,auVar135);
  fVar128 = fVar128 - auVar135._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar98 = (long)(int)auVar135._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + lVar98);
  lVar13 = *(long *)(_Var11 + 0x10 + lVar98);
  auVar135 = vshufps_avx(ZEXT416((uint)(1.0 - fVar128)),ZEXT416((uint)(1.0 - fVar128)),0);
  pfVar1 = (float *)(lVar12 + lVar13 * uVar97);
  fVar202 = auVar135._0_4_;
  fVar222 = auVar135._4_4_;
  fVar223 = auVar135._8_4_;
  fVar224 = auVar135._12_4_;
  pfVar2 = (float *)(lVar12 + lVar13 * (uVar97 + 1));
  pfVar3 = (float *)(lVar12 + lVar13 * (uVar97 + 2));
  pfVar4 = (float *)(lVar12 + lVar13 * (uVar97 + 3));
  lVar12 = *(long *)(_Var11 + 0x38 + lVar98);
  lVar13 = *(long *)(_Var11 + 0x48 + lVar98);
  auVar135 = vshufps_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),0);
  pfVar5 = (float *)(lVar12 + uVar97 * lVar13);
  fVar226 = auVar135._0_4_;
  fVar240 = auVar135._4_4_;
  fVar241 = auVar135._8_4_;
  fVar242 = auVar135._12_4_;
  pfVar6 = (float *)(lVar12 + (uVar97 + 1) * lVar13);
  auVar229._0_4_ = fVar226 * *pfVar5 + fVar202 * *pfVar1;
  auVar229._4_4_ = fVar240 * pfVar5[1] + fVar222 * pfVar1[1];
  auVar229._8_4_ = fVar241 * pfVar5[2] + fVar223 * pfVar1[2];
  auVar229._12_4_ = fVar242 * pfVar5[3] + fVar224 * pfVar1[3];
  auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar17 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar128 = *(float *)(ray + k * 4 + 0x80);
  auVar370._4_4_ = fVar128;
  auVar370._0_4_ = fVar128;
  auVar370._8_4_ = fVar128;
  auVar370._12_4_ = fVar128;
  fStack_a50 = fVar128;
  _local_a60 = auVar370;
  fStack_a4c = fVar128;
  fStack_a48 = fVar128;
  fStack_a44 = fVar128;
  fVar130 = *(float *)(ray + k * 4 + 0xa0);
  auVar392._4_4_ = fVar130;
  auVar392._0_4_ = fVar130;
  auVar392._8_4_ = fVar130;
  auVar392._12_4_ = fVar130;
  fStack_850 = fVar130;
  _local_860 = auVar392;
  fStack_84c = fVar130;
  fStack_848 = fVar130;
  fStack_844 = fVar130;
  auVar249._0_4_ = fVar202 * *pfVar2 + fVar226 * *pfVar6;
  auVar249._4_4_ = fVar222 * pfVar2[1] + fVar240 * pfVar6[1];
  auVar249._8_4_ = fVar223 * pfVar2[2] + fVar241 * pfVar6[2];
  auVar249._12_4_ = fVar224 * pfVar2[3] + fVar242 * pfVar6[3];
  auVar135 = vunpcklps_avx(auVar370,auVar392);
  fVar160 = *(float *)(ray + k * 4 + 0xc0);
  auVar420._4_4_ = fVar160;
  auVar420._0_4_ = fVar160;
  auVar420._8_4_ = fVar160;
  auVar420._12_4_ = fVar160;
  fStack_9b0 = fVar160;
  _local_9c0 = auVar420;
  fStack_9ac = fVar160;
  fStack_9a8 = fVar160;
  fStack_9a4 = fVar160;
  _local_950 = vinsertps_avx(auVar135,auVar420,0x28);
  auVar358 = ZEXT1664(_local_950);
  auVar104._0_4_ = (auVar229._0_4_ + auVar249._0_4_) * 0.5;
  auVar104._4_4_ = (auVar229._4_4_ + auVar249._4_4_) * 0.5;
  auVar104._8_4_ = (auVar229._8_4_ + auVar249._8_4_) * 0.5;
  auVar104._12_4_ = (auVar229._12_4_ + auVar249._12_4_) * 0.5;
  auVar135 = vsubps_avx(auVar104,auVar17);
  auVar135 = vdpps_avx(auVar135,_local_950,0x7f);
  local_960 = vdpps_avx(_local_950,_local_950,0x7f);
  auVar365 = ZEXT1664(local_960);
  pfVar1 = (float *)(lVar12 + (uVar97 + 2) * lVar13);
  auVar205._0_4_ = fVar202 * *pfVar3 + fVar226 * *pfVar1;
  auVar205._4_4_ = fVar222 * pfVar3[1] + fVar240 * pfVar1[1];
  auVar205._8_4_ = fVar223 * pfVar3[2] + fVar241 * pfVar1[2];
  auVar205._12_4_ = fVar224 * pfVar3[3] + fVar242 * pfVar1[3];
  auVar28 = vrcpss_avx(local_960,local_960);
  fVar163 = auVar135._0_4_ * (2.0 - local_960._0_4_ * auVar28._0_4_) * auVar28._0_4_;
  auVar318 = ZEXT464((uint)fVar163);
  auVar28 = vshufps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),0);
  auVar268._0_4_ = auVar17._0_4_ + local_950._0_4_ * auVar28._0_4_;
  auVar268._4_4_ = auVar17._4_4_ + local_950._4_4_ * auVar28._4_4_;
  auVar268._8_4_ = auVar17._8_4_ + local_950._8_4_ * auVar28._8_4_;
  auVar268._12_4_ = auVar17._12_4_ + local_950._12_4_ * auVar28._12_4_;
  auVar135 = vblendps_avx(auVar268,_DAT_01f7aa10,8);
  _local_ab0 = vsubps_avx(auVar229,auVar135);
  _local_ac0 = vsubps_avx(auVar205,auVar135);
  pfVar1 = (float *)(lVar12 + lVar13 * (uVar97 + 3));
  auVar134._0_4_ = fVar202 * *pfVar4 + fVar226 * *pfVar1;
  auVar134._4_4_ = fVar222 * pfVar4[1] + fVar240 * pfVar1[1];
  auVar134._8_4_ = fVar223 * pfVar4[2] + fVar241 * pfVar1[2];
  auVar134._12_4_ = fVar224 * pfVar4[3] + fVar242 * pfVar1[3];
  _local_ad0 = vsubps_avx(auVar249,auVar135);
  _local_ae0 = vsubps_avx(auVar134,auVar135);
  auVar135 = vshufps_avx(_local_ab0,_local_ab0,0);
  register0x00001250 = auVar135;
  _local_3c0 = auVar135;
  auVar135 = vshufps_avx(_local_ab0,_local_ab0,0x55);
  register0x00001250 = auVar135;
  _local_1e0 = auVar135;
  auVar135 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  register0x00001250 = auVar135;
  _local_200 = auVar135;
  auVar135 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  register0x00001290 = auVar135;
  _local_220 = auVar135;
  auVar135 = vshufps_avx(_local_ad0,_local_ad0,0);
  register0x00001290 = auVar135;
  _local_3e0 = auVar135;
  auVar135 = vshufps_avx(_local_ad0,_local_ad0,0x55);
  register0x00001290 = auVar135;
  _local_400 = auVar135;
  auVar135 = vshufps_avx(_local_ad0,_local_ad0,0xaa);
  register0x00001290 = auVar135;
  _local_420 = auVar135;
  auVar135 = vshufps_avx(_local_ad0,_local_ad0,0xff);
  register0x00001290 = auVar135;
  _local_240 = auVar135;
  auVar17 = vshufps_avx(_local_ac0,_local_ac0,0);
  auVar135 = vshufps_avx(_local_ac0,_local_ac0,0x55);
  register0x00001290 = auVar135;
  _local_440 = auVar135;
  auVar135 = vshufps_avx(_local_ac0,_local_ac0,0xaa);
  register0x00001290 = auVar135;
  _local_460 = auVar135;
  auVar135 = vshufps_avx(_local_ac0,_local_ac0,0xff);
  register0x00001290 = auVar135;
  _local_480 = auVar135;
  auVar29 = vshufps_avx(_local_ae0,_local_ae0,0);
  auVar135 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001590 = auVar135;
  _local_a40 = auVar135;
  auVar425 = ZEXT3264(_local_a40);
  auVar135 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001290 = auVar135;
  _local_4a0 = auVar135;
  auVar135 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar135;
  _local_260 = auVar135;
  auVar135 = ZEXT416((uint)(fVar128 * fVar128 + fVar130 * fVar130 + fVar160 * fVar160));
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  auVar235._16_16_ = auVar135;
  auVar235._0_16_ = auVar135;
  fVar128 = *(float *)(ray + k * 4 + 0x60);
  local_8e0 = ZEXT416((uint)fVar163);
  auVar135 = vshufps_avx(ZEXT416((uint)(fVar128 - fVar163)),ZEXT416((uint)(fVar128 - fVar163)),0);
  local_2c0._16_16_ = auVar135;
  local_2c0._0_16_ = auVar135;
  auVar135 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + 2)),0);
  local_4e0._16_16_ = auVar135;
  local_4e0._0_16_ = auVar135;
  auVar135 = vpshufd_avx(ZEXT416(*(uint *)(local_8d0 + lVar16 * 4 + 6)),0);
  local_500._16_16_ = auVar135;
  local_500._0_16_ = auVar135;
  register0x00001210 = auVar28;
  _local_aa0 = auVar28;
  uVar97 = 0;
  bVar99 = false;
  local_cc4 = 1;
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(auVar235,auVar114);
  auVar135 = vsqrtss_avx(local_960,local_960);
  auVar28 = vsqrtss_avx(local_960,local_960);
  local_670 = ZEXT816(0x3f80000000000000);
  local_280 = auVar235;
  do {
    auVar427._8_4_ = 0x3f800000;
    auVar427._0_8_ = 0x3f8000003f800000;
    auVar427._12_4_ = 0x3f800000;
    auVar427._16_4_ = 0x3f800000;
    auVar427._20_4_ = 0x3f800000;
    auVar427._24_4_ = 0x3f800000;
    auVar427._28_4_ = 0x3f800000;
    iVar96 = (int)uVar97;
    auVar136 = vmovshdup_avx(local_670);
    auVar109 = vsubps_avx(auVar136,local_670);
    auVar136 = vshufps_avx(local_670,local_670,0);
    local_9a0._16_16_ = auVar136;
    local_9a0._0_16_ = auVar136;
    auVar143 = vshufps_avx(auVar109,auVar109,0);
    local_820._16_16_ = auVar143;
    local_820._0_16_ = auVar143;
    fVar129 = auVar143._0_4_;
    fVar159 = auVar143._4_4_;
    fVar162 = auVar143._8_4_;
    fVar165 = auVar143._12_4_;
    fVar101 = auVar136._0_4_;
    auVar217._0_4_ = fVar101 + fVar129 * 0.0;
    fVar125 = auVar136._4_4_;
    auVar217._4_4_ = fVar125 + fVar159 * 0.14285715;
    fVar126 = auVar136._8_4_;
    auVar217._8_4_ = fVar126 + fVar162 * 0.2857143;
    fVar127 = auVar136._12_4_;
    auVar217._12_4_ = fVar127 + fVar165 * 0.42857146;
    auVar217._16_4_ = fVar101 + fVar129 * 0.5714286;
    auVar217._20_4_ = fVar125 + fVar159 * 0.71428573;
    auVar217._24_4_ = fVar126 + fVar162 * 0.8571429;
    auVar217._28_4_ = fVar127 + fVar165;
    auVar113 = vsubps_avx(auVar427,auVar217);
    auVar184._0_4_ = auVar217._0_4_ * auVar217._0_4_;
    auVar184._4_4_ = auVar217._4_4_ * auVar217._4_4_;
    auVar184._8_4_ = auVar217._8_4_ * auVar217._8_4_;
    auVar184._12_4_ = auVar217._12_4_ * auVar217._12_4_;
    auVar184._16_4_ = auVar217._16_4_ * auVar217._16_4_;
    auVar184._20_4_ = auVar217._20_4_ * auVar217._20_4_;
    auVar184._24_4_ = auVar217._24_4_ * auVar217._24_4_;
    auVar184._28_4_ = 0;
    fVar240 = auVar217._0_4_ * 3.0;
    fVar241 = auVar217._4_4_ * 3.0;
    fVar242 = auVar217._8_4_ * 3.0;
    fVar246 = auVar217._12_4_ * 3.0;
    fVar256 = auVar217._16_4_ * 3.0;
    fVar258 = auVar217._20_4_ * 3.0;
    fVar260 = auVar217._24_4_ * 3.0;
    fVar130 = auVar113._0_4_;
    auVar319._0_4_ = fVar130 * fVar130;
    fVar160 = auVar113._4_4_;
    auVar319._4_4_ = fVar160 * fVar160;
    fVar163 = auVar113._8_4_;
    auVar319._8_4_ = fVar163 * fVar163;
    fVar202 = auVar113._12_4_;
    auVar319._12_4_ = fVar202 * fVar202;
    fVar222 = auVar113._16_4_;
    auVar319._16_4_ = fVar222 * fVar222;
    fVar223 = auVar113._20_4_;
    auVar319._20_4_ = fVar223 * fVar223;
    fVar224 = auVar113._24_4_;
    auVar319._28_36_ = auVar318._28_36_;
    auVar319._24_4_ = fVar224 * fVar224;
    fVar226 = auVar113._28_4_;
    fVar247 = (auVar319._0_4_ * (fVar130 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar257 = (auVar319._4_4_ * (fVar160 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar259 = (auVar319._8_4_ * (fVar163 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar261 = (auVar319._12_4_ * (fVar202 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar262 = (auVar319._16_4_ * (fVar222 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar263 = (auVar319._20_4_ * (fVar223 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar264 = (auVar319._24_4_ * (fVar224 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar326 = -fVar130 * auVar217._0_4_ * auVar217._0_4_ * 0.5;
    fVar333 = -fVar160 * auVar217._4_4_ * auVar217._4_4_ * 0.5;
    fVar336 = -fVar163 * auVar217._8_4_ * auVar217._8_4_ * 0.5;
    fVar339 = -fVar202 * auVar217._12_4_ * auVar217._12_4_ * 0.5;
    fVar342 = -fVar222 * auVar217._16_4_ * auVar217._16_4_ * 0.5;
    fVar345 = -fVar223 * auVar217._20_4_ * auVar217._20_4_ * 0.5;
    fVar348 = -fVar224 * auVar217._24_4_ * auVar217._24_4_ * 0.5;
    fVar243 = auVar29._0_4_;
    fVar244 = auVar29._4_4_;
    fVar245 = auVar29._8_4_;
    fVar377 = auVar29._12_4_;
    fVar387 = auVar17._0_4_;
    fVar399 = auVar17._4_4_;
    fVar282 = auVar17._8_4_;
    fVar406 = auVar17._12_4_;
    fVar359 = auVar358._28_4_ + fVar406;
    fVar366 = auVar365._28_4_ + fVar406;
    fVar388 = (auVar184._0_4_ * (fVar240 + -5.0) + 2.0) * 0.5;
    fVar400 = (auVar184._4_4_ * (fVar241 + -5.0) + 2.0) * 0.5;
    fVar403 = (auVar184._8_4_ * (fVar242 + -5.0) + 2.0) * 0.5;
    fVar407 = (auVar184._12_4_ * (fVar246 + -5.0) + 2.0) * 0.5;
    fVar410 = (auVar184._16_4_ * (fVar256 + -5.0) + 2.0) * 0.5;
    fVar413 = (auVar184._20_4_ * (fVar258 + -5.0) + 2.0) * 0.5;
    fVar416 = (auVar184._24_4_ * (fVar260 + -5.0) + 2.0) * 0.5;
    fVar386 = -auVar217._28_4_;
    fVar367 = -auVar217._0_4_ * fVar130 * fVar130 * 0.5;
    fVar373 = -auVar217._4_4_ * fVar160 * fVar160 * 0.5;
    fVar375 = -auVar217._8_4_ * fVar163 * fVar163 * 0.5;
    fVar378 = -auVar217._12_4_ * fVar202 * fVar202 * 0.5;
    fVar380 = -auVar217._16_4_ * fVar222 * fVar222 * 0.5;
    fVar382 = -auVar217._20_4_ * fVar223 * fVar223 * 0.5;
    fVar384 = -auVar217._24_4_ * fVar224 * fVar224 * 0.5;
    fVar327 = fVar367 * (float)local_3c0._0_4_ +
              fVar388 * (float)local_3e0._0_4_ + fVar243 * fVar326 + fVar387 * fVar247;
    fVar334 = fVar373 * (float)local_3c0._4_4_ +
              fVar400 * (float)local_3e0._4_4_ + fVar244 * fVar333 + fVar399 * fVar257;
    fVar337 = fVar375 * fStack_3b8 + fVar403 * fStack_3d8 + fVar245 * fVar336 + fVar282 * fVar259;
    fVar340 = fVar378 * fStack_3b4 + fVar407 * fStack_3d4 + fVar377 * fVar339 + fVar406 * fVar261;
    fVar343 = fVar380 * fStack_3b0 + fVar410 * fStack_3d0 + fVar243 * fVar342 + fVar387 * fVar262;
    fVar346 = fVar382 * fStack_3ac + fVar413 * fStack_3cc + fVar244 * fVar345 + fVar399 * fVar263;
    fVar349 = fVar384 * fStack_3a8 + fVar416 * fStack_3c8 + fVar245 * fVar348 + fVar282 * fVar264;
    fVar352 = fVar406 + 2.0 + -fVar226 + fVar359;
    fVar328 = (float)local_1e0._0_4_ * fVar367 +
              fVar388 * (float)local_400._0_4_ +
              auVar425._0_4_ * fVar326 + fVar247 * (float)local_440._0_4_;
    fVar335 = (float)local_1e0._4_4_ * fVar373 +
              fVar400 * (float)local_400._4_4_ +
              auVar425._4_4_ * fVar333 + fVar257 * (float)local_440._4_4_;
    fVar338 = fStack_1d8 * fVar375 +
              fVar403 * fStack_3f8 + auVar425._8_4_ * fVar336 + fVar259 * fStack_438;
    fVar341 = fStack_1d4 * fVar378 +
              fVar407 * fStack_3f4 + auVar425._12_4_ * fVar339 + fVar261 * fStack_434;
    fVar344 = fStack_1d0 * fVar380 +
              fVar410 * fStack_3f0 + auVar425._16_4_ * fVar342 + fVar262 * fStack_430;
    fVar347 = fStack_1cc * fVar382 +
              fVar413 * fStack_3ec + auVar425._20_4_ * fVar345 + fVar263 * fStack_42c;
    fVar350 = fStack_1c8 * fVar384 +
              fVar416 * fStack_3e8 + auVar425._24_4_ * fVar348 + fVar264 * fStack_428;
    fVar353 = fVar352 + fVar359 + fVar366;
    fVar170 = (float)local_200._0_4_ * fVar367 +
              fVar388 * (float)local_420._0_4_ +
              fVar326 * (float)local_4a0._0_4_ + fVar247 * (float)local_460._0_4_;
    fVar195 = (float)local_200._4_4_ * fVar373 +
              fVar400 * (float)local_420._4_4_ +
              fVar333 * (float)local_4a0._4_4_ + fVar257 * (float)local_460._4_4_;
    fVar196 = fStack_1f8 * fVar375 +
              fVar403 * fStack_418 + fVar336 * fStack_498 + fVar259 * fStack_458;
    fVar197 = fStack_1f4 * fVar378 +
              fVar407 * fStack_414 + fVar339 * fStack_494 + fVar261 * fStack_454;
    fVar198 = fStack_1f0 * fVar380 +
              fVar410 * fStack_410 + fVar342 * fStack_490 + fVar262 * fStack_450;
    fVar199 = fStack_1ec * fVar382 +
              fVar413 * fStack_40c + fVar345 * fStack_48c + fVar263 * fStack_44c;
    fVar200 = fStack_1e8 * fVar384 +
              fVar416 * fStack_408 + fVar348 * fStack_488 + fVar264 * fStack_448;
    fVar201 = fVar353 + fVar366 + fVar377 + fVar406;
    local_840._0_4_ =
         (float)local_220._0_4_ * fVar367 +
         (float)local_240._0_4_ * fVar388 +
         fVar326 * (float)local_260._0_4_ + fVar247 * (float)local_480._0_4_;
    local_840._4_4_ =
         (float)local_220._4_4_ * fVar373 +
         (float)local_240._4_4_ * fVar400 +
         fVar333 * (float)local_260._4_4_ + fVar257 * (float)local_480._4_4_;
    local_840._8_4_ =
         fStack_218 * fVar375 + fStack_238 * fVar403 + fVar336 * fStack_258 + fVar259 * fStack_478;
    local_840._12_4_ =
         fStack_214 * fVar378 + fStack_234 * fVar407 + fVar339 * fStack_254 + fVar261 * fStack_474;
    local_840._16_4_ =
         fStack_210 * fVar380 + fStack_230 * fVar410 + fVar342 * fStack_250 + fVar262 * fStack_470;
    local_840._20_4_ =
         fStack_20c * fVar382 + fStack_22c * fVar413 + fVar345 * fStack_24c + fVar263 * fStack_46c;
    local_840._24_4_ =
         fStack_208 * fVar384 + fStack_228 * fVar416 + fVar348 * fStack_248 + fVar264 * fStack_468;
    local_840._28_4_ = fVar353 + fVar406 + 2.0 + -fVar226 + fVar127 + -5.0 + 2.0;
    auVar33._4_4_ = (fVar160 + fVar160) * auVar217._4_4_;
    auVar33._0_4_ = (fVar130 + fVar130) * auVar217._0_4_;
    auVar33._8_4_ = (fVar163 + fVar163) * auVar217._8_4_;
    auVar33._12_4_ = (fVar202 + fVar202) * auVar217._12_4_;
    auVar33._16_4_ = (fVar222 + fVar222) * auVar217._16_4_;
    auVar33._20_4_ = (fVar223 + fVar223) * auVar217._20_4_;
    auVar33._24_4_ = (fVar224 + fVar224) * auVar217._24_4_;
    auVar33._28_4_ = auVar217._28_4_ + auVar217._28_4_;
    auVar113 = vsubps_avx(auVar33,auVar319._0_32_);
    auVar32._4_4_ = (fVar160 + fVar160) * (fVar241 + 2.0);
    auVar32._0_4_ = (fVar130 + fVar130) * (fVar240 + 2.0);
    auVar32._8_4_ = (fVar163 + fVar163) * (fVar242 + 2.0);
    auVar32._12_4_ = (fVar202 + fVar202) * (fVar246 + 2.0);
    auVar32._16_4_ = (fVar222 + fVar222) * (fVar256 + 2.0);
    auVar32._20_4_ = (fVar223 + fVar223) * (fVar258 + 2.0);
    auVar32._24_4_ = (fVar224 + fVar224) * (fVar260 + 2.0);
    auVar32._28_4_ = auVar235._28_4_ + 2.0;
    auVar332._4_4_ = fVar160 * fVar160 * 3.0;
    auVar332._0_4_ = fVar130 * fVar130 * 3.0;
    auVar332._8_4_ = fVar163 * fVar163 * 3.0;
    auVar332._12_4_ = fVar202 * fVar202 * 3.0;
    auVar332._16_4_ = fVar222 * fVar222 * 3.0;
    auVar332._20_4_ = fVar223 * fVar223 * 3.0;
    auVar332._24_4_ = fVar224 * fVar224 * 3.0;
    auVar332._28_4_ = fVar226;
    auVar114 = vsubps_avx(auVar32,auVar332);
    auVar33 = vsubps_avx(auVar184,auVar33);
    fVar342 = auVar113._0_4_ * 0.5;
    fVar345 = auVar113._4_4_ * 0.5;
    fVar348 = auVar113._8_4_ * 0.5;
    fVar359 = auVar113._12_4_ * 0.5;
    fVar366 = auVar113._16_4_ * 0.5;
    fVar367 = auVar113._20_4_ * 0.5;
    fVar373 = auVar113._24_4_ * 0.5;
    fVar257 = (auVar217._0_4_ * fVar240 + (auVar217._0_4_ + auVar217._0_4_) * (fVar240 + -5.0)) *
              0.5;
    fVar261 = (auVar217._4_4_ * fVar241 + (auVar217._4_4_ + auVar217._4_4_) * (fVar241 + -5.0)) *
              0.5;
    fVar264 = (auVar217._8_4_ * fVar242 + (auVar217._8_4_ + auVar217._8_4_) * (fVar242 + -5.0)) *
              0.5;
    fVar326 = (auVar217._12_4_ * fVar246 + (auVar217._12_4_ + auVar217._12_4_) * (fVar246 + -5.0)) *
              0.5;
    fVar333 = (auVar217._16_4_ * fVar256 + (auVar217._16_4_ + auVar217._16_4_) * (fVar256 + -5.0)) *
              0.5;
    fVar336 = (auVar217._20_4_ * fVar258 + (auVar217._20_4_ + auVar217._20_4_) * (fVar258 + -5.0)) *
              0.5;
    fVar339 = (auVar217._24_4_ * fVar260 + (auVar217._24_4_ + auVar217._24_4_) * (fVar260 + -5.0)) *
              0.5;
    fVar130 = auVar114._0_4_ * 0.5;
    fVar160 = auVar114._4_4_ * 0.5;
    fVar163 = auVar114._8_4_ * 0.5;
    fVar202 = auVar114._12_4_ * 0.5;
    fVar222 = auVar114._16_4_ * 0.5;
    fVar223 = auVar114._20_4_ * 0.5;
    fVar242 = auVar114._24_4_ * 0.5;
    fVar241 = auVar33._0_4_ * 0.5;
    fVar246 = auVar33._4_4_ * 0.5;
    fVar256 = auVar33._8_4_ * 0.5;
    fVar258 = auVar33._12_4_ * 0.5;
    fVar260 = auVar33._16_4_ * 0.5;
    fVar262 = auVar33._20_4_ * 0.5;
    fVar263 = auVar33._24_4_ * 0.5;
    fVar310 = fVar226 + fVar226 + auVar113._28_4_ + fVar226 + fVar226 + auVar235._28_4_ + -5.0;
    auVar136 = vpermilps_avx(ZEXT416((uint)(auVar109._0_4_ * 0.04761905)),0);
    fVar224 = auVar136._0_4_;
    fVar287 = fVar224 * (fVar342 * (float)local_3c0._0_4_ +
                        fVar257 * (float)local_3e0._0_4_ + fVar130 * fVar387 + fVar241 * fVar243);
    fVar240 = auVar136._4_4_;
    fVar299 = fVar240 * (fVar345 * (float)local_3c0._4_4_ +
                        fVar261 * (float)local_3e0._4_4_ + fVar160 * fVar399 + fVar246 * fVar244);
    auVar42._4_4_ = fVar299;
    auVar42._0_4_ = fVar287;
    fVar247 = auVar136._8_4_;
    fVar300 = fVar247 * (fVar348 * fStack_3b8 +
                        fVar264 * fStack_3d8 + fVar163 * fVar282 + fVar256 * fVar245);
    auVar42._8_4_ = fVar300;
    fVar259 = auVar136._12_4_;
    fVar302 = fVar259 * (fVar359 * fStack_3b4 +
                        fVar326 * fStack_3d4 + fVar202 * fVar406 + fVar258 * fVar377);
    auVar42._12_4_ = fVar302;
    fVar304 = fVar224 * (fVar366 * fStack_3b0 +
                        fVar333 * fStack_3d0 + fVar222 * fVar387 + fVar260 * fVar243);
    auVar42._16_4_ = fVar304;
    fVar306 = fVar240 * (fVar367 * fStack_3ac +
                        fVar336 * fStack_3cc + fVar223 * fVar399 + fVar262 * fVar244);
    auVar42._20_4_ = fVar306;
    fVar308 = fVar247 * (fVar373 * fStack_3a8 +
                        fVar339 * fStack_3c8 + fVar242 * fVar282 + fVar263 * fVar245);
    auVar42._24_4_ = fVar308;
    auVar42._28_4_ = fVar310;
    fVar368 = fVar224 * ((float)local_1e0._0_4_ * fVar342 +
                        fVar257 * (float)local_400._0_4_ +
                        fVar130 * (float)local_440._0_4_ + fVar241 * (float)local_a40._0_4_);
    fVar374 = fVar240 * ((float)local_1e0._4_4_ * fVar345 +
                        fVar261 * (float)local_400._4_4_ +
                        fVar160 * (float)local_440._4_4_ + fVar246 * (float)local_a40._4_4_);
    auVar148._4_4_ = fVar374;
    auVar148._0_4_ = fVar368;
    fVar376 = fVar247 * (fStack_1d8 * fVar348 +
                        fVar264 * fStack_3f8 + fVar163 * fStack_438 + fVar256 * fStack_a38);
    auVar148._8_4_ = fVar376;
    fVar379 = fVar259 * (fStack_1d4 * fVar359 +
                        fVar326 * fStack_3f4 + fVar202 * fStack_434 + fVar258 * fStack_a34);
    auVar148._12_4_ = fVar379;
    fVar381 = fVar224 * (fStack_1d0 * fVar366 +
                        fVar333 * fStack_3f0 + fVar222 * fStack_430 + fVar260 * fStack_a30);
    auVar148._16_4_ = fVar381;
    fVar383 = fVar240 * (fStack_1cc * fVar367 +
                        fVar336 * fStack_3ec + fVar223 * fStack_42c + fVar262 * fStack_a2c);
    auVar148._20_4_ = fVar383;
    fVar385 = fVar247 * (fStack_1c8 * fVar373 +
                        fVar339 * fStack_3e8 + fVar242 * fStack_428 + fVar263 * fStack_a28);
    auVar148._24_4_ = fVar385;
    auVar148._28_4_ = fVar386;
    fVar389 = fVar224 * ((float)local_200._0_4_ * fVar342 +
                        fVar130 * (float)local_460._0_4_ + fVar241 * (float)local_4a0._0_4_ +
                        fVar257 * (float)local_420._0_4_);
    fVar401 = fVar240 * ((float)local_200._4_4_ * fVar345 +
                        fVar160 * (float)local_460._4_4_ + fVar246 * (float)local_4a0._4_4_ +
                        fVar261 * (float)local_420._4_4_);
    local_800._4_4_ = fVar401;
    local_800._0_4_ = fVar389;
    fVar404 = fVar247 * (fStack_1f8 * fVar348 +
                        fVar163 * fStack_458 + fVar256 * fStack_498 + fVar264 * fStack_418);
    local_800._8_4_ = fVar404;
    fVar408 = fVar259 * (fStack_1f4 * fVar359 +
                        fVar202 * fStack_454 + fVar258 * fStack_494 + fVar326 * fStack_414);
    local_800._12_4_ = fVar408;
    fVar411 = fVar224 * (fStack_1f0 * fVar366 +
                        fVar222 * fStack_450 + fVar260 * fStack_490 + fVar333 * fStack_410);
    local_800._16_4_ = fVar411;
    fVar414 = fVar240 * (fStack_1ec * fVar367 +
                        fVar223 * fStack_44c + fVar262 * fStack_48c + fVar336 * fStack_40c);
    local_800._20_4_ = fVar414;
    fVar417 = fVar247 * (fStack_1e8 * fVar373 +
                        fVar242 * fStack_448 + fVar263 * fStack_488 + fVar339 * fStack_408);
    local_800._24_4_ = fVar417;
    local_800._28_4_ = uStack_1c4;
    fVar226 = fVar224 * ((float)local_220._0_4_ * fVar342 +
                        (float)local_240._0_4_ * fVar257 +
                        fVar130 * (float)local_480._0_4_ + (float)local_260._0_4_ * fVar241);
    fVar241 = fVar240 * ((float)local_220._4_4_ * fVar345 +
                        (float)local_240._4_4_ * fVar261 +
                        fVar160 * (float)local_480._4_4_ + (float)local_260._4_4_ * fVar246);
    auVar35._4_4_ = fVar241;
    auVar35._0_4_ = fVar226;
    fVar257 = fVar247 * (fStack_218 * fVar348 +
                        fStack_238 * fVar264 + fVar163 * fStack_478 + fStack_258 * fVar256);
    auVar35._8_4_ = fVar257;
    fVar261 = fVar259 * (fStack_214 * fVar359 +
                        fStack_234 * fVar326 + fVar202 * fStack_474 + fStack_254 * fVar258);
    auVar35._12_4_ = fVar261;
    fVar224 = fVar224 * (fStack_210 * fVar366 +
                        fStack_230 * fVar333 + fVar222 * fStack_470 + fStack_250 * fVar260);
    auVar35._16_4_ = fVar224;
    fVar240 = fVar240 * (fStack_20c * fVar367 +
                        fStack_22c * fVar336 + fVar223 * fStack_46c + fStack_24c * fVar262);
    auVar35._20_4_ = fVar240;
    fVar247 = fVar247 * (fStack_208 * fVar373 +
                        fStack_228 * fVar339 + fVar242 * fStack_468 + fStack_248 * fVar263);
    auVar35._24_4_ = fVar247;
    auVar35._28_4_ = fVar259;
    auVar85._4_4_ = fVar335;
    auVar85._0_4_ = fVar328;
    auVar85._8_4_ = fVar338;
    auVar85._12_4_ = fVar341;
    auVar85._16_4_ = fVar344;
    auVar85._20_4_ = fVar347;
    auVar85._24_4_ = fVar350;
    auVar85._28_4_ = fVar353;
    auVar113 = vperm2f128_avx(auVar85,auVar85,1);
    auVar113 = vshufps_avx(auVar113,auVar85,0x30);
    _local_a80 = vshufps_avx(auVar85,auVar113,0x29);
    auVar83._4_4_ = fVar195;
    auVar83._0_4_ = fVar170;
    auVar83._8_4_ = fVar196;
    auVar83._12_4_ = fVar197;
    auVar83._16_4_ = fVar198;
    auVar83._20_4_ = fVar199;
    auVar83._24_4_ = fVar200;
    auVar83._28_4_ = fVar201;
    auVar113 = vperm2f128_avx(auVar83,auVar83,1);
    auVar113 = vshufps_avx(auVar113,auVar83,0x30);
    auVar33 = vshufps_avx(auVar83,auVar113,0x29);
    auVar235 = vsubps_avx(local_840,auVar35);
    auVar113 = vperm2f128_avx(auVar235,auVar235,1);
    auVar113 = vshufps_avx(auVar113,auVar235,0x30);
    auVar32 = vshufps_avx(auVar235,auVar113,0x29);
    auVar114 = vsubps_avx(_local_a80,auVar85);
    auVar34 = vsubps_avx(auVar33,auVar83);
    fVar160 = auVar114._0_4_;
    fVar242 = auVar114._4_4_;
    auVar36._4_4_ = fVar401 * fVar242;
    auVar36._0_4_ = fVar389 * fVar160;
    fVar262 = auVar114._8_4_;
    auVar36._8_4_ = fVar404 * fVar262;
    fVar348 = auVar114._12_4_;
    auVar36._12_4_ = fVar408 * fVar348;
    fVar378 = auVar114._16_4_;
    auVar36._16_4_ = fVar411 * fVar378;
    fVar403 = auVar114._20_4_;
    auVar36._20_4_ = fVar414 * fVar403;
    fVar20 = auVar114._24_4_;
    auVar36._24_4_ = fVar417 * fVar20;
    auVar36._28_4_ = auVar235._28_4_;
    fVar163 = auVar34._0_4_;
    fVar246 = auVar34._4_4_;
    auVar37._4_4_ = fVar374 * fVar246;
    auVar37._0_4_ = fVar368 * fVar163;
    fVar263 = auVar34._8_4_;
    auVar37._8_4_ = fVar376 * fVar263;
    fVar359 = auVar34._12_4_;
    auVar37._12_4_ = fVar379 * fVar359;
    fVar380 = auVar34._16_4_;
    auVar37._16_4_ = fVar381 * fVar380;
    fVar406 = auVar34._20_4_;
    auVar37._20_4_ = fVar383 * fVar406;
    fVar21 = auVar34._24_4_;
    auVar37._24_4_ = fVar385 * fVar21;
    auVar37._28_4_ = auVar113._28_4_;
    auVar35 = vsubps_avx(auVar37,auVar36);
    auVar87._4_4_ = fVar334;
    auVar87._0_4_ = fVar327;
    auVar87._8_4_ = fVar337;
    auVar87._12_4_ = fVar340;
    auVar87._16_4_ = fVar343;
    auVar87._20_4_ = fVar346;
    auVar87._24_4_ = fVar349;
    auVar87._28_4_ = fVar352;
    auVar113 = vperm2f128_avx(auVar87,auVar87,1);
    auVar113 = vshufps_avx(auVar113,auVar87,0x30);
    auVar332 = vshufps_avx(auVar87,auVar113,0x29);
    auVar36 = vsubps_avx(auVar332,auVar87);
    auVar371._4_4_ = fVar246 * fVar299;
    auVar371._0_4_ = fVar163 * fVar287;
    auVar371._8_4_ = fVar263 * fVar300;
    auVar371._12_4_ = fVar359 * fVar302;
    auVar371._16_4_ = fVar380 * fVar304;
    auVar371._20_4_ = fVar406 * fVar306;
    auVar371._24_4_ = fVar21 * fVar308;
    auVar371._28_4_ = auVar113._28_4_;
    fVar202 = auVar36._0_4_;
    fVar256 = auVar36._4_4_;
    auVar38._4_4_ = fVar401 * fVar256;
    auVar38._0_4_ = fVar389 * fVar202;
    fVar264 = auVar36._8_4_;
    auVar38._8_4_ = fVar404 * fVar264;
    fVar366 = auVar36._12_4_;
    auVar38._12_4_ = fVar408 * fVar366;
    fVar382 = auVar36._16_4_;
    auVar38._16_4_ = fVar411 * fVar382;
    fVar407 = auVar36._20_4_;
    auVar38._20_4_ = fVar414 * fVar407;
    fVar22 = auVar36._24_4_;
    auVar38._24_4_ = fVar417 * fVar22;
    auVar38._28_4_ = fVar352;
    auVar37 = vsubps_avx(auVar38,auVar371);
    auVar39._4_4_ = fVar374 * fVar256;
    auVar39._0_4_ = fVar368 * fVar202;
    auVar39._8_4_ = fVar376 * fVar264;
    auVar39._12_4_ = fVar379 * fVar366;
    auVar39._16_4_ = fVar381 * fVar382;
    auVar39._20_4_ = fVar383 * fVar407;
    auVar39._24_4_ = fVar385 * fVar22;
    auVar39._28_4_ = fVar352;
    auVar372._4_4_ = fVar242 * fVar299;
    auVar372._0_4_ = fVar160 * fVar287;
    auVar372._8_4_ = fVar262 * fVar300;
    auVar372._12_4_ = fVar348 * fVar302;
    auVar372._16_4_ = fVar378 * fVar304;
    auVar372._20_4_ = fVar403 * fVar306;
    auVar372._24_4_ = fVar20 * fVar308;
    auVar372._28_4_ = fVar201;
    auVar371 = vsubps_avx(auVar372,auVar39);
    fVar130 = auVar371._28_4_;
    fVar336 = auVar37._28_4_ + fVar130;
    auVar218._0_4_ = fVar202 * fVar202 + fVar160 * fVar160 + fVar163 * fVar163;
    auVar218._4_4_ = fVar256 * fVar256 + fVar242 * fVar242 + fVar246 * fVar246;
    auVar218._8_4_ = fVar264 * fVar264 + fVar262 * fVar262 + fVar263 * fVar263;
    auVar218._12_4_ = fVar366 * fVar366 + fVar348 * fVar348 + fVar359 * fVar359;
    auVar218._16_4_ = fVar382 * fVar382 + fVar378 * fVar378 + fVar380 * fVar380;
    auVar218._20_4_ = fVar407 * fVar407 + fVar403 * fVar403 + fVar406 * fVar406;
    auVar218._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar218._28_4_ = fVar130 + fVar130 + fVar336;
    auVar113 = vrcpps_avx(auVar218);
    fVar130 = auVar113._0_4_;
    fVar339 = auVar113._4_4_;
    auVar40._4_4_ = fVar339 * auVar218._4_4_;
    auVar40._0_4_ = fVar130 * auVar218._0_4_;
    fVar342 = auVar113._8_4_;
    auVar40._8_4_ = fVar342 * auVar218._8_4_;
    fVar345 = auVar113._12_4_;
    auVar40._12_4_ = fVar345 * auVar218._12_4_;
    fVar243 = auVar113._16_4_;
    auVar40._16_4_ = fVar243 * auVar218._16_4_;
    fVar244 = auVar113._20_4_;
    auVar40._20_4_ = fVar244 * auVar218._20_4_;
    fVar245 = auVar113._24_4_;
    auVar40._24_4_ = fVar245 * auVar218._24_4_;
    auVar40._28_4_ = fVar201;
    auVar185._8_4_ = 0x3f800000;
    auVar185._0_8_ = 0x3f8000003f800000;
    auVar185._12_4_ = 0x3f800000;
    auVar185._16_4_ = 0x3f800000;
    auVar185._20_4_ = 0x3f800000;
    auVar185._24_4_ = 0x3f800000;
    auVar185._28_4_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar185,auVar40);
    fVar130 = auVar38._0_4_ * fVar130 + fVar130;
    fVar339 = auVar38._4_4_ * fVar339 + fVar339;
    fVar342 = auVar38._8_4_ * fVar342 + fVar342;
    fVar345 = auVar38._12_4_ * fVar345 + fVar345;
    fVar243 = auVar38._16_4_ * fVar243 + fVar243;
    fVar244 = auVar38._20_4_ * fVar244 + fVar244;
    fVar245 = auVar38._24_4_ * fVar245 + fVar245;
    auVar235 = vperm2f128_avx(auVar148,auVar148,1);
    auVar235 = vshufps_avx(auVar235,auVar148,0x30);
    auVar235 = vshufps_avx(auVar148,auVar235,0x29);
    auVar114 = vperm2f128_avx(local_800,local_800,1);
    auVar114 = vshufps_avx(auVar114,local_800,0x30);
    local_980 = vshufps_avx(local_800,auVar114,0x29);
    fVar390 = local_980._0_4_;
    fVar402 = local_980._4_4_;
    auVar41._4_4_ = fVar402 * fVar242;
    auVar41._0_4_ = fVar390 * fVar160;
    fVar405 = local_980._8_4_;
    auVar41._8_4_ = fVar405 * fVar262;
    fVar409 = local_980._12_4_;
    auVar41._12_4_ = fVar409 * fVar348;
    fVar412 = local_980._16_4_;
    auVar41._16_4_ = fVar412 * fVar378;
    fVar415 = local_980._20_4_;
    auVar41._20_4_ = fVar415 * fVar403;
    fVar418 = local_980._24_4_;
    auVar41._24_4_ = fVar418 * fVar20;
    auVar41._28_4_ = auVar114._28_4_;
    fVar222 = auVar235._0_4_;
    fVar258 = auVar235._4_4_;
    auVar43._4_4_ = fVar246 * fVar258;
    auVar43._0_4_ = fVar163 * fVar222;
    fVar326 = auVar235._8_4_;
    auVar43._8_4_ = fVar263 * fVar326;
    fVar367 = auVar235._12_4_;
    auVar43._12_4_ = fVar359 * fVar367;
    fVar384 = auVar235._16_4_;
    auVar43._16_4_ = fVar380 * fVar384;
    fVar410 = auVar235._20_4_;
    auVar43._20_4_ = fVar406 * fVar410;
    fVar23 = auVar235._24_4_;
    auVar43._24_4_ = fVar21 * fVar23;
    auVar43._28_4_ = fVar386;
    auVar148 = vsubps_avx(auVar43,auVar41);
    auVar235 = vperm2f128_avx(auVar42,auVar42,1);
    auVar235 = vshufps_avx(auVar235,auVar42,0x30);
    auVar114 = vshufps_avx(auVar42,auVar235,0x29);
    fVar223 = auVar114._0_4_;
    fVar260 = auVar114._4_4_;
    auVar44._4_4_ = fVar246 * fVar260;
    auVar44._0_4_ = fVar163 * fVar223;
    fVar333 = auVar114._8_4_;
    auVar44._8_4_ = fVar263 * fVar333;
    fVar373 = auVar114._12_4_;
    auVar44._12_4_ = fVar359 * fVar373;
    fVar387 = auVar114._16_4_;
    auVar44._16_4_ = fVar380 * fVar387;
    fVar413 = auVar114._20_4_;
    auVar44._20_4_ = fVar406 * fVar413;
    fVar24 = auVar114._24_4_;
    auVar44._24_4_ = fVar21 * fVar24;
    auVar44._28_4_ = auVar235._28_4_;
    auVar45._4_4_ = fVar402 * fVar256;
    auVar45._0_4_ = fVar390 * fVar202;
    auVar45._8_4_ = fVar405 * fVar264;
    auVar45._12_4_ = fVar409 * fVar366;
    auVar45._16_4_ = fVar412 * fVar382;
    auVar45._20_4_ = fVar415 * fVar407;
    uVar91 = local_980._28_4_;
    auVar45._24_4_ = fVar418 * fVar22;
    auVar45._28_4_ = uVar91;
    auVar235 = vsubps_avx(auVar45,auVar44);
    auVar46._4_4_ = fVar256 * fVar258;
    auVar46._0_4_ = fVar202 * fVar222;
    auVar46._8_4_ = fVar264 * fVar326;
    auVar46._12_4_ = fVar366 * fVar367;
    auVar46._16_4_ = fVar382 * fVar384;
    auVar46._20_4_ = fVar407 * fVar410;
    auVar46._24_4_ = fVar22 * fVar23;
    auVar46._28_4_ = uVar91;
    auVar47._4_4_ = fVar242 * fVar260;
    auVar47._0_4_ = fVar160 * fVar223;
    auVar47._8_4_ = fVar262 * fVar333;
    auVar47._12_4_ = fVar348 * fVar373;
    auVar47._16_4_ = fVar378 * fVar387;
    auVar47._20_4_ = fVar403 * fVar413;
    auVar47._24_4_ = fVar20 * fVar24;
    auVar47._28_4_ = fStack_204;
    auVar39 = vsubps_avx(auVar47,auVar46);
    auVar48._4_4_ =
         (auVar35._4_4_ * auVar35._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar371._4_4_ * auVar371._4_4_) * fVar339;
    auVar48._0_4_ =
         (auVar35._0_4_ * auVar35._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar371._0_4_ * auVar371._0_4_) * fVar130;
    auVar48._8_4_ =
         (auVar35._8_4_ * auVar35._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar371._8_4_ * auVar371._8_4_) * fVar342;
    auVar48._12_4_ =
         (auVar35._12_4_ * auVar35._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar371._12_4_ * auVar371._12_4_) * fVar345;
    auVar48._16_4_ =
         (auVar35._16_4_ * auVar35._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar371._16_4_ * auVar371._16_4_) * fVar243;
    auVar48._20_4_ =
         (auVar35._20_4_ * auVar35._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar371._20_4_ * auVar371._20_4_) * fVar244;
    auVar48._24_4_ =
         (auVar35._24_4_ * auVar35._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar371._24_4_ * auVar371._24_4_) * fVar245;
    auVar48._28_4_ = auVar35._28_4_ + fVar336;
    auVar49._4_4_ =
         (auVar148._4_4_ * auVar148._4_4_ +
         auVar235._4_4_ * auVar235._4_4_ + auVar39._4_4_ * auVar39._4_4_) * fVar339;
    auVar49._0_4_ =
         (auVar148._0_4_ * auVar148._0_4_ +
         auVar235._0_4_ * auVar235._0_4_ + auVar39._0_4_ * auVar39._0_4_) * fVar130;
    auVar49._8_4_ =
         (auVar148._8_4_ * auVar148._8_4_ +
         auVar235._8_4_ * auVar235._8_4_ + auVar39._8_4_ * auVar39._8_4_) * fVar342;
    auVar49._12_4_ =
         (auVar148._12_4_ * auVar148._12_4_ +
         auVar235._12_4_ * auVar235._12_4_ + auVar39._12_4_ * auVar39._12_4_) * fVar345;
    auVar49._16_4_ =
         (auVar148._16_4_ * auVar148._16_4_ +
         auVar235._16_4_ * auVar235._16_4_ + auVar39._16_4_ * auVar39._16_4_) * fVar243;
    auVar49._20_4_ =
         (auVar148._20_4_ * auVar148._20_4_ +
         auVar235._20_4_ * auVar235._20_4_ + auVar39._20_4_ * auVar39._20_4_) * fVar244;
    auVar49._24_4_ =
         (auVar148._24_4_ * auVar148._24_4_ +
         auVar235._24_4_ * auVar235._24_4_ + auVar39._24_4_ * auVar39._24_4_) * fVar245;
    auVar49._28_4_ = auVar38._28_4_ + auVar113._28_4_;
    auVar113 = vmaxps_avx(auVar48,auVar49);
    auVar235 = vperm2f128_avx(local_840,local_840,1);
    auVar235 = vshufps_avx(auVar235,local_840,0x30);
    auVar35 = vshufps_avx(local_840,auVar235,0x29);
    auVar115._0_4_ = (float)local_840._0_4_ + fVar226;
    auVar115._4_4_ = local_840._4_4_ + fVar241;
    auVar115._8_4_ = local_840._8_4_ + fVar257;
    auVar115._12_4_ = local_840._12_4_ + fVar261;
    auVar115._16_4_ = local_840._16_4_ + fVar224;
    auVar115._20_4_ = local_840._20_4_ + fVar240;
    auVar115._24_4_ = local_840._24_4_ + fVar247;
    auVar115._28_4_ = local_840._28_4_ + fVar259;
    auVar235 = vmaxps_avx(local_840,auVar115);
    auVar114 = vmaxps_avx(auVar32,auVar35);
    auVar235 = vmaxps_avx(auVar235,auVar114);
    auVar114 = vrsqrtps_avx(auVar218);
    fVar130 = auVar114._0_4_;
    fVar224 = auVar114._4_4_;
    fVar226 = auVar114._8_4_;
    fVar240 = auVar114._12_4_;
    fVar241 = auVar114._16_4_;
    fVar247 = auVar114._20_4_;
    fVar257 = auVar114._24_4_;
    auVar50._4_4_ = fVar224 * fVar224 * fVar224 * auVar218._4_4_ * 0.5;
    auVar50._0_4_ = fVar130 * fVar130 * fVar130 * auVar218._0_4_ * 0.5;
    auVar50._8_4_ = fVar226 * fVar226 * fVar226 * auVar218._8_4_ * 0.5;
    auVar50._12_4_ = fVar240 * fVar240 * fVar240 * auVar218._12_4_ * 0.5;
    auVar50._16_4_ = fVar241 * fVar241 * fVar241 * auVar218._16_4_ * 0.5;
    auVar50._20_4_ = fVar247 * fVar247 * fVar247 * auVar218._20_4_ * 0.5;
    auVar50._24_4_ = fVar257 * fVar257 * fVar257 * auVar218._24_4_ * 0.5;
    auVar50._28_4_ = auVar218._28_4_;
    auVar51._4_4_ = fVar224 * 1.5;
    auVar51._0_4_ = fVar130 * 1.5;
    auVar51._8_4_ = fVar226 * 1.5;
    auVar51._12_4_ = fVar240 * 1.5;
    auVar51._16_4_ = fVar241 * 1.5;
    auVar51._20_4_ = fVar247 * 1.5;
    auVar51._24_4_ = fVar257 * 1.5;
    auVar51._28_4_ = auVar114._28_4_;
    local_300 = vsubps_avx(auVar51,auVar50);
    auVar86._4_4_ = fVar335;
    auVar86._0_4_ = fVar328;
    auVar86._8_4_ = fVar338;
    auVar86._12_4_ = fVar341;
    auVar86._16_4_ = fVar344;
    auVar86._20_4_ = fVar347;
    auVar86._24_4_ = fVar350;
    auVar86._28_4_ = fVar353;
    auVar371 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar37 = vsubps_avx(auVar371,auVar86);
    auVar84._4_4_ = fVar195;
    auVar84._0_4_ = fVar170;
    auVar84._8_4_ = fVar196;
    auVar84._12_4_ = fVar197;
    auVar84._16_4_ = fVar198;
    auVar84._20_4_ = fVar199;
    auVar84._24_4_ = fVar200;
    auVar84._28_4_ = fVar201;
    auVar371 = vsubps_avx(auVar371,auVar84);
    fVar224 = auVar371._0_4_;
    fVar247 = auVar371._4_4_;
    fVar336 = auVar371._8_4_;
    fVar243 = auVar371._12_4_;
    fVar388 = auVar371._16_4_;
    fVar416 = auVar371._20_4_;
    fVar25 = auVar371._24_4_;
    fVar226 = auVar37._0_4_;
    fVar257 = auVar37._4_4_;
    fVar339 = auVar37._8_4_;
    fVar244 = auVar37._12_4_;
    fVar399 = auVar37._16_4_;
    fVar18 = auVar37._20_4_;
    fVar26 = auVar37._24_4_;
    auVar88._4_4_ = fVar334;
    auVar88._0_4_ = fVar327;
    auVar88._8_4_ = fVar337;
    auVar88._12_4_ = fVar340;
    auVar88._16_4_ = fVar343;
    auVar88._20_4_ = fVar346;
    auVar88._24_4_ = fVar349;
    auVar88._28_4_ = fVar352;
    auVar372 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar38 = vsubps_avx(auVar372,auVar88);
    fVar240 = auVar38._0_4_;
    fVar259 = auVar38._4_4_;
    fVar342 = auVar38._8_4_;
    fVar245 = auVar38._12_4_;
    fVar400 = auVar38._16_4_;
    fVar19 = auVar38._20_4_;
    fVar27 = auVar38._24_4_;
    auVar393._0_4_ =
         (float)local_a60._0_4_ * fVar240 +
         (float)local_860._0_4_ * fVar226 + (float)local_9c0._0_4_ * fVar224;
    auVar393._4_4_ =
         (float)local_a60._4_4_ * fVar259 +
         (float)local_860._4_4_ * fVar257 + (float)local_9c0._4_4_ * fVar247;
    auVar393._8_4_ = fStack_a58 * fVar342 + fStack_858 * fVar339 + fStack_9b8 * fVar336;
    auVar393._12_4_ = fStack_a54 * fVar245 + fStack_854 * fVar244 + fStack_9b4 * fVar243;
    auVar393._16_4_ = fStack_a50 * fVar400 + fStack_850 * fVar399 + fStack_9b0 * fVar388;
    auVar393._20_4_ = fStack_a4c * fVar19 + fStack_84c * fVar18 + fStack_9ac * fVar416;
    auVar393._24_4_ = fStack_a48 * fVar27 + fStack_848 * fVar26 + fStack_9a8 * fVar25;
    auVar393._28_4_ = fStack_204 + auVar39._28_4_ + auVar114._28_4_;
    auVar421._0_4_ = fVar240 * fVar240 + fVar226 * fVar226 + fVar224 * fVar224;
    auVar421._4_4_ = fVar259 * fVar259 + fVar257 * fVar257 + fVar247 * fVar247;
    auVar421._8_4_ = fVar342 * fVar342 + fVar339 * fVar339 + fVar336 * fVar336;
    auVar421._12_4_ = fVar245 * fVar245 + fVar244 * fVar244 + fVar243 * fVar243;
    auVar421._16_4_ = fVar400 * fVar400 + fVar399 * fVar399 + fVar388 * fVar388;
    auVar421._20_4_ = fVar19 * fVar19 + fVar18 * fVar18 + fVar416 * fVar416;
    auVar421._24_4_ = fVar27 * fVar27 + fVar26 * fVar26 + fVar25 * fVar25;
    auVar421._28_4_ = fStack_224 + fStack_224 + fStack_204;
    fVar241 = local_300._0_4_;
    fVar261 = local_300._4_4_;
    fVar345 = local_300._8_4_;
    fVar375 = local_300._12_4_;
    fVar282 = local_300._16_4_;
    fVar284 = local_300._20_4_;
    fVar286 = local_300._24_4_;
    fVar311 = (float)local_a60._0_4_ * fVar202 * fVar241 +
              fVar160 * fVar241 * (float)local_860._0_4_ +
              fVar163 * fVar241 * (float)local_9c0._0_4_;
    fVar320 = (float)local_a60._4_4_ * fVar256 * fVar261 +
              fVar242 * fVar261 * (float)local_860._4_4_ +
              fVar246 * fVar261 * (float)local_9c0._4_4_;
    fVar321 = fStack_a58 * fVar264 * fVar345 +
              fVar262 * fVar345 * fStack_858 + fVar263 * fVar345 * fStack_9b8;
    fVar322 = fStack_a54 * fVar366 * fVar375 +
              fVar348 * fVar375 * fStack_854 + fVar359 * fVar375 * fStack_9b4;
    fVar323 = fStack_a50 * fVar382 * fVar282 +
              fVar378 * fVar282 * fStack_850 + fVar380 * fVar282 * fStack_9b0;
    fVar324 = fStack_a4c * fVar407 * fVar284 +
              fVar403 * fVar284 * fStack_84c + fVar406 * fVar284 * fStack_9ac;
    fVar325 = fStack_a48 * fVar22 * fVar286 +
              fVar20 * fVar286 * fStack_848 + fVar21 * fVar286 * fStack_9a8;
    fVar130 = fStack_a44 + fStack_844 + fStack_9a4;
    local_540._0_4_ =
         fVar240 * fVar202 * fVar241 + fVar160 * fVar241 * fVar226 + fVar163 * fVar241 * fVar224;
    local_540._4_4_ =
         fVar259 * fVar256 * fVar261 + fVar242 * fVar261 * fVar257 + fVar246 * fVar261 * fVar247;
    local_540._8_4_ =
         fVar342 * fVar264 * fVar345 + fVar262 * fVar345 * fVar339 + fVar263 * fVar345 * fVar336;
    local_540._12_4_ =
         fVar245 * fVar366 * fVar375 + fVar348 * fVar375 * fVar244 + fVar359 * fVar375 * fVar243;
    local_540._16_4_ =
         fVar400 * fVar382 * fVar282 + fVar378 * fVar282 * fVar399 + fVar380 * fVar282 * fVar388;
    local_540._20_4_ =
         fVar19 * fVar407 * fVar284 + fVar403 * fVar284 * fVar18 + fVar406 * fVar284 * fVar416;
    local_540._24_4_ =
         fVar27 * fVar22 * fVar286 + fVar20 * fVar286 * fVar26 + fVar21 * fVar286 * fVar25;
    local_540._28_4_ = fStack_844 + fVar130;
    auVar52._4_4_ = fVar320 * local_540._4_4_;
    auVar52._0_4_ = fVar311 * local_540._0_4_;
    auVar52._8_4_ = fVar321 * local_540._8_4_;
    auVar52._12_4_ = fVar322 * local_540._12_4_;
    auVar52._16_4_ = fVar323 * local_540._16_4_;
    auVar52._20_4_ = fVar324 * local_540._20_4_;
    auVar52._24_4_ = fVar325 * local_540._24_4_;
    auVar52._28_4_ = fVar130;
    auVar148 = vsubps_avx(auVar393,auVar52);
    auVar53._4_4_ = local_540._4_4_ * local_540._4_4_;
    auVar53._0_4_ = local_540._0_4_ * local_540._0_4_;
    auVar53._8_4_ = local_540._8_4_ * local_540._8_4_;
    auVar53._12_4_ = local_540._12_4_ * local_540._12_4_;
    auVar53._16_4_ = local_540._16_4_ * local_540._16_4_;
    auVar53._20_4_ = local_540._20_4_ * local_540._20_4_;
    auVar53._24_4_ = local_540._24_4_ * local_540._24_4_;
    auVar53._28_4_ = fStack_844;
    auVar39 = vsubps_avx(auVar421,auVar53);
    auVar114 = vsqrtps_avx(auVar113);
    fVar130 = (auVar114._0_4_ + auVar235._0_4_) * 1.0000002;
    fVar161 = (auVar114._4_4_ + auVar235._4_4_) * 1.0000002;
    fVar164 = (auVar114._8_4_ + auVar235._8_4_) * 1.0000002;
    fVar166 = (auVar114._12_4_ + auVar235._12_4_) * 1.0000002;
    fVar167 = (auVar114._16_4_ + auVar235._16_4_) * 1.0000002;
    fVar168 = (auVar114._20_4_ + auVar235._20_4_) * 1.0000002;
    fVar169 = (auVar114._24_4_ + auVar235._24_4_) * 1.0000002;
    auVar54._4_4_ = fVar161 * fVar161;
    auVar54._0_4_ = fVar130 * fVar130;
    auVar54._8_4_ = fVar164 * fVar164;
    auVar54._12_4_ = fVar166 * fVar166;
    auVar54._16_4_ = fVar167 * fVar167;
    auVar54._20_4_ = fVar168 * fVar168;
    auVar54._24_4_ = fVar169 * fVar169;
    auVar54._28_4_ = auVar114._28_4_ + auVar235._28_4_;
    fVar419 = auVar148._0_4_ + auVar148._0_4_;
    fVar426 = auVar148._4_4_ + auVar148._4_4_;
    auVar422._0_8_ = CONCAT44(fVar426,fVar419);
    auVar422._8_4_ = auVar148._8_4_ + auVar148._8_4_;
    auVar422._12_4_ = auVar148._12_4_ + auVar148._12_4_;
    auVar422._16_4_ = auVar148._16_4_ + auVar148._16_4_;
    auVar422._20_4_ = auVar148._20_4_ + auVar148._20_4_;
    auVar422._24_4_ = auVar148._24_4_ + auVar148._24_4_;
    fVar130 = auVar148._28_4_;
    auVar422._28_4_ = fVar130 + fVar130;
    auVar235 = vsubps_avx(auVar39,auVar54);
    local_320._4_4_ = fVar320 * fVar320;
    local_320._0_4_ = fVar311 * fVar311;
    local_320._8_4_ = fVar321 * fVar321;
    local_320._12_4_ = fVar322 * fVar322;
    local_320._16_4_ = fVar323 * fVar323;
    local_320._20_4_ = fVar324 * fVar324;
    local_320._24_4_ = fVar325 * fVar325;
    local_320._28_4_ = auVar34._28_4_;
    auVar365 = ZEXT3264(local_320);
    local_520 = vsubps_avx(local_280,local_320);
    auVar55._4_4_ = fVar426 * fVar426;
    auVar55._0_4_ = fVar419 * fVar419;
    auVar55._8_4_ = auVar422._8_4_ * auVar422._8_4_;
    auVar55._12_4_ = auVar422._12_4_ * auVar422._12_4_;
    auVar55._16_4_ = auVar422._16_4_ * auVar422._16_4_;
    auVar55._20_4_ = auVar422._20_4_ * auVar422._20_4_;
    auVar55._24_4_ = auVar422._24_4_ * auVar422._24_4_;
    auVar55._28_4_ = fVar130;
    fVar161 = local_520._0_4_;
    fVar164 = local_520._4_4_;
    fVar166 = local_520._8_4_;
    fVar167 = local_520._12_4_;
    fVar168 = local_520._16_4_;
    fVar169 = local_520._20_4_;
    fVar351 = local_520._24_4_;
    auVar34._4_4_ = auVar235._4_4_ * fVar164 * 4.0;
    auVar34._0_4_ = auVar235._0_4_ * fVar161 * 4.0;
    auVar34._8_4_ = auVar235._8_4_ * fVar166 * 4.0;
    auVar34._12_4_ = auVar235._12_4_ * fVar167 * 4.0;
    auVar34._16_4_ = auVar235._16_4_ * fVar168 * 4.0;
    auVar34._20_4_ = auVar235._20_4_ * fVar169 * 4.0;
    auVar34._24_4_ = auVar235._24_4_ * fVar351 * 4.0;
    auVar34._28_4_ = 0x40800000;
    auVar34 = vsubps_avx(auVar55,auVar34);
    auVar113 = vcmpps_avx(auVar34,auVar372,5);
    fVar130 = local_520._28_4_;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0x7f,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar113 >> 0xbf,0) == '\0') &&
        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar113[0x1f])
    {
      local_c60._8_4_ = 0x7f800000;
      local_c60._0_8_ = 0x7f8000007f800000;
      local_c60._12_4_ = 0x7f800000;
      local_c60._16_4_ = 0x7f800000;
      local_c60._20_4_ = 0x7f800000;
      local_c60._24_4_ = 0x7f800000;
      local_c60._28_4_ = 0x7f800000;
      auVar423._8_4_ = 0xff800000;
      auVar423._0_8_ = 0xff800000ff800000;
      auVar423._12_4_ = 0xff800000;
      auVar423._16_4_ = 0xff800000;
      auVar423._20_4_ = 0xff800000;
      auVar423._24_4_ = 0xff800000;
      auVar423._28_4_ = 0xff800000;
    }
    else {
      auVar148 = vcmpps_avx(auVar34,auVar372,5);
      auVar372 = vsqrtps_avx(auVar34);
      auVar271._0_4_ = fVar161 + fVar161;
      auVar271._4_4_ = fVar164 + fVar164;
      auVar271._8_4_ = fVar166 + fVar166;
      auVar271._12_4_ = fVar167 + fVar167;
      auVar271._16_4_ = fVar168 + fVar168;
      auVar271._20_4_ = fVar169 + fVar169;
      auVar271._24_4_ = fVar351 + fVar351;
      auVar271._28_4_ = fVar130 + fVar130;
      auVar34 = vrcpps_avx(auVar271);
      fVar265 = auVar34._0_4_;
      fVar278 = auVar34._4_4_;
      auVar56._4_4_ = auVar271._4_4_ * fVar278;
      auVar56._0_4_ = auVar271._0_4_ * fVar265;
      fVar279 = auVar34._8_4_;
      auVar56._8_4_ = auVar271._8_4_ * fVar279;
      fVar280 = auVar34._12_4_;
      auVar56._12_4_ = auVar271._12_4_ * fVar280;
      fVar281 = auVar34._16_4_;
      auVar56._16_4_ = auVar271._16_4_ * fVar281;
      fVar283 = auVar34._20_4_;
      auVar56._20_4_ = auVar271._20_4_ * fVar283;
      fVar285 = auVar34._24_4_;
      auVar56._24_4_ = auVar271._24_4_ * fVar285;
      auVar56._28_4_ = auVar271._28_4_;
      auVar394._8_4_ = 0x3f800000;
      auVar394._0_8_ = 0x3f8000003f800000;
      auVar394._12_4_ = 0x3f800000;
      auVar394._16_4_ = 0x3f800000;
      auVar394._20_4_ = 0x3f800000;
      auVar394._24_4_ = 0x3f800000;
      auVar394._28_4_ = 0x3f800000;
      auVar40 = vsubps_avx(auVar394,auVar56);
      fVar265 = fVar265 + fVar265 * auVar40._0_4_;
      fVar278 = fVar278 + fVar278 * auVar40._4_4_;
      fVar279 = fVar279 + fVar279 * auVar40._8_4_;
      fVar280 = fVar280 + fVar280 * auVar40._12_4_;
      fVar281 = fVar281 + fVar281 * auVar40._16_4_;
      fVar283 = fVar283 + fVar283 * auVar40._20_4_;
      fVar285 = fVar285 + fVar285 * auVar40._24_4_;
      auVar293._0_8_ = CONCAT44(fVar426,fVar419) ^ 0x8000000080000000;
      auVar293._8_4_ = -auVar422._8_4_;
      auVar293._12_4_ = -auVar422._12_4_;
      auVar293._16_4_ = -auVar422._16_4_;
      auVar293._20_4_ = -auVar422._20_4_;
      auVar293._24_4_ = -auVar422._24_4_;
      auVar293._28_4_ = -auVar422._28_4_;
      auVar41 = vsubps_avx(auVar293,auVar372);
      fVar419 = auVar41._0_4_ * fVar265;
      fVar426 = auVar41._4_4_ * fVar278;
      auVar57._4_4_ = fVar426;
      auVar57._0_4_ = fVar419;
      fVar301 = auVar41._8_4_ * fVar279;
      auVar57._8_4_ = fVar301;
      fVar303 = auVar41._12_4_ * fVar280;
      auVar57._12_4_ = fVar303;
      fVar305 = auVar41._16_4_ * fVar281;
      auVar57._16_4_ = fVar305;
      fVar307 = auVar41._20_4_ * fVar283;
      auVar57._20_4_ = fVar307;
      fVar309 = auVar41._24_4_ * fVar285;
      auVar57._24_4_ = fVar309;
      auVar57._28_4_ = auVar41._28_4_;
      auVar372 = vsubps_avx(auVar372,auVar422);
      fVar265 = auVar372._0_4_ * fVar265;
      fVar278 = auVar372._4_4_ * fVar278;
      auVar58._4_4_ = fVar278;
      auVar58._0_4_ = fVar265;
      fVar279 = auVar372._8_4_ * fVar279;
      auVar58._8_4_ = fVar279;
      fVar280 = auVar372._12_4_ * fVar280;
      auVar58._12_4_ = fVar280;
      fVar281 = auVar372._16_4_ * fVar281;
      auVar58._16_4_ = fVar281;
      fVar283 = auVar372._20_4_ * fVar283;
      auVar58._20_4_ = fVar283;
      fVar285 = auVar372._24_4_ * fVar285;
      auVar58._24_4_ = fVar285;
      auVar58._28_4_ = auVar372._28_4_;
      local_940._4_4_ = fVar261 * (local_540._4_4_ + fVar320 * fVar426);
      local_940._0_4_ = fVar241 * (local_540._0_4_ + fVar311 * fVar419);
      uStack_938._0_4_ = fVar345 * (local_540._8_4_ + fVar321 * fVar301);
      uStack_938._4_4_ = fVar375 * (local_540._12_4_ + fVar322 * fVar303);
      uStack_930._0_4_ = fVar282 * (local_540._16_4_ + fVar323 * fVar305);
      uStack_930._4_4_ = fVar284 * (local_540._20_4_ + fVar324 * fVar307);
      uStack_928._0_4_ = fVar286 * (local_540._24_4_ + fVar325 * fVar309);
      uStack_928._4_4_ = local_540._28_4_ + auVar34._28_4_ + auVar40._28_4_;
      auVar395._8_4_ = 0x7fffffff;
      auVar395._0_8_ = 0x7fffffff7fffffff;
      auVar395._12_4_ = 0x7fffffff;
      auVar395._16_4_ = 0x7fffffff;
      auVar395._20_4_ = 0x7fffffff;
      auVar395._24_4_ = 0x7fffffff;
      auVar395._28_4_ = 0x7fffffff;
      auVar34 = vandps_avx(local_320,auVar395);
      auVar372 = vmaxps_avx(local_4c0,auVar34);
      auVar59._4_4_ = auVar372._4_4_ * 1.9073486e-06;
      auVar59._0_4_ = auVar372._0_4_ * 1.9073486e-06;
      auVar59._8_4_ = auVar372._8_4_ * 1.9073486e-06;
      auVar59._12_4_ = auVar372._12_4_ * 1.9073486e-06;
      auVar59._16_4_ = auVar372._16_4_ * 1.9073486e-06;
      auVar59._20_4_ = auVar372._20_4_ * 1.9073486e-06;
      auVar59._24_4_ = auVar372._24_4_ * 1.9073486e-06;
      auVar59._28_4_ = auVar372._28_4_;
      auVar34 = vandps_avx(local_520,auVar395);
      auVar34 = vcmpps_avx(auVar34,auVar59,1);
      auVar315._8_4_ = 0x7f800000;
      auVar315._0_8_ = 0x7f8000007f800000;
      auVar315._12_4_ = 0x7f800000;
      auVar315._16_4_ = 0x7f800000;
      auVar315._20_4_ = 0x7f800000;
      auVar315._24_4_ = 0x7f800000;
      auVar315._28_4_ = 0x7f800000;
      local_c60 = vblendvps_avx(auVar315,auVar57,auVar148);
      local_2e0 = fVar241 * (local_540._0_4_ + fVar311 * fVar265);
      fStack_2dc = fVar261 * (local_540._4_4_ + fVar320 * fVar278);
      fStack_2d8 = fVar345 * (local_540._8_4_ + fVar321 * fVar279);
      fStack_2d4 = fVar375 * (local_540._12_4_ + fVar322 * fVar280);
      fStack_2d0 = fVar282 * (local_540._16_4_ + fVar323 * fVar281);
      fStack_2cc = fVar284 * (local_540._20_4_ + fVar324 * fVar283);
      fStack_2c8 = fVar286 * (local_540._24_4_ + fVar325 * fVar285);
      fStack_2c4 = local_540._28_4_ + auVar372._28_4_;
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar423 = vblendvps_avx(auVar272,auVar58,auVar148);
      auVar372 = auVar148 & auVar34;
      if ((((((((auVar372 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar372 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar372 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar372 >> 0x7f,0) != '\0') ||
            (auVar372 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar372 >> 0xbf,0) != '\0') ||
          (auVar372 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar372[0x1f] < '\0') {
        auVar113 = vandps_avx(auVar34,auVar148);
        auVar136 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar34 = vcmpps_avx(auVar235,ZEXT832(0) << 0x20,2);
        auVar397._8_4_ = 0xff800000;
        auVar397._0_8_ = 0xff800000ff800000;
        auVar397._12_4_ = 0xff800000;
        auVar397._16_4_ = 0xff800000;
        auVar397._20_4_ = 0xff800000;
        auVar397._24_4_ = 0xff800000;
        auVar397._28_4_ = 0xff800000;
        auVar428._8_4_ = 0x7f800000;
        auVar428._0_8_ = 0x7f8000007f800000;
        auVar428._12_4_ = 0x7f800000;
        auVar428._16_4_ = 0x7f800000;
        auVar428._20_4_ = 0x7f800000;
        auVar428._24_4_ = 0x7f800000;
        auVar428._28_4_ = 0x7f800000;
        auVar235 = vblendvps_avx(auVar428,auVar397,auVar34);
        auVar143 = vpmovsxwd_avx(auVar136);
        auVar136 = vpunpckhwd_avx(auVar136,auVar136);
        auVar255._16_16_ = auVar136;
        auVar255._0_16_ = auVar143;
        local_c60 = vblendvps_avx(local_c60,auVar235,auVar255);
        auVar235 = vblendvps_avx(auVar397,auVar428,auVar34);
        auVar423 = vblendvps_avx(auVar423,auVar235,auVar255);
        auVar235 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar158._0_4_ = auVar113._0_4_ ^ auVar235._0_4_;
        auVar158._4_4_ = auVar113._4_4_ ^ auVar235._4_4_;
        auVar158._8_4_ = auVar113._8_4_ ^ auVar235._8_4_;
        auVar158._12_4_ = auVar113._12_4_ ^ auVar235._12_4_;
        auVar158._16_4_ = auVar113._16_4_ ^ auVar235._16_4_;
        auVar158._20_4_ = auVar113._20_4_ ^ auVar235._20_4_;
        auVar158._24_4_ = auVar113._24_4_ ^ auVar235._24_4_;
        auVar158._28_4_ = auVar113._28_4_ ^ auVar235._28_4_;
        auVar113 = vorps_avx(auVar34,auVar158);
        auVar113 = vandps_avx(auVar148,auVar113);
      }
    }
    auVar358 = ZEXT3264(local_540);
    auVar318 = ZEXT3264(CONCAT428(fStack_a44 + fStack_844 + fStack_9a4,
                                  CONCAT424(fVar325,CONCAT420(fVar324,CONCAT416(fVar323,CONCAT412(
                                                  fVar322,CONCAT48(fVar321,CONCAT44(fVar320,fVar311)
                                                                  )))))));
    auVar235 = local_2a0 & auVar113;
    fVar419 = (float)local_aa0._0_4_;
    fVar426 = (float)local_aa0._4_4_;
    fVar265 = fStack_a98;
    fVar278 = fStack_a94;
    fVar279 = fStack_a90;
    fVar280 = fStack_a8c;
    fVar281 = fStack_a88;
    fVar283 = fStack_a84;
    if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar235 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar235 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar235 >> 0x7f,0) == '\0') &&
          (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar235 >> 0xbf,0) == '\0') &&
        (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar235[0x1f])
    {
      auVar425 = ZEXT3264(_local_a40);
    }
    else {
      local_690 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar136 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_8e0._0_4_));
      auVar136 = vshufps_avx(auVar136,auVar136,0);
      auVar254._16_16_ = auVar136;
      auVar254._0_16_ = auVar136;
      auVar148 = vminps_avx(auVar254,auVar423);
      fVar225 = auVar37._28_4_ + auVar371._28_4_;
      auVar186._0_4_ =
           (float)local_a60._0_4_ * fVar287 +
           (float)local_860._0_4_ * fVar368 + (float)local_9c0._0_4_ * fVar389;
      auVar186._4_4_ =
           (float)local_a60._4_4_ * fVar299 +
           (float)local_860._4_4_ * fVar374 + (float)local_9c0._4_4_ * fVar401;
      auVar186._8_4_ = fStack_a58 * fVar300 + fStack_858 * fVar376 + fStack_9b8 * fVar404;
      auVar186._12_4_ = fStack_a54 * fVar302 + fStack_854 * fVar379 + fStack_9b4 * fVar408;
      auVar186._16_4_ = fStack_a50 * fVar304 + fStack_850 * fVar381 + fStack_9b0 * fVar411;
      auVar186._20_4_ = fStack_a4c * fVar306 + fStack_84c * fVar383 + fStack_9ac * fVar414;
      auVar186._24_4_ = fStack_a48 * fVar308 + fStack_848 * fVar385 + fStack_9a8 * fVar417;
      auVar186._28_4_ = fVar225 + fVar386 + fVar225;
      auVar235 = vrcpps_avx(auVar186);
      fVar386 = auVar235._0_4_;
      fVar285 = auVar235._4_4_;
      auVar60._4_4_ = auVar186._4_4_ * fVar285;
      auVar60._0_4_ = auVar186._0_4_ * fVar386;
      fVar301 = auVar235._8_4_;
      auVar60._8_4_ = auVar186._8_4_ * fVar301;
      fVar303 = auVar235._12_4_;
      auVar60._12_4_ = auVar186._12_4_ * fVar303;
      fVar305 = auVar235._16_4_;
      auVar60._16_4_ = auVar186._16_4_ * fVar305;
      fVar307 = auVar235._20_4_;
      auVar60._20_4_ = auVar186._20_4_ * fVar307;
      fVar309 = auVar235._24_4_;
      auVar60._24_4_ = auVar186._24_4_ * fVar309;
      auVar60._28_4_ = fVar310;
      auVar316._8_4_ = 0x3f800000;
      auVar316._0_8_ = 0x3f8000003f800000;
      auVar316._12_4_ = 0x3f800000;
      auVar316._16_4_ = 0x3f800000;
      auVar316._20_4_ = 0x3f800000;
      auVar316._24_4_ = 0x3f800000;
      auVar316._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar316,auVar60);
      auVar294._8_4_ = 0x7fffffff;
      auVar294._0_8_ = 0x7fffffff7fffffff;
      auVar294._12_4_ = 0x7fffffff;
      auVar294._16_4_ = 0x7fffffff;
      auVar294._20_4_ = 0x7fffffff;
      auVar294._24_4_ = 0x7fffffff;
      auVar294._28_4_ = 0x7fffffff;
      auVar235 = vandps_avx(auVar186,auVar294);
      auVar396._8_4_ = 0x219392ef;
      auVar396._0_8_ = 0x219392ef219392ef;
      auVar396._12_4_ = 0x219392ef;
      auVar396._16_4_ = 0x219392ef;
      auVar396._20_4_ = 0x219392ef;
      auVar396._24_4_ = 0x219392ef;
      auVar396._28_4_ = 0x219392ef;
      auVar34 = vcmpps_avx(auVar235,auVar396,1);
      auVar61._4_4_ =
           (fVar285 + fVar285 * auVar37._4_4_) *
           -(fVar299 * fVar259 + fVar374 * fVar257 + fVar401 * fVar247);
      auVar61._0_4_ =
           (fVar386 + fVar386 * auVar37._0_4_) *
           -(fVar287 * fVar240 + fVar368 * fVar226 + fVar389 * fVar224);
      auVar61._8_4_ =
           (fVar301 + fVar301 * auVar37._8_4_) *
           -(fVar300 * fVar342 + fVar376 * fVar339 + fVar404 * fVar336);
      auVar61._12_4_ =
           (fVar303 + fVar303 * auVar37._12_4_) *
           -(fVar302 * fVar245 + fVar379 * fVar244 + fVar408 * fVar243);
      auVar61._16_4_ =
           (fVar305 + fVar305 * auVar37._16_4_) *
           -(fVar304 * fVar400 + fVar381 * fVar399 + fVar411 * fVar388);
      auVar61._20_4_ =
           (fVar307 + fVar307 * auVar37._20_4_) *
           -(fVar306 * fVar19 + fVar383 * fVar18 + fVar414 * fVar416);
      auVar61._24_4_ =
           (fVar309 + fVar309 * auVar37._24_4_) *
           -(fVar308 * fVar27 + fVar385 * fVar26 + fVar417 * fVar25);
      auVar61._28_4_ = -(auVar38._28_4_ + fVar225);
      auVar136 = ZEXT816(0) << 0x40;
      auVar235 = vcmpps_avx(auVar186,ZEXT1632(auVar136),1);
      auVar235 = vorps_avx(auVar34,auVar235);
      auVar331._8_4_ = 0xff800000;
      auVar331._0_8_ = 0xff800000ff800000;
      auVar331._12_4_ = 0xff800000;
      auVar331._16_4_ = 0xff800000;
      auVar331._20_4_ = 0xff800000;
      auVar331._24_4_ = 0xff800000;
      auVar331._28_4_ = 0xff800000;
      auVar235 = vblendvps_avx(auVar61,auVar331,auVar235);
      auVar37 = vcmpps_avx(auVar186,ZEXT1632(auVar136),6);
      auVar34 = vorps_avx(auVar34,auVar37);
      auVar363._8_4_ = 0x7f800000;
      auVar363._0_8_ = 0x7f8000007f800000;
      auVar363._12_4_ = 0x7f800000;
      auVar363._16_4_ = 0x7f800000;
      auVar363._20_4_ = 0x7f800000;
      auVar363._24_4_ = 0x7f800000;
      auVar363._28_4_ = 0x7f800000;
      auVar365 = ZEXT3264(auVar363);
      auVar34 = vblendvps_avx(auVar61,auVar363,auVar34);
      auVar37 = vmaxps_avx(local_2c0,local_c60);
      auVar37 = vmaxps_avx(auVar37,auVar235);
      auVar34 = vminps_avx(auVar148,auVar34);
      auVar148 = ZEXT1632(auVar136);
      auVar235 = vsubps_avx(auVar148,_local_a80);
      auVar33 = vsubps_avx(auVar148,auVar33);
      auVar62._4_4_ = auVar33._4_4_ * -fVar402;
      auVar62._0_4_ = auVar33._0_4_ * -fVar390;
      auVar62._8_4_ = auVar33._8_4_ * -fVar405;
      auVar62._12_4_ = auVar33._12_4_ * -fVar409;
      auVar62._16_4_ = auVar33._16_4_ * -fVar412;
      auVar62._20_4_ = auVar33._20_4_ * -fVar415;
      auVar62._24_4_ = auVar33._24_4_ * -fVar418;
      auVar62._28_4_ = auVar33._28_4_;
      auVar63._4_4_ = fVar258 * auVar235._4_4_;
      auVar63._0_4_ = fVar222 * auVar235._0_4_;
      auVar63._8_4_ = fVar326 * auVar235._8_4_;
      auVar63._12_4_ = fVar367 * auVar235._12_4_;
      auVar63._16_4_ = fVar384 * auVar235._16_4_;
      auVar63._20_4_ = fVar410 * auVar235._20_4_;
      auVar63._24_4_ = fVar23 * auVar235._24_4_;
      auVar63._28_4_ = auVar235._28_4_;
      auVar235 = vsubps_avx(auVar62,auVar63);
      auVar33 = vsubps_avx(auVar148,auVar332);
      auVar64._4_4_ = fVar260 * auVar33._4_4_;
      auVar64._0_4_ = fVar223 * auVar33._0_4_;
      auVar64._8_4_ = fVar333 * auVar33._8_4_;
      auVar64._12_4_ = fVar373 * auVar33._12_4_;
      auVar64._16_4_ = fVar387 * auVar33._16_4_;
      auVar64._20_4_ = fVar413 * auVar33._20_4_;
      uVar7 = auVar33._28_4_;
      auVar64._24_4_ = fVar24 * auVar33._24_4_;
      auVar64._28_4_ = uVar7;
      auVar332 = vsubps_avx(auVar235,auVar64);
      auVar65._4_4_ = -fVar402 * (float)local_9c0._4_4_;
      auVar65._0_4_ = -fVar390 * (float)local_9c0._0_4_;
      auVar65._8_4_ = -fVar405 * fStack_9b8;
      auVar65._12_4_ = -fVar409 * fStack_9b4;
      auVar65._16_4_ = -fVar412 * fStack_9b0;
      auVar65._20_4_ = -fVar415 * fStack_9ac;
      auVar65._24_4_ = -fVar418 * fStack_9a8;
      auVar65._28_4_ = uVar91 ^ 0x80000000;
      auVar66._4_4_ = (float)local_860._4_4_ * fVar258;
      auVar66._0_4_ = (float)local_860._0_4_ * fVar222;
      auVar66._8_4_ = fStack_858 * fVar326;
      auVar66._12_4_ = fStack_854 * fVar367;
      auVar66._16_4_ = fStack_850 * fVar384;
      auVar66._20_4_ = fStack_84c * fVar410;
      auVar66._24_4_ = fStack_848 * fVar23;
      auVar66._28_4_ = uVar7;
      auVar358 = ZEXT3264(auVar316);
      auVar235 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = fVar260 * (float)local_a60._4_4_;
      auVar67._0_4_ = fVar223 * (float)local_a60._0_4_;
      auVar67._8_4_ = fVar333 * fStack_a58;
      auVar67._12_4_ = fVar373 * fStack_a54;
      auVar67._16_4_ = fVar387 * fStack_a50;
      auVar67._20_4_ = fVar413 * fStack_a4c;
      auVar67._24_4_ = fVar24 * fStack_a48;
      auVar67._28_4_ = uVar7;
      auVar371 = vsubps_avx(auVar235,auVar67);
      auVar235 = vrcpps_avx(auVar371);
      fVar222 = auVar235._0_4_;
      fVar223 = auVar235._4_4_;
      auVar68._4_4_ = auVar371._4_4_ * fVar223;
      auVar68._0_4_ = auVar371._0_4_ * fVar222;
      fVar224 = auVar235._8_4_;
      auVar68._8_4_ = auVar371._8_4_ * fVar224;
      fVar226 = auVar235._12_4_;
      auVar68._12_4_ = auVar371._12_4_ * fVar226;
      fVar240 = auVar235._16_4_;
      auVar68._16_4_ = auVar371._16_4_ * fVar240;
      fVar258 = auVar235._20_4_;
      auVar68._20_4_ = auVar371._20_4_ * fVar258;
      fVar260 = auVar235._24_4_;
      auVar68._24_4_ = auVar371._24_4_ * fVar260;
      auVar68._28_4_ = fStack_a44;
      auVar38 = vsubps_avx(auVar316,auVar68);
      auVar273._8_4_ = 0x7fffffff;
      auVar273._0_8_ = 0x7fffffff7fffffff;
      auVar273._12_4_ = 0x7fffffff;
      auVar273._16_4_ = 0x7fffffff;
      auVar273._20_4_ = 0x7fffffff;
      auVar273._24_4_ = 0x7fffffff;
      auVar273._28_4_ = 0x7fffffff;
      auVar235 = vandps_avx(auVar371,auVar273);
      auVar317._8_4_ = 0x219392ef;
      auVar317._0_8_ = 0x219392ef219392ef;
      auVar317._12_4_ = 0x219392ef;
      auVar317._16_4_ = 0x219392ef;
      auVar317._20_4_ = 0x219392ef;
      auVar317._24_4_ = 0x219392ef;
      auVar317._28_4_ = 0x219392ef;
      auVar318 = ZEXT3264(auVar317);
      auVar33 = vcmpps_avx(auVar235,auVar317,1);
      auVar69._4_4_ = (fVar223 + fVar223 * auVar38._4_4_) * -auVar332._4_4_;
      auVar69._0_4_ = (fVar222 + fVar222 * auVar38._0_4_) * -auVar332._0_4_;
      auVar69._8_4_ = (fVar224 + fVar224 * auVar38._8_4_) * -auVar332._8_4_;
      auVar69._12_4_ = (fVar226 + fVar226 * auVar38._12_4_) * -auVar332._12_4_;
      auVar69._16_4_ = (fVar240 + fVar240 * auVar38._16_4_) * -auVar332._16_4_;
      auVar69._20_4_ = (fVar258 + fVar258 * auVar38._20_4_) * -auVar332._20_4_;
      auVar69._24_4_ = (fVar260 + fVar260 * auVar38._24_4_) * -auVar332._24_4_;
      auVar69._28_4_ = auVar332._28_4_ ^ 0x80000000;
      auVar235 = vcmpps_avx(auVar371,auVar148,1);
      auVar235 = vorps_avx(auVar33,auVar235);
      auVar235 = vblendvps_avx(auVar69,auVar331,auVar235);
      auVar330 = ZEXT1228(ZEXT812(0)) << 0x20;
      _local_7a0 = vmaxps_avx(auVar37,auVar235);
      auVar332 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar235 = vcmpps_avx(auVar371,auVar332,6);
      auVar235 = vorps_avx(auVar33,auVar235);
      auVar235 = vblendvps_avx(auVar69,auVar363,auVar235);
      auVar113 = vandps_avx(local_2a0,auVar113);
      local_340 = vminps_avx(auVar34,auVar235);
      auVar235 = vcmpps_avx(_local_7a0,local_340,2);
      auVar33 = auVar113 & auVar235;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0x7f,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0xbf,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar33[0x1f] < '\0') {
        auVar33 = vminps_avx(local_840,auVar115);
        auVar32 = vminps_avx(auVar32,auVar35);
        auVar33 = vminps_avx(auVar33,auVar32);
        auVar114 = vsubps_avx(auVar33,auVar114);
        auVar113 = vandps_avx(auVar235,auVar113);
        auVar235 = vminps_avx(_local_940,auVar316);
        auVar235 = vmaxps_avx(auVar235,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar101 + fVar129 * (auVar235._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar125 + fVar159 * (auVar235._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar126 + fVar162 * (auVar235._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar127 + fVar165 * (auVar235._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar101 + fVar129 * (auVar235._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar125 + fVar159 * (auVar235._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar126 + fVar162 * (auVar235._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar127 + auVar235._28_4_ + 7.0;
        auVar89._4_4_ = fStack_2dc;
        auVar89._0_4_ = local_2e0;
        auVar89._8_4_ = fStack_2d8;
        auVar89._12_4_ = fStack_2d4;
        auVar89._16_4_ = fStack_2d0;
        auVar89._20_4_ = fStack_2cc;
        auVar89._24_4_ = fStack_2c8;
        auVar89._28_4_ = fStack_2c4;
        auVar235 = vminps_avx(auVar89,auVar316);
        auVar235 = vmaxps_avx(auVar235,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar101 + fVar129 * (auVar235._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar125 + fVar159 * (auVar235._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar126 + fVar162 * (auVar235._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar127 + fVar165 * (auVar235._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar101 + fVar129 * (auVar235._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar125 + fVar159 * (auVar235._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar126 + fVar162 * (auVar235._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar127 + auVar235._28_4_ + 7.0;
        auVar70._4_4_ = auVar114._4_4_ * 0.99999976;
        auVar70._0_4_ = auVar114._0_4_ * 0.99999976;
        auVar70._8_4_ = auVar114._8_4_ * 0.99999976;
        auVar70._12_4_ = auVar114._12_4_ * 0.99999976;
        auVar70._16_4_ = auVar114._16_4_ * 0.99999976;
        auVar70._20_4_ = auVar114._20_4_ * 0.99999976;
        auVar70._24_4_ = auVar114._24_4_ * 0.99999976;
        auVar70._28_4_ = 0x3f7ffffc;
        auVar235 = vmaxps_avx(auVar332,auVar70);
        auVar71._4_4_ = auVar235._4_4_ * auVar235._4_4_;
        auVar71._0_4_ = auVar235._0_4_ * auVar235._0_4_;
        auVar71._8_4_ = auVar235._8_4_ * auVar235._8_4_;
        auVar71._12_4_ = auVar235._12_4_ * auVar235._12_4_;
        auVar71._16_4_ = auVar235._16_4_ * auVar235._16_4_;
        auVar71._20_4_ = auVar235._20_4_ * auVar235._20_4_;
        auVar71._24_4_ = auVar235._24_4_ * auVar235._24_4_;
        auVar71._28_4_ = auVar235._28_4_;
        auVar114 = vsubps_avx(auVar39,auVar71);
        auVar72._4_4_ = auVar114._4_4_ * fVar164 * 4.0;
        auVar72._0_4_ = auVar114._0_4_ * fVar161 * 4.0;
        auVar72._8_4_ = auVar114._8_4_ * fVar166 * 4.0;
        auVar72._12_4_ = auVar114._12_4_ * fVar167 * 4.0;
        auVar72._16_4_ = auVar114._16_4_ * fVar168 * 4.0;
        auVar72._20_4_ = auVar114._20_4_ * fVar169 * 4.0;
        auVar72._24_4_ = auVar114._24_4_ * fVar351 * 4.0;
        auVar72._28_4_ = auVar235._28_4_;
        auVar364 = vsubps_avx(auVar55,auVar72);
        local_900 = vcmpps_avx(auVar364,ZEXT832(0) << 0x20,5);
        auVar235 = local_900;
        if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_900 >> 0x7f,0) == '\0') &&
              (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_900 >> 0xbf,0) == '\0') &&
            (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_900[0x1f]) {
          _local_8a0 = ZEXT832(0) << 0x20;
          _local_8c0 = ZEXT832(0) << 0x20;
          auVar216 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar234 = ZEXT828(0) << 0x20;
          auVar274._8_4_ = 0x7f800000;
          auVar274._0_8_ = 0x7f8000007f800000;
          auVar274._12_4_ = 0x7f800000;
          auVar274._16_4_ = 0x7f800000;
          auVar274._20_4_ = 0x7f800000;
          auVar274._24_4_ = 0x7f800000;
          auVar274._28_4_ = 0x7f800000;
          auVar295._8_4_ = 0xff800000;
          auVar295._0_8_ = 0xff800000ff800000;
          auVar295._12_4_ = 0xff800000;
          auVar295._16_4_ = 0xff800000;
          auVar295._20_4_ = 0xff800000;
          auVar295._24_4_ = 0xff800000;
          auVar295._28_4_ = 0xff800000;
          local_900 = auVar42;
          _local_880 = _local_8a0;
        }
        else {
          auVar32 = vsqrtps_avx(auVar364);
          auVar219._0_4_ = fVar161 + fVar161;
          auVar219._4_4_ = fVar164 + fVar164;
          auVar219._8_4_ = fVar166 + fVar166;
          auVar219._12_4_ = fVar167 + fVar167;
          auVar219._16_4_ = fVar168 + fVar168;
          auVar219._20_4_ = fVar169 + fVar169;
          auVar219._24_4_ = fVar351 + fVar351;
          auVar219._28_4_ = fVar130 + fVar130;
          auVar33 = vrcpps_avx(auVar219);
          fVar130 = auVar33._0_4_;
          fVar222 = auVar33._4_4_;
          auVar73._4_4_ = auVar219._4_4_ * fVar222;
          auVar73._0_4_ = auVar219._0_4_ * fVar130;
          fVar223 = auVar33._8_4_;
          auVar73._8_4_ = auVar219._8_4_ * fVar223;
          fVar224 = auVar33._12_4_;
          auVar73._12_4_ = auVar219._12_4_ * fVar224;
          fVar226 = auVar33._16_4_;
          auVar73._16_4_ = auVar219._16_4_ * fVar226;
          fVar240 = auVar33._20_4_;
          auVar73._20_4_ = auVar219._20_4_ * fVar240;
          fVar258 = auVar33._24_4_;
          auVar73._24_4_ = auVar219._24_4_ * fVar258;
          auVar73._28_4_ = auVar219._28_4_;
          auVar332 = vsubps_avx(auVar316,auVar73);
          fVar130 = fVar130 + fVar130 * auVar332._0_4_;
          fVar222 = fVar222 + fVar222 * auVar332._4_4_;
          fVar223 = fVar223 + fVar223 * auVar332._8_4_;
          fVar224 = fVar224 + fVar224 * auVar332._12_4_;
          fVar226 = fVar226 + fVar226 * auVar332._16_4_;
          fVar240 = fVar240 + fVar240 * auVar332._20_4_;
          fVar258 = fVar258 + fVar258 * auVar332._24_4_;
          fVar260 = auVar33._28_4_ + auVar332._28_4_;
          auVar236._0_8_ = auVar422._0_8_ ^ 0x8000000080000000;
          auVar236._8_4_ = -auVar422._8_4_;
          auVar236._12_4_ = -auVar422._12_4_;
          auVar236._16_4_ = -auVar422._16_4_;
          auVar236._20_4_ = -auVar422._20_4_;
          auVar236._24_4_ = -auVar422._24_4_;
          auVar236._28_4_ = -auVar422._28_4_;
          auVar33 = vsubps_avx(auVar236,auVar32);
          fVar342 = auVar33._0_4_ * fVar130;
          fVar367 = auVar33._4_4_ * fVar222;
          auVar74._4_4_ = fVar367;
          auVar74._0_4_ = fVar342;
          fVar373 = auVar33._8_4_ * fVar223;
          auVar74._8_4_ = fVar373;
          fVar243 = auVar33._12_4_ * fVar224;
          auVar74._12_4_ = fVar243;
          fVar244 = auVar33._16_4_ * fVar226;
          auVar74._16_4_ = fVar244;
          fVar245 = auVar33._20_4_ * fVar240;
          auVar74._20_4_ = fVar245;
          fVar384 = auVar33._24_4_ * fVar258;
          auVar74._24_4_ = fVar384;
          auVar74._28_4_ = 0x3f800000;
          auVar32 = vsubps_avx(auVar32,auVar422);
          fVar130 = auVar32._0_4_ * fVar130;
          fVar222 = auVar32._4_4_ * fVar222;
          auVar75._4_4_ = fVar222;
          auVar75._0_4_ = fVar130;
          fVar223 = auVar32._8_4_ * fVar223;
          auVar75._8_4_ = fVar223;
          fVar224 = auVar32._12_4_ * fVar224;
          auVar75._12_4_ = fVar224;
          fVar226 = auVar32._16_4_ * fVar226;
          auVar75._16_4_ = fVar226;
          fVar240 = auVar32._20_4_ * fVar240;
          auVar75._20_4_ = fVar240;
          fVar258 = auVar32._24_4_ * fVar258;
          auVar75._24_4_ = fVar258;
          auVar75._28_4_ = fVar377;
          fVar247 = fVar241 * (fVar342 * fVar311 + local_540._0_4_);
          fVar257 = fVar261 * (fVar367 * fVar320 + local_540._4_4_);
          fVar259 = fVar345 * (fVar373 * fVar321 + local_540._8_4_);
          fVar326 = fVar375 * (fVar243 * fVar322 + local_540._12_4_);
          fVar333 = fVar282 * (fVar244 * fVar323 + local_540._16_4_);
          fVar336 = fVar284 * (fVar245 * fVar324 + local_540._20_4_);
          fVar339 = fVar286 * (fVar384 * fVar325 + local_540._24_4_);
          local_760._28_4_ = auVar36._28_4_;
          auVar149._0_4_ = fVar327 + fVar202 * fVar247;
          auVar149._4_4_ = fVar334 + fVar256 * fVar257;
          auVar149._8_4_ = fVar337 + fVar264 * fVar259;
          auVar149._12_4_ = fVar340 + fVar366 * fVar326;
          auVar149._16_4_ = fVar343 + fVar382 * fVar333;
          auVar149._20_4_ = fVar346 + fVar407 * fVar336;
          auVar149._24_4_ = fVar349 + fVar22 * fVar339;
          auVar149._28_4_ = fVar352 + auVar32._28_4_ + local_540._28_4_;
          auVar76._4_4_ = (float)local_a60._4_4_ * fVar367;
          auVar76._0_4_ = (float)local_a60._0_4_ * fVar342;
          auVar76._8_4_ = fStack_a58 * fVar373;
          auVar76._12_4_ = fStack_a54 * fVar243;
          auVar76._16_4_ = fStack_a50 * fVar244;
          auVar76._20_4_ = fStack_a4c * fVar245;
          auVar76._24_4_ = fStack_a48 * fVar384;
          auVar76._28_4_ = fVar260;
          _local_a80 = vsubps_avx(auVar76,auVar149);
          auVar220._0_4_ = fVar328 + fVar247 * fVar160;
          auVar220._4_4_ = fVar335 + fVar257 * fVar242;
          auVar220._8_4_ = fVar338 + fVar259 * fVar262;
          auVar220._12_4_ = fVar341 + fVar326 * fVar348;
          auVar220._16_4_ = fVar344 + fVar333 * fVar378;
          auVar220._20_4_ = fVar347 + fVar336 * fVar403;
          auVar220._24_4_ = fVar350 + fVar339 * fVar20;
          auVar220._28_4_ = fVar353 + fVar260;
          auVar275._0_4_ = (float)local_860._0_4_ * fVar342;
          auVar275._4_4_ = (float)local_860._4_4_ * fVar367;
          auVar275._8_4_ = fStack_858 * fVar373;
          auVar275._12_4_ = fStack_854 * fVar243;
          auVar275._16_4_ = fStack_850 * fVar244;
          auVar275._20_4_ = fStack_84c * fVar245;
          auVar275._24_4_ = fStack_848 * fVar384;
          auVar275._28_4_ = 0;
          auVar332 = vsubps_avx(auVar275,auVar220);
          auVar237._0_4_ = fVar170 + fVar163 * fVar247;
          auVar237._4_4_ = fVar195 + fVar246 * fVar257;
          auVar237._8_4_ = fVar196 + fVar263 * fVar259;
          auVar237._12_4_ = fVar197 + fVar359 * fVar326;
          auVar237._16_4_ = fVar198 + fVar380 * fVar333;
          auVar237._20_4_ = fVar199 + fVar406 * fVar336;
          auVar237._24_4_ = fVar200 + fVar21 * fVar339;
          auVar237._28_4_ = fVar201 + auVar33._28_4_;
          auVar77._4_4_ = fVar367 * (float)local_9c0._4_4_;
          auVar77._0_4_ = fVar342 * (float)local_9c0._0_4_;
          auVar77._8_4_ = fVar373 * fStack_9b8;
          auVar77._12_4_ = fVar243 * fStack_9b4;
          auVar77._16_4_ = fVar244 * fStack_9b0;
          auVar77._20_4_ = fVar245 * fStack_9ac;
          auVar77._24_4_ = fVar384 * fStack_9a8;
          auVar77._28_4_ = 0;
          auVar33 = vsubps_avx(auVar77,auVar237);
          auVar234 = auVar33._0_28_;
          fVar241 = fVar241 * (fVar130 * fVar311 + local_540._0_4_);
          fVar261 = fVar261 * (fVar222 * fVar320 + local_540._4_4_);
          fVar345 = fVar345 * (fVar223 * fVar321 + local_540._8_4_);
          fVar375 = fVar375 * (fVar224 * fVar322 + local_540._12_4_);
          fVar282 = fVar282 * (fVar226 * fVar323 + local_540._16_4_);
          fVar284 = fVar284 * (fVar240 * fVar324 + local_540._20_4_);
          fVar286 = fVar286 * (fVar258 * fVar325 + local_540._24_4_);
          auVar296._0_4_ = fVar327 + fVar202 * fVar241;
          auVar296._4_4_ = fVar334 + fVar256 * fVar261;
          auVar296._8_4_ = fVar337 + fVar264 * fVar345;
          auVar296._12_4_ = fVar340 + fVar366 * fVar375;
          auVar296._16_4_ = fVar343 + fVar382 * fVar282;
          auVar296._20_4_ = fVar346 + fVar407 * fVar284;
          auVar296._24_4_ = fVar349 + fVar22 * fVar286;
          auVar296._28_4_ = fVar352 + (float)local_760._28_4_;
          auVar78._4_4_ = (float)local_a60._4_4_ * fVar222;
          auVar78._0_4_ = (float)local_a60._0_4_ * fVar130;
          auVar78._8_4_ = fStack_a58 * fVar223;
          auVar78._12_4_ = fStack_a54 * fVar224;
          auVar78._16_4_ = fStack_a50 * fVar226;
          auVar78._20_4_ = fStack_a4c * fVar240;
          auVar78._24_4_ = fStack_a48 * fVar258;
          auVar78._28_4_ = fStack_a44;
          _local_880 = vsubps_avx(auVar78,auVar296);
          auVar297._0_4_ = fVar328 + fVar241 * fVar160;
          auVar297._4_4_ = fVar335 + fVar261 * fVar242;
          auVar297._8_4_ = fVar338 + fVar345 * fVar262;
          auVar297._12_4_ = fVar341 + fVar375 * fVar348;
          auVar297._16_4_ = fVar344 + fVar282 * fVar378;
          auVar297._20_4_ = fVar347 + fVar284 * fVar403;
          auVar297._24_4_ = fVar350 + fVar286 * fVar20;
          auVar297._28_4_ = fVar353 + local_880._28_4_;
          auVar79._4_4_ = (float)local_860._4_4_ * fVar222;
          auVar79._0_4_ = (float)local_860._0_4_ * fVar130;
          auVar79._8_4_ = fStack_858 * fVar223;
          auVar79._12_4_ = fStack_854 * fVar224;
          auVar79._16_4_ = fStack_850 * fVar226;
          auVar79._20_4_ = fStack_84c * fVar240;
          auVar79._24_4_ = fStack_848 * fVar258;
          auVar79._28_4_ = fStack_a44;
          _local_8a0 = vsubps_avx(auVar79,auVar297);
          auVar276._0_4_ = fVar170 + fVar163 * fVar241;
          auVar276._4_4_ = fVar195 + fVar246 * fVar261;
          auVar276._8_4_ = fVar196 + fVar263 * fVar345;
          auVar276._12_4_ = fVar197 + fVar359 * fVar375;
          auVar276._16_4_ = fVar198 + fVar380 * fVar282;
          auVar276._20_4_ = fVar199 + fVar406 * fVar284;
          auVar276._24_4_ = fVar200 + fVar21 * fVar286;
          auVar276._28_4_ = fVar201 + local_540._28_4_ + 0.0;
          auVar80._4_4_ = fVar222 * (float)local_9c0._4_4_;
          auVar80._0_4_ = fVar130 * (float)local_9c0._0_4_;
          auVar80._8_4_ = fVar223 * fStack_9b8;
          auVar80._12_4_ = fVar224 * fStack_9b4;
          auVar80._16_4_ = fVar226 * fStack_9b0;
          auVar80._20_4_ = fVar240 * fStack_9ac;
          auVar80._24_4_ = fVar258 * fStack_9a8;
          auVar80._28_4_ = local_8a0._28_4_;
          _local_8c0 = vsubps_avx(auVar80,auVar276);
          auVar32 = vcmpps_avx(auVar364,_DAT_01faff00,5);
          auVar277._8_4_ = 0x7f800000;
          auVar277._0_8_ = 0x7f8000007f800000;
          auVar277._12_4_ = 0x7f800000;
          auVar277._16_4_ = 0x7f800000;
          auVar277._20_4_ = 0x7f800000;
          auVar277._24_4_ = 0x7f800000;
          auVar277._28_4_ = 0x7f800000;
          auVar274 = vblendvps_avx(auVar277,auVar74,auVar32);
          auVar356._8_4_ = 0x7fffffff;
          auVar356._0_8_ = 0x7fffffff7fffffff;
          auVar356._12_4_ = 0x7fffffff;
          auVar356._16_4_ = 0x7fffffff;
          auVar356._20_4_ = 0x7fffffff;
          auVar356._24_4_ = 0x7fffffff;
          auVar356._28_4_ = 0x7fffffff;
          auVar33 = vandps_avx(auVar356,local_320);
          auVar33 = vmaxps_avx(local_4c0,auVar33);
          auVar364._8_4_ = 0x36000000;
          auVar364._0_8_ = 0x3600000036000000;
          auVar364._12_4_ = 0x36000000;
          auVar364._16_4_ = 0x36000000;
          auVar364._20_4_ = 0x36000000;
          auVar364._24_4_ = 0x36000000;
          auVar364._28_4_ = 0x36000000;
          auVar81._4_4_ = auVar33._4_4_ * 1.9073486e-06;
          auVar81._0_4_ = auVar33._0_4_ * 1.9073486e-06;
          auVar81._8_4_ = auVar33._8_4_ * 1.9073486e-06;
          auVar81._12_4_ = auVar33._12_4_ * 1.9073486e-06;
          auVar81._16_4_ = auVar33._16_4_ * 1.9073486e-06;
          auVar81._20_4_ = auVar33._20_4_ * 1.9073486e-06;
          auVar81._24_4_ = auVar33._24_4_ * 1.9073486e-06;
          auVar81._28_4_ = auVar33._28_4_;
          auVar33 = vandps_avx(auVar356,local_520);
          auVar33 = vcmpps_avx(auVar33,auVar81,1);
          auVar298._8_4_ = 0xff800000;
          auVar298._0_8_ = 0xff800000ff800000;
          auVar298._12_4_ = 0xff800000;
          auVar298._16_4_ = 0xff800000;
          auVar298._20_4_ = 0xff800000;
          auVar298._24_4_ = 0xff800000;
          auVar298._28_4_ = 0xff800000;
          auVar295 = vblendvps_avx(auVar298,auVar75,auVar32);
          auVar35 = auVar32 & auVar33;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0x7f,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0xbf,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar35[0x1f] < '\0') {
            auVar235 = vandps_avx(auVar33,auVar32);
            auVar136 = vpackssdw_avx(auVar235._0_16_,auVar235._16_16_);
            auVar35 = vcmpps_avx(auVar114,ZEXT832(0) << 0x20,2);
            auVar424._8_4_ = 0xff800000;
            auVar424._0_8_ = 0xff800000ff800000;
            auVar424._12_4_ = 0xff800000;
            auVar424._16_4_ = 0xff800000;
            auVar424._20_4_ = 0xff800000;
            auVar424._24_4_ = 0xff800000;
            auVar424._28_4_ = 0xff800000;
            auVar398._8_4_ = 0x7f800000;
            auVar398._0_8_ = 0x7f8000007f800000;
            auVar398._12_4_ = 0x7f800000;
            auVar398._16_4_ = 0x7f800000;
            auVar398._20_4_ = 0x7f800000;
            auVar398._24_4_ = 0x7f800000;
            auVar398._28_4_ = 0x7f800000;
            auVar114 = vblendvps_avx(auVar398,auVar424,auVar35);
            auVar143 = vpmovsxwd_avx(auVar136);
            auVar136 = vpunpckhwd_avx(auVar136,auVar136);
            auVar357._16_16_ = auVar136;
            auVar357._0_16_ = auVar143;
            auVar274 = vblendvps_avx(auVar274,auVar114,auVar357);
            auVar364 = vblendvps_avx(auVar424,auVar398,auVar35);
            auVar295 = vblendvps_avx(auVar295,auVar364,auVar357);
            auVar33 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar124._0_4_ = auVar33._0_4_ ^ auVar235._0_4_;
            auVar124._4_4_ = auVar33._4_4_ ^ auVar235._4_4_;
            auVar124._8_4_ = auVar33._8_4_ ^ auVar235._8_4_;
            auVar124._12_4_ = auVar33._12_4_ ^ auVar235._12_4_;
            auVar124._16_4_ = auVar33._16_4_ ^ auVar235._16_4_;
            auVar124._20_4_ = auVar33._20_4_ ^ auVar235._20_4_;
            auVar124._24_4_ = auVar33._24_4_ ^ auVar235._24_4_;
            auVar124._28_4_ = auVar33._28_4_ ^ auVar235._28_4_;
            auVar235 = vorps_avx(auVar35,auVar124);
            auVar235 = vandps_avx(auVar32,auVar235);
          }
          auVar358 = ZEXT3264(auVar33);
          auVar216 = local_a80._0_28_;
          auVar330 = auVar332._0_28_;
        }
        auVar365 = ZEXT3264(auVar364);
        _local_3a0 = _local_7a0;
        local_380 = vminps_avx(local_340,auVar274);
        _local_7c0 = vmaxps_avx(_local_7a0,auVar295);
        local_360 = _local_7c0;
        auVar114 = vcmpps_avx(_local_7a0,local_380,2);
        local_700 = vandps_avx(auVar114,auVar113);
        auVar114 = vcmpps_avx(_local_7c0,local_340,2);
        local_7e0 = vandps_avx(auVar114,auVar113);
        auVar113 = vorps_avx(local_7e0,local_700);
        auVar318 = ZEXT1664(local_690);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          _local_940 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_740._0_4_ = auVar235._0_4_ ^ local_940._0_4_;
          local_740._4_4_ = auVar235._4_4_ ^ local_940._4_4_;
          local_740._8_4_ = auVar235._8_4_ ^ local_940._8_4_;
          local_740._12_4_ = auVar235._12_4_ ^ local_940._12_4_;
          local_740._16_4_ = auVar235._16_4_ ^ local_940._16_4_;
          local_740._20_4_ = auVar235._20_4_ ^ local_940._20_4_;
          local_740._24_4_ = auVar235._24_4_ ^ local_940._24_4_;
          local_740._28_4_ = (uint)auVar235._28_4_ ^ (uint)local_940._28_4_;
          auVar118._0_4_ =
               auVar216._0_4_ * (float)local_a60._0_4_ +
               auVar330._0_4_ * (float)local_860._0_4_ + (float)local_9c0._0_4_ * auVar234._0_4_;
          auVar118._4_4_ =
               auVar216._4_4_ * (float)local_a60._4_4_ +
               auVar330._4_4_ * (float)local_860._4_4_ + (float)local_9c0._4_4_ * auVar234._4_4_;
          auVar118._8_4_ =
               auVar216._8_4_ * fStack_a58 +
               auVar330._8_4_ * fStack_858 + fStack_9b8 * auVar234._8_4_;
          auVar118._12_4_ =
               auVar216._12_4_ * fStack_a54 +
               auVar330._12_4_ * fStack_854 + fStack_9b4 * auVar234._12_4_;
          auVar118._16_4_ =
               auVar216._16_4_ * fStack_a50 +
               auVar330._16_4_ * fStack_850 + fStack_9b0 * auVar234._16_4_;
          auVar118._20_4_ =
               auVar216._20_4_ * fStack_a4c +
               auVar330._20_4_ * fStack_84c + fStack_9ac * auVar234._20_4_;
          auVar118._24_4_ =
               auVar216._24_4_ * fStack_a48 +
               auVar330._24_4_ * fStack_848 + fStack_9a8 * auVar234._24_4_;
          auVar118._28_4_ = auVar235._28_4_ + local_940._28_4_ + fStack_844;
          auVar151._8_4_ = 0x7fffffff;
          auVar151._0_8_ = 0x7fffffff7fffffff;
          auVar151._12_4_ = 0x7fffffff;
          auVar151._16_4_ = 0x7fffffff;
          auVar151._20_4_ = 0x7fffffff;
          auVar151._24_4_ = 0x7fffffff;
          auVar151._28_4_ = 0x7fffffff;
          auVar113 = vandps_avx(auVar118,auVar151);
          auVar152._8_4_ = 0x3e99999a;
          auVar152._0_8_ = 0x3e99999a3e99999a;
          auVar152._12_4_ = 0x3e99999a;
          auVar152._16_4_ = 0x3e99999a;
          auVar152._20_4_ = 0x3e99999a;
          auVar152._24_4_ = 0x3e99999a;
          auVar152._28_4_ = 0x3e99999a;
          auVar113 = vcmpps_avx(auVar113,auVar152,1);
          auVar113 = vorps_avx(auVar113,local_740);
          auVar153._8_4_ = 3;
          auVar153._0_8_ = 0x300000003;
          auVar153._12_4_ = 3;
          auVar153._16_4_ = 3;
          auVar153._20_4_ = 3;
          auVar153._24_4_ = 3;
          auVar153._28_4_ = 3;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar113 = vblendvps_avx(auVar187,auVar153,auVar113);
          local_760 = ZEXT432(local_cc4);
          local_780 = vpshufd_avx(ZEXT416(local_cc4),0);
          fVar130 = 0.0;
          auVar136 = vpcmpgtd_avx(auVar113._16_16_,local_780);
          auStack_770 = auVar422._16_16_;
          auVar143 = vpcmpgtd_avx(auVar113._0_16_,local_780);
          auVar154._16_16_ = auVar136;
          auVar154._0_16_ = auVar143;
          local_720 = vblendps_avx(ZEXT1632(auVar143),auVar154,0xf0);
          local_6c0 = vandnps_avx(local_720,local_700);
          auVar318 = ZEXT3264(local_6c0);
          auVar113 = local_700 & ~local_720;
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0x7f,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0xbf,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar113[0x1f]) {
            auVar136 = vshufps_avx(local_690,local_690,0);
            auVar119._16_16_ = auVar136;
            auVar119._0_16_ = auVar136;
            auVar330 = local_a60._0_28_;
            auVar425 = ZEXT3264(_local_a40);
            fVar160 = (float)local_9c0._0_4_;
            fVar202 = (float)local_9c0._4_4_;
            fVar223 = fStack_9b8;
            fVar224 = fStack_9b4;
            fVar226 = fStack_9b0;
            fVar240 = fStack_9ac;
            fVar241 = fStack_9a8;
          }
          else {
            local_920._4_4_ = (float)local_aa0._4_4_ + (float)local_7a0._4_4_;
            local_920._0_4_ = (float)local_aa0._0_4_ + (float)local_7a0._0_4_;
            fStack_918 = fStack_a98 + fStack_798;
            fStack_914 = fStack_a94 + fStack_794;
            fStack_910 = fStack_a90 + fStack_790;
            fStack_90c = fStack_a8c + fStack_78c;
            fStack_908 = fStack_a88 + fStack_788;
            fStack_904 = fStack_a84 + fStack_784;
            do {
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar113 = auVar318._0_32_;
              auVar235 = vblendvps_avx(auVar120,_local_7a0,auVar113);
              auVar114 = vshufps_avx(auVar235,auVar235,0xb1);
              auVar114 = vminps_avx(auVar235,auVar114);
              auVar33 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar33);
              auVar33 = vperm2f128_avx(auVar114,auVar114,1);
              auVar114 = vminps_avx(auVar114,auVar33);
              auVar235 = vcmpps_avx(auVar235,auVar114,0);
              auVar114 = auVar113 & auVar235;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar113 = vandps_avx(auVar235,auVar113);
              }
              uVar92 = vmovmskps_avx(auVar113);
              uVar91 = 0;
              if (uVar92 != 0) {
                for (; (uVar92 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
                }
              }
              uVar94 = (ulong)uVar91;
              *(undefined4 *)(local_6c0 + uVar94 * 4) = 0;
              fVar130 = local_1a0[uVar94];
              uVar91 = *(uint *)(local_3a0 + uVar94 * 4);
              fVar160 = auVar135._0_4_;
              if ((float)local_960._0_4_ < 0.0) {
                fVar160 = sqrtf((float)local_960._0_4_);
              }
              auVar143 = vminps_avx(_local_ab0,_local_ad0);
              auVar136 = vmaxps_avx(_local_ab0,_local_ad0);
              auVar109 = vminps_avx(_local_ac0,_local_ae0);
              auVar141 = vminps_avx(auVar143,auVar109);
              auVar143 = vmaxps_avx(_local_ac0,_local_ae0);
              auVar109 = vmaxps_avx(auVar136,auVar143);
              auVar206._8_4_ = 0x7fffffff;
              auVar206._0_8_ = 0x7fffffff7fffffff;
              auVar206._12_4_ = 0x7fffffff;
              auVar136 = vandps_avx(auVar141,auVar206);
              auVar143 = vandps_avx(auVar109,auVar206);
              auVar136 = vmaxps_avx(auVar136,auVar143);
              auVar143 = vmovshdup_avx(auVar136);
              auVar143 = vmaxss_avx(auVar143,auVar136);
              auVar136 = vshufpd_avx(auVar136,auVar136,1);
              auVar136 = vmaxss_avx(auVar136,auVar143);
              fVar163 = auVar136._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar160 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar109,auVar109,0xff);
              auVar136 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar130),0x10);
              auVar358 = ZEXT1664(auVar136);
              bVar100 = true;
              uVar94 = 0;
              do {
                auVar355 = auVar358._0_16_;
                auVar136 = vshufps_avx(auVar355,auVar355,0);
                auVar106._0_4_ = auVar136._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar106._4_4_ = auVar136._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar106._8_4_ = auVar136._8_4_ * fStack_948 + 0.0;
                auVar106._12_4_ = auVar136._12_4_ * fStack_944 + 0.0;
                auVar136 = vmovshdup_avx(auVar355);
                fVar223 = auVar136._0_4_;
                fVar202 = 1.0 - fVar223;
                fVar160 = fVar223 * 3.0;
                fVar130 = fVar160 + -5.0;
                auVar136 = ZEXT416((uint)(fVar223 * fVar223 * -fVar202 * 0.5));
                auVar136 = vshufps_avx(auVar136,auVar136,0);
                auVar143 = ZEXT416((uint)((fVar202 * fVar202 * (fVar202 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar109 = ZEXT416((uint)((fVar223 * fVar223 * fVar130 + 2.0) * 0.5));
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                auVar141 = ZEXT416((uint)(fVar202 * fVar202 * -fVar223 * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar174._0_4_ =
                     auVar141._0_4_ * (float)local_ab0._0_4_ +
                     auVar109._0_4_ * (float)local_ad0._0_4_ +
                     auVar143._0_4_ * (float)local_ac0._0_4_ +
                     auVar136._0_4_ * (float)local_ae0._0_4_;
                auVar174._4_4_ =
                     auVar141._4_4_ * (float)local_ab0._4_4_ +
                     auVar109._4_4_ * (float)local_ad0._4_4_ +
                     auVar143._4_4_ * (float)local_ac0._4_4_ +
                     auVar136._4_4_ * (float)local_ae0._4_4_;
                auVar174._8_4_ =
                     auVar141._8_4_ * fStack_aa8 +
                     auVar109._8_4_ * fStack_ac8 +
                     auVar143._8_4_ * fStack_ab8 + auVar136._8_4_ * fStack_ad8;
                auVar174._12_4_ =
                     auVar141._12_4_ * fStack_aa4 +
                     auVar109._12_4_ * fStack_ac4 +
                     auVar143._12_4_ * fStack_ab4 + auVar136._12_4_ * fStack_ad4;
                local_900._0_16_ = auVar174;
                auVar136 = vsubps_avx(auVar106,auVar174);
                _local_a80 = auVar136;
                auVar136 = vdpps_avx(auVar136,auVar136,0x7f);
                fVar222 = auVar136._0_4_;
                if (fVar222 < 0.0) {
                  local_980._0_4_ = fVar160;
                  local_9a0._0_4_ = fVar130;
                  local_820._0_4_ = fVar202 * -2.0;
                  fVar224 = sqrtf(fVar222);
                  fVar226 = (float)local_820._0_4_;
                  fVar240 = (float)local_980._0_4_;
                  fVar130 = (float)local_9a0._0_4_;
                }
                else {
                  auVar143 = vsqrtss_avx(auVar136,auVar136);
                  fVar224 = auVar143._0_4_;
                  fVar226 = fVar202 * -2.0;
                  fVar240 = fVar160;
                }
                auVar143 = ZEXT416((uint)((fVar223 * fVar223 + fVar223 * fVar226) * 0.5));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar109 = ZEXT416((uint)(((fVar202 + fVar202) * (fVar240 + 2.0) +
                                          fVar202 * fVar202 * -3.0) * 0.5));
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                auVar141 = ZEXT416((uint)((fVar130 * (fVar223 + fVar223) + fVar223 * fVar240) * 0.5)
                                  );
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar142 = ZEXT416((uint)((fVar223 * (fVar202 + fVar202) - fVar202 * fVar202) * 0.5)
                                  );
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar361._0_4_ =
                     (float)local_ab0._0_4_ * auVar142._0_4_ +
                     (float)local_ad0._0_4_ * auVar141._0_4_ +
                     (float)local_ae0._0_4_ * auVar143._0_4_ +
                     (float)local_ac0._0_4_ * auVar109._0_4_;
                auVar361._4_4_ =
                     (float)local_ab0._4_4_ * auVar142._4_4_ +
                     (float)local_ad0._4_4_ * auVar141._4_4_ +
                     (float)local_ae0._4_4_ * auVar143._4_4_ +
                     (float)local_ac0._4_4_ * auVar109._4_4_;
                auVar361._8_4_ =
                     fStack_aa8 * auVar142._8_4_ +
                     fStack_ac8 * auVar141._8_4_ +
                     fStack_ad8 * auVar143._8_4_ + fStack_ab8 * auVar109._8_4_;
                auVar361._12_4_ =
                     fStack_aa4 * auVar142._12_4_ +
                     fStack_ac4 * auVar141._12_4_ +
                     fStack_ad4 * auVar143._12_4_ + fStack_ab4 * auVar109._12_4_;
                auVar142 = vpermilps_avx(ZEXT416((uint)(fVar160 + -1.0)),0);
                auVar30 = vpermilps_avx(ZEXT416((uint)(fVar223 * -9.0 + 4.0)),0);
                auVar143 = ZEXT416((uint)(fVar223 * 9.0 + -5.0));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar109 = ZEXT416((uint)(fVar223 * -3.0 + 2.0));
                auVar141 = vshufps_avx(auVar109,auVar109,0);
                auVar109 = vdpps_avx(auVar361,auVar361,0x7f);
                auVar137._0_4_ =
                     (float)local_ab0._0_4_ * auVar141._0_4_ +
                     (float)local_ad0._0_4_ * auVar143._0_4_ +
                     (float)local_ac0._0_4_ * auVar30._0_4_ +
                     (float)local_ae0._0_4_ * auVar142._0_4_;
                auVar137._4_4_ =
                     (float)local_ab0._4_4_ * auVar141._4_4_ +
                     (float)local_ad0._4_4_ * auVar143._4_4_ +
                     (float)local_ac0._4_4_ * auVar30._4_4_ +
                     (float)local_ae0._4_4_ * auVar142._4_4_;
                auVar137._8_4_ =
                     fStack_aa8 * auVar141._8_4_ +
                     fStack_ac8 * auVar143._8_4_ +
                     fStack_ab8 * auVar30._8_4_ + fStack_ad8 * auVar142._8_4_;
                auVar137._12_4_ =
                     fStack_aa4 * auVar141._12_4_ +
                     fStack_ac4 * auVar143._12_4_ +
                     fStack_ab4 * auVar30._12_4_ + fStack_ad4 * auVar142._12_4_;
                auVar143 = vblendps_avx(auVar109,_DAT_01f7aa10,0xe);
                auVar141 = vrsqrtss_avx(auVar143,auVar143);
                fVar160 = auVar141._0_4_;
                fVar130 = auVar109._0_4_;
                auVar141 = vdpps_avx(auVar361,auVar137,0x7f);
                auVar142 = vshufps_avx(auVar109,auVar109,0);
                auVar138._0_4_ = auVar137._0_4_ * auVar142._0_4_;
                auVar138._4_4_ = auVar137._4_4_ * auVar142._4_4_;
                auVar138._8_4_ = auVar137._8_4_ * auVar142._8_4_;
                auVar138._12_4_ = auVar137._12_4_ * auVar142._12_4_;
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar230._0_4_ = auVar361._0_4_ * auVar141._0_4_;
                auVar230._4_4_ = auVar361._4_4_ * auVar141._4_4_;
                auVar230._8_4_ = auVar361._8_4_ * auVar141._8_4_;
                auVar230._12_4_ = auVar361._12_4_ * auVar141._12_4_;
                auVar30 = vsubps_avx(auVar138,auVar230);
                auVar141 = vrcpss_avx(auVar143,auVar143);
                auVar143 = vmaxss_avx(ZEXT416((uint)fVar163),
                                      ZEXT416((uint)(auVar358._0_4_ * (float)local_800._0_4_)));
                auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar130 * auVar141._0_4_)));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                uVar82 = CONCAT44(auVar361._4_4_,auVar361._0_4_);
                auVar250._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar250._8_4_ = -auVar361._8_4_;
                auVar250._12_4_ = -auVar361._12_4_;
                auVar142 = ZEXT416((uint)(fVar160 * 1.5 +
                                         fVar130 * -0.5 * fVar160 * fVar160 * fVar160));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar207._0_4_ = auVar142._0_4_ * auVar30._0_4_ * auVar141._0_4_;
                auVar207._4_4_ = auVar142._4_4_ * auVar30._4_4_ * auVar141._4_4_;
                auVar207._8_4_ = auVar142._8_4_ * auVar30._8_4_ * auVar141._8_4_;
                auVar207._12_4_ = auVar142._12_4_ * auVar30._12_4_ * auVar141._12_4_;
                auVar269._0_4_ = auVar361._0_4_ * auVar142._0_4_;
                auVar269._4_4_ = auVar361._4_4_ * auVar142._4_4_;
                auVar269._8_4_ = auVar361._8_4_ * auVar142._8_4_;
                auVar269._12_4_ = auVar361._12_4_ * auVar142._12_4_;
                if (fVar130 < 0.0) {
                  fVar130 = sqrtf(fVar130);
                }
                else {
                  auVar109 = vsqrtss_avx(auVar109,auVar109);
                  fVar130 = auVar109._0_4_;
                }
                auVar109 = vdpps_avx(_local_a80,auVar269,0x7f);
                fVar130 = (fVar163 / fVar130) * (fVar224 + 1.0) + fVar224 * fVar163 + auVar143._0_4_
                ;
                auVar141 = vdpps_avx(auVar250,auVar269,0x7f);
                auVar142 = vdpps_avx(_local_a80,auVar207,0x7f);
                auVar30 = vdpps_avx(_local_950,auVar269,0x7f);
                auVar31 = vdpps_avx(_local_a80,auVar250,0x7f);
                fVar160 = auVar141._0_4_ + auVar142._0_4_;
                fVar223 = auVar109._0_4_;
                auVar107._0_4_ = fVar223 * fVar223;
                auVar107._4_4_ = auVar109._4_4_ * auVar109._4_4_;
                auVar107._8_4_ = auVar109._8_4_ * auVar109._8_4_;
                auVar107._12_4_ = auVar109._12_4_ * auVar109._12_4_;
                auVar102 = vsubps_avx(auVar136,auVar107);
                auVar141 = vdpps_avx(_local_a80,_local_950,0x7f);
                fVar224 = auVar31._0_4_ - fVar223 * fVar160;
                auVar142 = vrsqrtss_avx(auVar102,auVar102);
                fVar226 = auVar102._0_4_;
                fVar202 = auVar142._0_4_;
                fVar202 = fVar202 * 1.5 + fVar226 * -0.5 * fVar202 * fVar202 * fVar202;
                if (fVar226 < 0.0) {
                  local_980._0_4_ = fVar224;
                  local_9a0._0_4_ = fVar202;
                  fVar226 = sqrtf(fVar226);
                  fVar202 = (float)local_9a0._0_4_;
                  fVar224 = (float)local_980._0_4_;
                }
                else {
                  auVar142 = vsqrtss_avx(auVar102,auVar102);
                  fVar226 = auVar142._0_4_;
                }
                auVar365 = ZEXT1664(auVar109);
                auVar31 = vpermilps_avx(local_900._0_16_,0xff);
                auVar102 = vshufps_avx(auVar361,auVar361,0xff);
                fVar224 = fVar224 * fVar202 - auVar102._0_4_;
                fVar202 = (auVar141._0_4_ - fVar223 * auVar30._0_4_) * fVar202;
                auVar231._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
                auVar231._8_4_ = auVar30._8_4_ ^ 0x80000000;
                auVar231._12_4_ = auVar30._12_4_ ^ 0x80000000;
                auVar251._0_4_ = -fVar224;
                auVar251._4_4_ = 0x80000000;
                auVar251._8_4_ = 0x80000000;
                auVar251._12_4_ = 0x80000000;
                auVar141 = vinsertps_avx(auVar251,ZEXT416((uint)fVar202),0x1c);
                auVar30 = vmovsldup_avx(ZEXT416((uint)(fVar160 * fVar202 - auVar30._0_4_ * fVar224))
                                       );
                auVar141 = vdivps_avx(auVar141,auVar30);
                auVar142 = vinsertps_avx(ZEXT416((uint)fVar160),auVar231,0x10);
                auVar142 = vdivps_avx(auVar142,auVar30);
                auVar30 = vmovsldup_avx(auVar109);
                auVar111 = ZEXT416((uint)(fVar226 - auVar31._0_4_));
                auVar31 = vmovsldup_avx(auVar111);
                auVar175._0_4_ = auVar30._0_4_ * auVar141._0_4_ + auVar31._0_4_ * auVar142._0_4_;
                auVar175._4_4_ = auVar30._4_4_ * auVar141._4_4_ + auVar31._4_4_ * auVar142._4_4_;
                auVar175._8_4_ = auVar30._8_4_ * auVar141._8_4_ + auVar31._8_4_ * auVar142._8_4_;
                auVar175._12_4_ =
                     auVar30._12_4_ * auVar141._12_4_ + auVar31._12_4_ * auVar142._12_4_;
                auVar141 = vsubps_avx(auVar355,auVar175);
                auVar358 = ZEXT1664(auVar141);
                auVar176._8_4_ = 0x7fffffff;
                auVar176._0_8_ = 0x7fffffff7fffffff;
                auVar176._12_4_ = 0x7fffffff;
                auVar109 = vandps_avx(auVar109,auVar176);
                auVar425 = ZEXT3264(_local_a40);
                auVar330 = local_a60._0_28_;
                fVar160 = (float)local_9c0._0_4_;
                fVar202 = (float)local_9c0._4_4_;
                fVar223 = fStack_9b8;
                fVar224 = fStack_9b4;
                fVar226 = fStack_9b0;
                fVar240 = fStack_9ac;
                fVar241 = fStack_9a8;
                fVar419 = (float)local_aa0._0_4_;
                fVar426 = (float)local_aa0._4_4_;
                fVar265 = fStack_a98;
                fVar278 = fStack_a94;
                fVar279 = fStack_a90;
                fVar280 = fStack_a8c;
                fVar281 = fStack_a88;
                fVar283 = fStack_a84;
                if (auVar109._0_4_ < fVar130) {
                  auVar208._8_4_ = 0x7fffffff;
                  auVar208._0_8_ = 0x7fffffff7fffffff;
                  auVar208._12_4_ = 0x7fffffff;
                  auVar109 = vandps_avx(auVar111,auVar208);
                  if (auVar109._0_4_ <
                      (float)local_840._0_4_ * 1.9073486e-06 + fVar130 + auVar143._0_4_) {
                    fVar130 = auVar141._0_4_ + (float)local_8e0._0_4_;
                    if (fVar130 < fVar128) {
                      bVar90 = 0;
                      goto LAB_00fa128f;
                    }
                    fVar163 = *(float *)(ray + k * 4 + 0x100);
                    auVar365 = ZEXT464((uint)fVar163);
                    if (fVar130 <= fVar163) {
                      auVar143 = vmovshdup_avx(auVar141);
                      bVar90 = 0;
                      if ((auVar143._0_4_ < 0.0) || (bVar90 = 0, 1.0 < auVar143._0_4_))
                      goto LAB_00fa128f;
                      auVar136 = vrsqrtss_avx(auVar136,auVar136);
                      fVar242 = auVar136._0_4_;
                      pGVar10 = (context->scene->geometries).items[local_9f8].ptr;
                      if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar90 = 0;
                        goto LAB_00fa128f;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar90 = 1, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00fa128f;
                      auVar136 = ZEXT416((uint)(fVar242 * 1.5 +
                                               fVar222 * -0.5 * fVar242 * fVar242 * fVar242));
                      auVar136 = vshufps_avx(auVar136,auVar136,0);
                      auVar177._0_4_ = auVar136._0_4_ * (float)local_a80._0_4_;
                      auVar177._4_4_ = auVar136._4_4_ * (float)local_a80._4_4_;
                      auVar177._8_4_ = auVar136._8_4_ * fStack_a78;
                      auVar177._12_4_ = auVar136._12_4_ * fStack_a74;
                      auVar139._0_4_ = auVar361._0_4_ + auVar102._0_4_ * auVar177._0_4_;
                      auVar139._4_4_ = auVar361._4_4_ + auVar102._4_4_ * auVar177._4_4_;
                      auVar139._8_4_ = auVar361._8_4_ + auVar102._8_4_ * auVar177._8_4_;
                      auVar139._12_4_ = auVar361._12_4_ + auVar102._12_4_ * auVar177._12_4_;
                      auVar136 = vshufps_avx(auVar177,auVar177,0xc9);
                      auVar143 = vshufps_avx(auVar361,auVar361,0xc9);
                      auVar178._0_4_ = auVar143._0_4_ * auVar177._0_4_;
                      auVar178._4_4_ = auVar143._4_4_ * auVar177._4_4_;
                      auVar178._8_4_ = auVar143._8_4_ * auVar177._8_4_;
                      auVar178._12_4_ = auVar143._12_4_ * auVar177._12_4_;
                      auVar209._0_4_ = auVar361._0_4_ * auVar136._0_4_;
                      auVar209._4_4_ = auVar361._4_4_ * auVar136._4_4_;
                      auVar209._8_4_ = auVar361._8_4_ * auVar136._8_4_;
                      auVar209._12_4_ = auVar361._12_4_ * auVar136._12_4_;
                      auVar109 = vsubps_avx(auVar209,auVar178);
                      auVar136 = vshufps_avx(auVar109,auVar109,0xc9);
                      auVar143 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar210._0_4_ = auVar143._0_4_ * auVar136._0_4_;
                      auVar210._4_4_ = auVar143._4_4_ * auVar136._4_4_;
                      auVar210._8_4_ = auVar143._8_4_ * auVar136._8_4_;
                      auVar210._12_4_ = auVar143._12_4_ * auVar136._12_4_;
                      auVar136 = vshufps_avx(auVar109,auVar109,0xd2);
                      auVar140._0_4_ = auVar139._0_4_ * auVar136._0_4_;
                      auVar140._4_4_ = auVar139._4_4_ * auVar136._4_4_;
                      auVar140._8_4_ = auVar139._8_4_ * auVar136._8_4_;
                      auVar140._12_4_ = auVar139._12_4_ * auVar136._12_4_;
                      auVar136 = vsubps_avx(auVar210,auVar140);
                      pRVar14 = context->user;
                      local_600 = vshufps_avx(auVar141,auVar141,0x55);
                      auStack_650 = vshufps_avx(auVar136,auVar136,0x55);
                      local_640 = vshufps_avx(auVar136,auVar136,0xaa);
                      local_620 = vshufps_avx(auVar136,auVar136,0);
                      local_660 = (RTCHitN  [16])auStack_650;
                      local_5e0 = ZEXT832(0) << 0x20;
                      local_5c0 = local_500._0_8_;
                      uStack_5b8 = local_500._8_8_;
                      uStack_5b0 = local_500._16_8_;
                      uStack_5a8 = local_500._24_8_;
                      local_5a0 = local_4e0._0_8_;
                      uStack_598 = local_4e0._8_8_;
                      uStack_590 = local_4e0._16_8_;
                      uStack_588 = local_4e0._24_8_;
                      *(undefined1 (*) [8])(local_a00 + 8) = local_940;
                      *(undefined8 *)(local_a00 + 10) = uStack_938;
                      *(undefined8 *)(local_a00 + 0xc) = uStack_930;
                      *(undefined8 *)(local_a00 + 0xe) = uStack_928;
                      *(undefined1 (*) [8])local_a00 = local_940;
                      *(undefined8 *)(local_a00 + 2) = uStack_938;
                      *(undefined8 *)(local_a00 + 4) = uStack_930;
                      *(undefined8 *)(local_a00 + 6) = uStack_928;
                      local_580 = pRVar14->instID[0];
                      local_560 = pRVar14->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar130;
                      local_b00 = *local_a08;
                      local_af0 = *local_a10;
                      local_9f0.valid = (int *)local_b00;
                      local_9f0.geometryUserPtr = pGVar10->userPtr;
                      local_9f0.context = context->user;
                      local_9f0.hit = local_660;
                      local_9f0.N = 8;
                      local_9f0.ray = (RTCRayN *)ray;
                      local_630 = local_640;
                      local_610 = local_620;
                      local_5f0 = local_600;
                      uStack_57c = local_580;
                      uStack_578 = local_580;
                      uStack_574 = local_580;
                      uStack_570 = local_580;
                      uStack_56c = local_580;
                      uStack_568 = local_580;
                      uStack_564 = local_580;
                      uStack_55c = local_560;
                      uStack_558 = local_560;
                      uStack_554 = local_560;
                      uStack_550 = local_560;
                      uStack_54c = local_560;
                      uStack_548 = local_560;
                      uStack_544 = local_560;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar358 = ZEXT1664(auVar141);
                        (*pGVar10->occlusionFilterN)(&local_9f0);
                        auVar425 = ZEXT3264(_local_a40);
                      }
                      auVar136 = vpcmpeqd_avx(local_b00,ZEXT816(0) << 0x40);
                      auVar143 = vpcmpeqd_avx(local_af0,ZEXT816(0) << 0x40);
                      auVar188._16_16_ = auVar143;
                      auVar188._0_16_ = auVar136;
                      auVar113 = _local_940 & ~auVar188;
                      fVar160 = (float)local_9c0._0_4_;
                      fVar202 = (float)local_9c0._4_4_;
                      fVar223 = fStack_9b8;
                      fVar224 = fStack_9b4;
                      fVar226 = fStack_9b0;
                      fVar240 = fStack_9ac;
                      fVar241 = fStack_9a8;
                      fVar419 = (float)local_aa0._0_4_;
                      fVar426 = (float)local_aa0._4_4_;
                      fVar265 = fStack_a98;
                      fVar278 = fStack_a94;
                      fVar279 = fStack_a90;
                      fVar280 = fStack_a8c;
                      fVar281 = fStack_a88;
                      fVar283 = fStack_a84;
                      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar113 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar113 >> 0x7f,0) == '\0') &&
                            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar113 >> 0xbf,0) == '\0') &&
                          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar113[0x1f]) {
                        auVar330 = local_a60._0_28_;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar358 = ZEXT1664(auVar358._0_16_);
                          (*p_Var15)(&local_9f0);
                          auVar425 = ZEXT3264(_local_a40);
                          fVar160 = (float)local_9c0._0_4_;
                          fVar202 = (float)local_9c0._4_4_;
                          fVar223 = fStack_9b8;
                          fVar224 = fStack_9b4;
                          fVar226 = fStack_9b0;
                          fVar240 = fStack_9ac;
                          fVar241 = fStack_9a8;
                          fVar419 = (float)local_aa0._0_4_;
                          fVar426 = (float)local_aa0._4_4_;
                          fVar265 = fStack_a98;
                          fVar278 = fStack_a94;
                          fVar279 = fStack_a90;
                          fVar280 = fStack_a8c;
                          fVar281 = fStack_a88;
                          fVar283 = fStack_a84;
                        }
                        auVar365 = ZEXT464((uint)fVar163);
                        auVar136 = vpcmpeqd_avx(local_b00,ZEXT816(0) << 0x40);
                        auVar143 = vpcmpeqd_avx(local_af0,ZEXT816(0) << 0x40);
                        auVar121._16_16_ = auVar143;
                        auVar121._0_16_ = auVar136;
                        auVar155._8_4_ = 0xff800000;
                        auVar155._0_8_ = 0xff800000ff800000;
                        auVar155._12_4_ = 0xff800000;
                        auVar155._16_4_ = 0xff800000;
                        auVar155._20_4_ = 0xff800000;
                        auVar155._24_4_ = 0xff800000;
                        auVar155._28_4_ = 0xff800000;
                        auVar113 = vblendvps_avx(auVar155,*(undefined1 (*) [32])
                                                           (local_9f0.ray + 0x100),auVar121);
                        *(undefined1 (*) [32])(local_9f0.ray + 0x100) = auVar113;
                        auVar113 = _local_940 & ~auVar121;
                        auVar330 = local_a60._0_28_;
                        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar113 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar113 >> 0x7f,0) != '\0')
                              || (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar113 >> 0xbf,0) != '\0') ||
                            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar113[0x1f] < '\0') {
                          bVar90 = 1;
                          goto LAB_00fa128f;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar163;
                    }
                    auVar365 = ZEXT464((uint)fVar163);
                    bVar90 = 0;
                    goto LAB_00fa128f;
                  }
                }
                bVar100 = uVar94 < 4;
                uVar94 = uVar94 + 1;
              } while (uVar94 != 5);
              bVar100 = false;
              bVar90 = 5;
LAB_00fa128f:
              bVar99 = (bool)(bVar99 | bVar100 & bVar90);
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar119._4_4_ = uVar7;
              auVar119._0_4_ = uVar7;
              auVar119._8_4_ = uVar7;
              auVar119._12_4_ = uVar7;
              auVar119._16_4_ = uVar7;
              auVar119._20_4_ = uVar7;
              auVar119._24_4_ = uVar7;
              auVar119._28_4_ = uVar7;
              auVar235 = vcmpps_avx(_local_920,auVar119,2);
              fVar130 = auVar235._28_4_;
              auVar113 = vandps_avx(auVar235,local_6c0);
              auVar318 = ZEXT3264(auVar113);
              auVar235 = local_6c0 & auVar235;
              local_6c0 = auVar113;
            } while ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar235 >> 0x7f,0) != '\0') ||
                       (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar235 >> 0xbf,0) != '\0') ||
                     (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar235[0x1f] < '\0');
            auVar318 = ZEXT3264(local_360);
          }
          auVar156._0_4_ =
               auVar330._0_4_ * (float)local_880._0_4_ +
               (float)local_860._0_4_ * (float)local_8a0._0_4_ + fVar160 * (float)local_8c0._0_4_;
          auVar156._4_4_ =
               auVar330._4_4_ * (float)local_880._4_4_ +
               (float)local_860._4_4_ * (float)local_8a0._4_4_ + fVar202 * (float)local_8c0._4_4_;
          auVar156._8_4_ =
               auVar330._8_4_ * fStack_878 + fStack_858 * fStack_898 + fVar223 * fStack_8b8;
          auVar156._12_4_ =
               auVar330._12_4_ * fStack_874 + fStack_854 * fStack_894 + fVar224 * fStack_8b4;
          auVar156._16_4_ =
               auVar330._16_4_ * fStack_870 + fStack_850 * fStack_890 + fVar226 * fStack_8b0;
          auVar156._20_4_ =
               auVar330._20_4_ * fStack_86c + fStack_84c * fStack_88c + fVar240 * fStack_8ac;
          auVar156._24_4_ =
               auVar330._24_4_ * fStack_868 + fStack_848 * fStack_888 + fVar241 * fStack_8a8;
          auVar156._28_4_ = fVar130 + fVar130 + auVar318._28_4_;
          auVar189._8_4_ = 0x7fffffff;
          auVar189._0_8_ = 0x7fffffff7fffffff;
          auVar189._12_4_ = 0x7fffffff;
          auVar189._16_4_ = 0x7fffffff;
          auVar189._20_4_ = 0x7fffffff;
          auVar189._24_4_ = 0x7fffffff;
          auVar189._28_4_ = 0x7fffffff;
          auVar113 = vandps_avx(auVar156,auVar189);
          auVar190._8_4_ = 0x3e99999a;
          auVar190._0_8_ = 0x3e99999a3e99999a;
          auVar190._12_4_ = 0x3e99999a;
          auVar190._16_4_ = 0x3e99999a;
          auVar190._20_4_ = 0x3e99999a;
          auVar190._24_4_ = 0x3e99999a;
          auVar190._28_4_ = 0x3e99999a;
          auVar113 = vcmpps_avx(auVar113,auVar190,1);
          auVar235 = vorps_avx(auVar113,local_740);
          auVar191._0_4_ = (float)local_7c0._0_4_ + fVar419;
          auVar191._4_4_ = (float)local_7c0._4_4_ + fVar426;
          auVar191._8_4_ = fStack_7b8 + fVar265;
          auVar191._12_4_ = fStack_7b4 + fVar278;
          auVar191._16_4_ = fStack_7b0 + fVar279;
          auVar191._20_4_ = fStack_7ac + fVar280;
          auVar191._24_4_ = fStack_7a8 + fVar281;
          auVar191._28_4_ = fStack_7a4 + fVar283;
          auVar113 = vcmpps_avx(auVar191,auVar119,2);
          _local_8c0 = vandps_avx(auVar113,local_7e0);
          auVar192._8_4_ = 3;
          auVar192._0_8_ = 0x300000003;
          auVar192._12_4_ = 3;
          auVar192._16_4_ = 3;
          auVar192._20_4_ = 3;
          auVar192._24_4_ = 3;
          auVar192._28_4_ = 3;
          auVar221._8_4_ = 2;
          auVar221._0_8_ = 0x200000002;
          auVar221._12_4_ = 2;
          auVar221._16_4_ = 2;
          auVar221._20_4_ = 2;
          auVar221._24_4_ = 2;
          auVar221._28_4_ = 2;
          auVar113 = vblendvps_avx(auVar221,auVar192,auVar235);
          auVar136 = vpcmpgtd_avx(auVar113._16_16_,local_780);
          auVar143 = vpshufd_avx(local_760._0_16_,0);
          auVar143 = vpcmpgtd_avx(auVar113._0_16_,auVar143);
          auVar193._16_16_ = auVar136;
          auVar193._0_16_ = auVar119._0_16_;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar143),auVar193,0xf0);
          auVar113 = vandnps_avx(_local_8a0,_local_8c0);
          auVar235 = _local_8c0 & ~_local_8a0;
          local_6e0 = auVar113;
          if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar235 >> 0x7f,0) != '\0') ||
                (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar235 >> 0xbf,0) != '\0') ||
              (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar235[0x1f] < '\0') {
            local_880._4_4_ = fVar426 + local_360._4_4_;
            local_880._0_4_ = fVar419 + local_360._0_4_;
            fStack_878 = fVar265 + local_360._8_4_;
            fStack_874 = fVar278 + local_360._12_4_;
            fStack_870 = fVar279 + local_360._16_4_;
            fStack_86c = fVar280 + local_360._20_4_;
            fStack_868 = fVar281 + local_360._24_4_;
            fStack_864 = fVar283 + local_360._28_4_;
            _local_920 = local_360;
            do {
              auVar122._8_4_ = 0x7f800000;
              auVar122._0_8_ = 0x7f8000007f800000;
              auVar122._12_4_ = 0x7f800000;
              auVar122._16_4_ = 0x7f800000;
              auVar122._20_4_ = 0x7f800000;
              auVar122._24_4_ = 0x7f800000;
              auVar122._28_4_ = 0x7f800000;
              auVar235 = vblendvps_avx(auVar122,_local_920,auVar113);
              auVar114 = vshufps_avx(auVar235,auVar235,0xb1);
              auVar114 = vminps_avx(auVar235,auVar114);
              auVar33 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar33);
              auVar33 = vperm2f128_avx(auVar114,auVar114,1);
              auVar114 = vminps_avx(auVar114,auVar33);
              auVar114 = vcmpps_avx(auVar235,auVar114,0);
              auVar33 = auVar113 & auVar114;
              auVar235 = auVar113;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar235 = vandps_avx(auVar114,auVar113);
              }
              uVar92 = vmovmskps_avx(auVar235);
              uVar91 = 0;
              if (uVar92 != 0) {
                for (; (uVar92 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
                }
              }
              uVar94 = (ulong)uVar91;
              local_6e0 = auVar113;
              *(undefined4 *)(local_6e0 + uVar94 * 4) = 0;
              fVar130 = local_1c0[uVar94];
              uVar91 = *(uint *)(local_340 + uVar94 * 4);
              fVar160 = auVar28._0_4_;
              if ((float)local_960._0_4_ < 0.0) {
                fVar160 = sqrtf((float)local_960._0_4_);
              }
              auVar143 = vminps_avx(_local_ab0,_local_ad0);
              auVar136 = vmaxps_avx(_local_ab0,_local_ad0);
              auVar109 = vminps_avx(_local_ac0,_local_ae0);
              auVar141 = vminps_avx(auVar143,auVar109);
              auVar143 = vmaxps_avx(_local_ac0,_local_ae0);
              auVar109 = vmaxps_avx(auVar136,auVar143);
              auVar211._8_4_ = 0x7fffffff;
              auVar211._0_8_ = 0x7fffffff7fffffff;
              auVar211._12_4_ = 0x7fffffff;
              auVar136 = vandps_avx(auVar141,auVar211);
              auVar143 = vandps_avx(auVar109,auVar211);
              auVar136 = vmaxps_avx(auVar136,auVar143);
              auVar143 = vmovshdup_avx(auVar136);
              auVar143 = vmaxss_avx(auVar143,auVar136);
              auVar136 = vshufpd_avx(auVar136,auVar136,1);
              auVar136 = vmaxss_avx(auVar136,auVar143);
              fVar163 = auVar136._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar160 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar109,auVar109,0xff);
              auVar136 = vinsertps_avx(ZEXT416(uVar91),ZEXT416((uint)fVar130),0x10);
              auVar358 = ZEXT1664(auVar136);
              bVar100 = true;
              uVar94 = 0;
              do {
                auVar355 = auVar358._0_16_;
                auVar136 = vshufps_avx(auVar355,auVar355,0);
                auVar108._0_4_ = auVar136._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar108._4_4_ = auVar136._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar108._8_4_ = auVar136._8_4_ * fStack_948 + 0.0;
                auVar108._12_4_ = auVar136._12_4_ * fStack_944 + 0.0;
                auVar136 = vmovshdup_avx(auVar355);
                fVar223 = auVar136._0_4_;
                fVar202 = 1.0 - fVar223;
                fVar160 = fVar223 * 3.0;
                fVar130 = fVar160 + -5.0;
                auVar136 = ZEXT416((uint)(fVar223 * fVar223 * -fVar202 * 0.5));
                auVar136 = vshufps_avx(auVar136,auVar136,0);
                auVar143 = ZEXT416((uint)((fVar202 * fVar202 * (fVar202 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar109 = ZEXT416((uint)((fVar223 * fVar223 * fVar130 + 2.0) * 0.5));
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                auVar141 = ZEXT416((uint)(fVar202 * fVar202 * -fVar223 * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar179._0_4_ =
                     auVar141._0_4_ * (float)local_ab0._0_4_ +
                     auVar109._0_4_ * (float)local_ad0._0_4_ +
                     auVar143._0_4_ * (float)local_ac0._0_4_ +
                     auVar136._0_4_ * (float)local_ae0._0_4_;
                auVar179._4_4_ =
                     auVar141._4_4_ * (float)local_ab0._4_4_ +
                     auVar109._4_4_ * (float)local_ad0._4_4_ +
                     auVar143._4_4_ * (float)local_ac0._4_4_ +
                     auVar136._4_4_ * (float)local_ae0._4_4_;
                auVar179._8_4_ =
                     auVar141._8_4_ * fStack_aa8 +
                     auVar109._8_4_ * fStack_ac8 +
                     auVar143._8_4_ * fStack_ab8 + auVar136._8_4_ * fStack_ad8;
                auVar179._12_4_ =
                     auVar141._12_4_ * fStack_aa4 +
                     auVar109._12_4_ * fStack_ac4 +
                     auVar143._12_4_ * fStack_ab4 + auVar136._12_4_ * fStack_ad4;
                local_900._0_16_ = auVar179;
                auVar136 = vsubps_avx(auVar108,auVar179);
                _local_a80 = auVar136;
                auVar136 = vdpps_avx(auVar136,auVar136,0x7f);
                fVar222 = auVar136._0_4_;
                if (fVar222 < 0.0) {
                  local_980._0_4_ = fVar160;
                  local_9a0._0_4_ = fVar130;
                  local_820._0_4_ = fVar202 * -2.0;
                  fVar224 = sqrtf(fVar222);
                  fVar226 = (float)local_820._0_4_;
                  fVar240 = (float)local_980._0_4_;
                  fVar130 = (float)local_9a0._0_4_;
                }
                else {
                  auVar143 = vsqrtss_avx(auVar136,auVar136);
                  fVar224 = auVar143._0_4_;
                  fVar226 = fVar202 * -2.0;
                  fVar240 = fVar160;
                }
                auVar143 = ZEXT416((uint)((fVar223 * fVar223 + fVar223 * fVar226) * 0.5));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar109 = ZEXT416((uint)(((fVar202 + fVar202) * (fVar240 + 2.0) +
                                          fVar202 * fVar202 * -3.0) * 0.5));
                auVar109 = vshufps_avx(auVar109,auVar109,0);
                auVar141 = ZEXT416((uint)((fVar130 * (fVar223 + fVar223) + fVar223 * fVar240) * 0.5)
                                  );
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar142 = ZEXT416((uint)((fVar223 * (fVar202 + fVar202) - fVar202 * fVar202) * 0.5)
                                  );
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar362._0_4_ =
                     (float)local_ab0._0_4_ * auVar142._0_4_ +
                     (float)local_ad0._0_4_ * auVar141._0_4_ +
                     (float)local_ae0._0_4_ * auVar143._0_4_ +
                     (float)local_ac0._0_4_ * auVar109._0_4_;
                auVar362._4_4_ =
                     (float)local_ab0._4_4_ * auVar142._4_4_ +
                     (float)local_ad0._4_4_ * auVar141._4_4_ +
                     (float)local_ae0._4_4_ * auVar143._4_4_ +
                     (float)local_ac0._4_4_ * auVar109._4_4_;
                auVar362._8_4_ =
                     fStack_aa8 * auVar142._8_4_ +
                     fStack_ac8 * auVar141._8_4_ +
                     fStack_ad8 * auVar143._8_4_ + fStack_ab8 * auVar109._8_4_;
                auVar362._12_4_ =
                     fStack_aa4 * auVar142._12_4_ +
                     fStack_ac4 * auVar141._12_4_ +
                     fStack_ad4 * auVar143._12_4_ + fStack_ab4 * auVar109._12_4_;
                auVar142 = vpermilps_avx(ZEXT416((uint)(fVar160 + -1.0)),0);
                auVar30 = vpermilps_avx(ZEXT416((uint)(fVar223 * -9.0 + 4.0)),0);
                auVar143 = ZEXT416((uint)(fVar223 * 9.0 + -5.0));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar109 = ZEXT416((uint)(fVar223 * -3.0 + 2.0));
                auVar141 = vshufps_avx(auVar109,auVar109,0);
                auVar109 = vdpps_avx(auVar362,auVar362,0x7f);
                auVar144._0_4_ =
                     (float)local_ab0._0_4_ * auVar141._0_4_ +
                     (float)local_ad0._0_4_ * auVar143._0_4_ +
                     (float)local_ac0._0_4_ * auVar30._0_4_ +
                     (float)local_ae0._0_4_ * auVar142._0_4_;
                auVar144._4_4_ =
                     (float)local_ab0._4_4_ * auVar141._4_4_ +
                     (float)local_ad0._4_4_ * auVar143._4_4_ +
                     (float)local_ac0._4_4_ * auVar30._4_4_ +
                     (float)local_ae0._4_4_ * auVar142._4_4_;
                auVar144._8_4_ =
                     fStack_aa8 * auVar141._8_4_ +
                     fStack_ac8 * auVar143._8_4_ +
                     fStack_ab8 * auVar30._8_4_ + fStack_ad8 * auVar142._8_4_;
                auVar144._12_4_ =
                     fStack_aa4 * auVar141._12_4_ +
                     fStack_ac4 * auVar143._12_4_ +
                     fStack_ab4 * auVar30._12_4_ + fStack_ad4 * auVar142._12_4_;
                auVar143 = vblendps_avx(auVar109,_DAT_01f7aa10,0xe);
                auVar141 = vrsqrtss_avx(auVar143,auVar143);
                fVar160 = auVar141._0_4_;
                fVar130 = auVar109._0_4_;
                auVar141 = vdpps_avx(auVar362,auVar144,0x7f);
                auVar142 = vshufps_avx(auVar109,auVar109,0);
                auVar145._0_4_ = auVar144._0_4_ * auVar142._0_4_;
                auVar145._4_4_ = auVar144._4_4_ * auVar142._4_4_;
                auVar145._8_4_ = auVar144._8_4_ * auVar142._8_4_;
                auVar145._12_4_ = auVar144._12_4_ * auVar142._12_4_;
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar232._0_4_ = auVar362._0_4_ * auVar141._0_4_;
                auVar232._4_4_ = auVar362._4_4_ * auVar141._4_4_;
                auVar232._8_4_ = auVar362._8_4_ * auVar141._8_4_;
                auVar232._12_4_ = auVar362._12_4_ * auVar141._12_4_;
                auVar30 = vsubps_avx(auVar145,auVar232);
                auVar141 = vrcpss_avx(auVar143,auVar143);
                auVar143 = vmaxss_avx(ZEXT416((uint)fVar163),
                                      ZEXT416((uint)(auVar358._0_4_ * (float)local_800._0_4_)));
                auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar130 * auVar141._0_4_)));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                uVar82 = CONCAT44(auVar362._4_4_,auVar362._0_4_);
                auVar252._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar252._8_4_ = -auVar362._8_4_;
                auVar252._12_4_ = -auVar362._12_4_;
                auVar142 = ZEXT416((uint)(fVar160 * 1.5 +
                                         fVar130 * -0.5 * fVar160 * fVar160 * fVar160));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar212._0_4_ = auVar142._0_4_ * auVar30._0_4_ * auVar141._0_4_;
                auVar212._4_4_ = auVar142._4_4_ * auVar30._4_4_ * auVar141._4_4_;
                auVar212._8_4_ = auVar142._8_4_ * auVar30._8_4_ * auVar141._8_4_;
                auVar212._12_4_ = auVar142._12_4_ * auVar30._12_4_ * auVar141._12_4_;
                auVar270._0_4_ = auVar362._0_4_ * auVar142._0_4_;
                auVar270._4_4_ = auVar362._4_4_ * auVar142._4_4_;
                auVar270._8_4_ = auVar362._8_4_ * auVar142._8_4_;
                auVar270._12_4_ = auVar362._12_4_ * auVar142._12_4_;
                if (fVar130 < 0.0) {
                  fVar130 = sqrtf(fVar130);
                }
                else {
                  auVar109 = vsqrtss_avx(auVar109,auVar109);
                  fVar130 = auVar109._0_4_;
                }
                auVar109 = vdpps_avx(_local_a80,auVar270,0x7f);
                fVar130 = (fVar163 / fVar130) * (fVar224 + 1.0) + fVar224 * fVar163 + auVar143._0_4_
                ;
                auVar141 = vdpps_avx(auVar252,auVar270,0x7f);
                auVar142 = vdpps_avx(_local_a80,auVar212,0x7f);
                auVar30 = vdpps_avx(_local_950,auVar270,0x7f);
                auVar31 = vdpps_avx(_local_a80,auVar252,0x7f);
                fVar160 = auVar141._0_4_ + auVar142._0_4_;
                fVar223 = auVar109._0_4_;
                auVar110._0_4_ = fVar223 * fVar223;
                auVar110._4_4_ = auVar109._4_4_ * auVar109._4_4_;
                auVar110._8_4_ = auVar109._8_4_ * auVar109._8_4_;
                auVar110._12_4_ = auVar109._12_4_ * auVar109._12_4_;
                auVar102 = vsubps_avx(auVar136,auVar110);
                auVar141 = vdpps_avx(_local_a80,_local_950,0x7f);
                fVar224 = auVar31._0_4_ - fVar223 * fVar160;
                auVar142 = vrsqrtss_avx(auVar102,auVar102);
                fVar226 = auVar102._0_4_;
                fVar202 = auVar142._0_4_;
                fVar202 = fVar202 * 1.5 + fVar226 * -0.5 * fVar202 * fVar202 * fVar202;
                if (fVar226 < 0.0) {
                  local_980._0_4_ = fVar224;
                  local_9a0._0_4_ = fVar202;
                  fVar226 = sqrtf(fVar226);
                  fVar202 = (float)local_9a0._0_4_;
                  fVar224 = (float)local_980._0_4_;
                }
                else {
                  auVar142 = vsqrtss_avx(auVar102,auVar102);
                  fVar226 = auVar142._0_4_;
                }
                auVar365 = ZEXT1664(auVar109);
                auVar31 = vpermilps_avx(local_900._0_16_,0xff);
                auVar102 = vshufps_avx(auVar362,auVar362,0xff);
                fVar224 = fVar224 * fVar202 - auVar102._0_4_;
                fVar202 = (auVar141._0_4_ - fVar223 * auVar30._0_4_) * fVar202;
                auVar233._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
                auVar233._8_4_ = auVar30._8_4_ ^ 0x80000000;
                auVar233._12_4_ = auVar30._12_4_ ^ 0x80000000;
                auVar253._0_4_ = -fVar224;
                auVar253._4_4_ = 0x80000000;
                auVar253._8_4_ = 0x80000000;
                auVar253._12_4_ = 0x80000000;
                auVar141 = vinsertps_avx(auVar253,ZEXT416((uint)fVar202),0x1c);
                auVar30 = vmovsldup_avx(ZEXT416((uint)(fVar160 * fVar202 - auVar30._0_4_ * fVar224))
                                       );
                auVar141 = vdivps_avx(auVar141,auVar30);
                auVar142 = vinsertps_avx(ZEXT416((uint)fVar160),auVar233,0x10);
                auVar142 = vdivps_avx(auVar142,auVar30);
                auVar30 = vmovsldup_avx(auVar109);
                auVar111 = ZEXT416((uint)(fVar226 - auVar31._0_4_));
                auVar31 = vmovsldup_avx(auVar111);
                auVar180._0_4_ = auVar30._0_4_ * auVar141._0_4_ + auVar31._0_4_ * auVar142._0_4_;
                auVar180._4_4_ = auVar30._4_4_ * auVar141._4_4_ + auVar31._4_4_ * auVar142._4_4_;
                auVar180._8_4_ = auVar30._8_4_ * auVar141._8_4_ + auVar31._8_4_ * auVar142._8_4_;
                auVar180._12_4_ =
                     auVar30._12_4_ * auVar141._12_4_ + auVar31._12_4_ * auVar142._12_4_;
                auVar141 = vsubps_avx(auVar355,auVar180);
                auVar358 = ZEXT1664(auVar141);
                auVar181._8_4_ = 0x7fffffff;
                auVar181._0_8_ = 0x7fffffff7fffffff;
                auVar181._12_4_ = 0x7fffffff;
                auVar109 = vandps_avx(auVar109,auVar181);
                auVar425 = ZEXT3264(_local_a40);
                fVar419 = (float)local_aa0._0_4_;
                fVar426 = (float)local_aa0._4_4_;
                fVar265 = fStack_a98;
                fVar278 = fStack_a94;
                fVar279 = fStack_a90;
                fVar280 = fStack_a8c;
                fVar281 = fStack_a88;
                fVar283 = fStack_a84;
                if (auVar109._0_4_ < fVar130) {
                  auVar213._8_4_ = 0x7fffffff;
                  auVar213._0_8_ = 0x7fffffff7fffffff;
                  auVar213._12_4_ = 0x7fffffff;
                  auVar109 = vandps_avx(auVar111,auVar213);
                  if (auVar109._0_4_ <
                      (float)local_840._0_4_ * 1.9073486e-06 + fVar130 + auVar143._0_4_) {
                    fVar130 = auVar141._0_4_ + (float)local_8e0._0_4_;
                    if (fVar130 < fVar128) {
LAB_00fa1c74:
                      bVar90 = 0;
                      goto LAB_00fa1c94;
                    }
                    fVar160 = *(float *)(ray + k * 4 + 0x100);
                    auVar365 = ZEXT464((uint)fVar160);
                    if (fVar130 <= fVar160) {
                      auVar143 = vmovshdup_avx(auVar141);
                      bVar90 = 0;
                      if ((auVar143._0_4_ < 0.0) || (1.0 < auVar143._0_4_)) goto LAB_00fa1c94;
                      auVar136 = vrsqrtss_avx(auVar136,auVar136);
                      fVar163 = auVar136._0_4_;
                      pGVar10 = (context->scene->geometries).items[local_9f8].ptr;
                      if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_00fa1c74;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar90 = 1, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00fa1c94;
                      auVar136 = ZEXT416((uint)(fVar163 * 1.5 +
                                               fVar222 * -0.5 * fVar163 * fVar163 * fVar163));
                      auVar136 = vshufps_avx(auVar136,auVar136,0);
                      auVar182._0_4_ = auVar136._0_4_ * (float)local_a80._0_4_;
                      auVar182._4_4_ = auVar136._4_4_ * (float)local_a80._4_4_;
                      auVar182._8_4_ = auVar136._8_4_ * fStack_a78;
                      auVar182._12_4_ = auVar136._12_4_ * fStack_a74;
                      auVar146._0_4_ = auVar362._0_4_ + auVar102._0_4_ * auVar182._0_4_;
                      auVar146._4_4_ = auVar362._4_4_ + auVar102._4_4_ * auVar182._4_4_;
                      auVar146._8_4_ = auVar362._8_4_ + auVar102._8_4_ * auVar182._8_4_;
                      auVar146._12_4_ = auVar362._12_4_ + auVar102._12_4_ * auVar182._12_4_;
                      auVar136 = vshufps_avx(auVar182,auVar182,0xc9);
                      auVar143 = vshufps_avx(auVar362,auVar362,0xc9);
                      auVar183._0_4_ = auVar143._0_4_ * auVar182._0_4_;
                      auVar183._4_4_ = auVar143._4_4_ * auVar182._4_4_;
                      auVar183._8_4_ = auVar143._8_4_ * auVar182._8_4_;
                      auVar183._12_4_ = auVar143._12_4_ * auVar182._12_4_;
                      auVar214._0_4_ = auVar362._0_4_ * auVar136._0_4_;
                      auVar214._4_4_ = auVar362._4_4_ * auVar136._4_4_;
                      auVar214._8_4_ = auVar362._8_4_ * auVar136._8_4_;
                      auVar214._12_4_ = auVar362._12_4_ * auVar136._12_4_;
                      auVar109 = vsubps_avx(auVar214,auVar183);
                      auVar136 = vshufps_avx(auVar109,auVar109,0xc9);
                      auVar143 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar215._0_4_ = auVar143._0_4_ * auVar136._0_4_;
                      auVar215._4_4_ = auVar143._4_4_ * auVar136._4_4_;
                      auVar215._8_4_ = auVar143._8_4_ * auVar136._8_4_;
                      auVar215._12_4_ = auVar143._12_4_ * auVar136._12_4_;
                      auVar136 = vshufps_avx(auVar109,auVar109,0xd2);
                      auVar147._0_4_ = auVar146._0_4_ * auVar136._0_4_;
                      auVar147._4_4_ = auVar146._4_4_ * auVar136._4_4_;
                      auVar147._8_4_ = auVar146._8_4_ * auVar136._8_4_;
                      auVar147._12_4_ = auVar146._12_4_ * auVar136._12_4_;
                      auVar136 = vsubps_avx(auVar215,auVar147);
                      pRVar14 = context->user;
                      local_600 = vshufps_avx(auVar141,auVar141,0x55);
                      auStack_650 = vshufps_avx(auVar136,auVar136,0x55);
                      local_640 = vshufps_avx(auVar136,auVar136,0xaa);
                      local_620 = vshufps_avx(auVar136,auVar136,0);
                      local_660 = (RTCHitN  [16])auStack_650;
                      local_5e0 = ZEXT832(0) << 0x20;
                      local_5c0 = local_500._0_8_;
                      uStack_5b8 = local_500._8_8_;
                      uStack_5b0 = local_500._16_8_;
                      uStack_5a8 = local_500._24_8_;
                      local_5a0 = local_4e0._0_8_;
                      uStack_598 = local_4e0._8_8_;
                      uStack_590 = local_4e0._16_8_;
                      uStack_588 = local_4e0._24_8_;
                      *(undefined1 (*) [8])(local_a00 + 8) = local_940;
                      *(undefined8 *)(local_a00 + 10) = uStack_938;
                      *(undefined8 *)(local_a00 + 0xc) = uStack_930;
                      *(undefined8 *)(local_a00 + 0xe) = uStack_928;
                      *(undefined1 (*) [8])local_a00 = local_940;
                      *(undefined8 *)(local_a00 + 2) = uStack_938;
                      *(undefined8 *)(local_a00 + 4) = uStack_930;
                      *(undefined8 *)(local_a00 + 6) = uStack_928;
                      local_580 = pRVar14->instID[0];
                      local_560 = pRVar14->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar130;
                      local_b00 = *local_a08;
                      local_af0 = *local_a10;
                      local_9f0.valid = (int *)local_b00;
                      local_9f0.geometryUserPtr = pGVar10->userPtr;
                      local_9f0.context = context->user;
                      local_9f0.hit = local_660;
                      local_9f0.N = 8;
                      local_9f0.ray = (RTCRayN *)ray;
                      local_630 = local_640;
                      local_610 = local_620;
                      local_5f0 = local_600;
                      uStack_57c = local_580;
                      uStack_578 = local_580;
                      uStack_574 = local_580;
                      uStack_570 = local_580;
                      uStack_56c = local_580;
                      uStack_568 = local_580;
                      uStack_564 = local_580;
                      uStack_55c = local_560;
                      uStack_558 = local_560;
                      uStack_554 = local_560;
                      uStack_550 = local_560;
                      uStack_54c = local_560;
                      uStack_548 = local_560;
                      uStack_544 = local_560;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar358 = ZEXT1664(auVar141);
                        (*pGVar10->occlusionFilterN)(&local_9f0);
                        auVar425 = ZEXT3264(_local_a40);
                      }
                      auVar136 = vpcmpeqd_avx(local_b00,ZEXT816(0) << 0x40);
                      auVar143 = vpcmpeqd_avx(local_af0,ZEXT816(0) << 0x40);
                      auVar194._16_16_ = auVar143;
                      auVar194._0_16_ = auVar136;
                      auVar113 = _local_940 & ~auVar194;
                      fVar419 = (float)local_aa0._0_4_;
                      fVar426 = (float)local_aa0._4_4_;
                      fVar265 = fStack_a98;
                      fVar278 = fStack_a94;
                      fVar279 = fStack_a90;
                      fVar280 = fStack_a8c;
                      fVar281 = fStack_a88;
                      fVar283 = fStack_a84;
                      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar113 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar113 >> 0x7f,0) != '\0') ||
                            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar113 >> 0xbf,0) != '\0') ||
                          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar113[0x1f] < '\0') {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar358 = ZEXT1664(auVar358._0_16_);
                          (*p_Var15)(&local_9f0);
                          auVar425 = ZEXT3264(_local_a40);
                          fVar419 = (float)local_aa0._0_4_;
                          fVar426 = (float)local_aa0._4_4_;
                          fVar265 = fStack_a98;
                          fVar278 = fStack_a94;
                          fVar279 = fStack_a90;
                          fVar280 = fStack_a8c;
                          fVar281 = fStack_a88;
                          fVar283 = fStack_a84;
                        }
                        auVar365 = ZEXT464((uint)fVar160);
                        auVar136 = vpcmpeqd_avx(local_b00,ZEXT816(0) << 0x40);
                        auVar143 = vpcmpeqd_avx(local_af0,ZEXT816(0) << 0x40);
                        auVar123._16_16_ = auVar143;
                        auVar123._0_16_ = auVar136;
                        auVar157._8_4_ = 0xff800000;
                        auVar157._0_8_ = 0xff800000ff800000;
                        auVar157._12_4_ = 0xff800000;
                        auVar157._16_4_ = 0xff800000;
                        auVar157._20_4_ = 0xff800000;
                        auVar157._24_4_ = 0xff800000;
                        auVar157._28_4_ = 0xff800000;
                        auVar113 = vblendvps_avx(auVar157,*(undefined1 (*) [32])
                                                           (local_9f0.ray + 0x100),auVar123);
                        *(undefined1 (*) [32])(local_9f0.ray + 0x100) = auVar113;
                        auVar113 = _local_940 & ~auVar123;
                        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar113 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar113 >> 0x7f,0) != '\0')
                              || (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar113 >> 0xbf,0) != '\0') ||
                            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar113[0x1f] < '\0') {
                          bVar90 = 1;
                          goto LAB_00fa1c94;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar160;
                    }
                    auVar365 = ZEXT464((uint)fVar160);
                    bVar90 = 0;
                    goto LAB_00fa1c94;
                  }
                }
                bVar100 = uVar94 < 4;
                uVar94 = uVar94 + 1;
              } while (uVar94 != 5);
              bVar100 = false;
              bVar90 = 5;
LAB_00fa1c94:
              bVar99 = (bool)(bVar99 | bVar100 & bVar90);
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar119._4_4_ = uVar7;
              auVar119._0_4_ = uVar7;
              auVar119._8_4_ = uVar7;
              auVar119._12_4_ = uVar7;
              auVar119._16_4_ = uVar7;
              auVar119._20_4_ = uVar7;
              auVar119._24_4_ = uVar7;
              auVar119._28_4_ = uVar7;
              auVar235 = vcmpps_avx(_local_880,auVar119,2);
              auVar113 = vandps_avx(auVar235,local_6e0);
              auVar235 = local_6e0 & auVar235;
              local_6e0 = auVar113;
            } while ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar235 >> 0x7f,0) != '\0') ||
                       (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar235 >> 0xbf,0) != '\0') ||
                     (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar235[0x1f] < '\0');
          }
          auVar318 = ZEXT3264(local_360);
          auVar113 = vandps_avx(local_720,local_700);
          auVar235 = vandps_avx(_local_8c0,_local_8a0);
          auVar238._0_4_ = fVar419 + local_3a0._0_4_;
          auVar238._4_4_ = fVar426 + local_3a0._4_4_;
          auVar238._8_4_ = fVar265 + local_3a0._8_4_;
          auVar238._12_4_ = fVar278 + local_3a0._12_4_;
          auVar238._16_4_ = fVar279 + local_3a0._16_4_;
          auVar238._20_4_ = fVar280 + local_3a0._20_4_;
          auVar238._24_4_ = fVar281 + local_3a0._24_4_;
          auVar238._28_4_ = fVar283 + local_3a0._28_4_;
          auVar114 = vcmpps_avx(auVar238,auVar119,2);
          auVar113 = vandps_avx(auVar114,auVar113);
          auVar239._0_4_ = local_360._0_4_ + fVar419;
          auVar239._4_4_ = local_360._4_4_ + fVar426;
          auVar239._8_4_ = local_360._8_4_ + fVar265;
          auVar239._12_4_ = local_360._12_4_ + fVar278;
          auVar239._16_4_ = local_360._16_4_ + fVar279;
          auVar239._20_4_ = local_360._20_4_ + fVar280;
          auVar239._24_4_ = local_360._24_4_ + fVar281;
          auVar239._28_4_ = local_360._28_4_ + fVar283;
          auVar114 = vcmpps_avx(auVar239,auVar119,2);
          auVar235 = vandps_avx(auVar114,auVar235);
          auVar235 = vorps_avx(auVar113,auVar235);
          if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar235 >> 0x7f,0) != '\0') ||
                (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar235 >> 0xbf,0) != '\0') ||
              (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar235[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar235;
            auVar113 = vblendvps_avx(local_360,_local_3a0,auVar113);
            *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar113;
            uVar8 = vmovlps_avx(local_670);
            (&uStack_140)[uVar97 * 0xc] = uVar8;
            aiStack_138[uVar97 * 0x18] = local_cc4 + 1;
            iVar96 = iVar96 + 1;
          }
          goto LAB_00fa0557;
        }
      }
      auVar425 = ZEXT3264(_local_a40);
    }
LAB_00fa0557:
    if (iVar96 == 0) break;
    uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar116._4_4_ = uVar7;
    auVar116._0_4_ = uVar7;
    auVar116._8_4_ = uVar7;
    auVar116._12_4_ = uVar7;
    auVar116._16_4_ = uVar7;
    auVar116._20_4_ = uVar7;
    auVar116._24_4_ = uVar7;
    auVar116._28_4_ = uVar7;
    uVar91 = -iVar96;
    pauVar93 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar96 - 1) * 0x60);
    while( true ) {
      auVar113 = pauVar93[1];
      auVar150._0_4_ = fVar419 + auVar113._0_4_;
      auVar150._4_4_ = fVar426 + auVar113._4_4_;
      auVar150._8_4_ = fVar265 + auVar113._8_4_;
      auVar150._12_4_ = fVar278 + auVar113._12_4_;
      auVar150._16_4_ = fVar279 + auVar113._16_4_;
      auVar150._20_4_ = fVar280 + auVar113._20_4_;
      auVar150._24_4_ = fVar281 + auVar113._24_4_;
      auVar150._28_4_ = fVar283 + auVar113._28_4_;
      auVar235 = vcmpps_avx(auVar150,auVar116,2);
      _local_660 = vandps_avx(auVar235,*pauVar93);
      auVar114 = *pauVar93 & auVar235;
      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0x7f,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar114 >> 0xbf,0) != '\0') ||
          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar114[0x1f] < '\0') break;
      pauVar93 = pauVar93 + -3;
      uVar91 = uVar91 + 1;
      if (uVar91 == 0) goto LAB_00fa21f0;
    }
    auVar117._8_4_ = 0x7f800000;
    auVar117._0_8_ = 0x7f8000007f800000;
    auVar117._12_4_ = 0x7f800000;
    auVar117._16_4_ = 0x7f800000;
    auVar117._20_4_ = 0x7f800000;
    auVar117._24_4_ = 0x7f800000;
    auVar117._28_4_ = 0x7f800000;
    auVar113 = vblendvps_avx(auVar117,auVar113,_local_660);
    auVar114 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar114 = vminps_avx(auVar113,auVar114);
    auVar33 = vshufpd_avx(auVar114,auVar114,5);
    auVar114 = vminps_avx(auVar114,auVar33);
    auVar33 = vperm2f128_avx(auVar114,auVar114,1);
    auVar114 = vminps_avx(auVar114,auVar33);
    auVar114 = vcmpps_avx(auVar113,auVar114,0);
    auVar33 = _local_660 & auVar114;
    auVar113 = _local_660;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0x7f,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0xbf,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0')
    {
      auVar113 = vandps_avx(auVar114,_local_660);
    }
    auVar105._8_8_ = 0;
    auVar105._0_8_ = *(ulong *)pauVar93[2];
    local_cc4 = *(uint *)(pauVar93[2] + 8);
    uVar95 = vmovmskps_avx(auVar113);
    uVar92 = 0;
    if (uVar95 != 0) {
      for (; (uVar95 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
      }
    }
    *(undefined4 *)(local_660 + (ulong)uVar92 * 4) = 0;
    *pauVar93 = _local_660;
    uVar95 = ~uVar91;
    if ((((((((_local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_660 >> 0x7f,0) != '\0') ||
          (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_660 >> 0xbf,0) != '\0') ||
        (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_660[0x1f] < '\0') {
      uVar95 = -uVar91;
    }
    uVar97 = (ulong)uVar95;
    auVar136 = vshufps_avx(auVar105,auVar105,0);
    auVar143 = vshufps_avx(auVar105,auVar105,0x55);
    auVar143 = vsubps_avx(auVar143,auVar136);
    local_3a0._4_4_ = auVar136._4_4_ + auVar143._4_4_ * 0.14285715;
    local_3a0._0_4_ = auVar136._0_4_ + auVar143._0_4_ * 0.0;
    fStack_398 = auVar136._8_4_ + auVar143._8_4_ * 0.2857143;
    fStack_394 = auVar136._12_4_ + auVar143._12_4_ * 0.42857146;
    fStack_390 = auVar136._0_4_ + auVar143._0_4_ * 0.5714286;
    fStack_38c = auVar136._4_4_ + auVar143._4_4_ * 0.71428573;
    fStack_388 = auVar136._8_4_ + auVar143._8_4_ * 0.8571429;
    fStack_384 = auVar136._12_4_ + auVar143._12_4_;
    local_670._8_8_ = 0;
    local_670._0_8_ = *(ulong *)(local_3a0 + (ulong)uVar92 * 4);
  } while( true );
LAB_00fa21f0:
  if (bVar99 != false) {
    return bVar99;
  }
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar112._4_4_ = uVar7;
  auVar112._0_4_ = uVar7;
  auVar112._8_4_ = uVar7;
  auVar112._12_4_ = uVar7;
  auVar135 = vcmpps_avx(local_680,auVar112,2);
  uVar91 = vmovmskps_avx(auVar135);
  uVar91 = (uint)local_8c8 - 1 & (uint)local_8c8 & uVar91;
  if (uVar91 == 0) {
    return false;
  }
  goto LAB_00f9f305;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }